

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  undefined4 uVar2;
  uint uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int *piVar9;
  _func_int **pp_Var10;
  size_t sVar11;
  size_t sVar12;
  _func_int **pp_Var13;
  _func_int *p_Var14;
  Layer *pLVar15;
  bool bVar16;
  byte bVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined4 uVar117;
  undefined4 uVar118;
  Allocator AVar119;
  Allocator AVar120;
  Allocator AVar121;
  Allocator AVar122;
  Allocator AVar123;
  Allocator AVar124;
  Allocator AVar125;
  Allocator AVar126;
  long lVar127;
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  float afVar133 [16];
  float afVar134 [16];
  float afVar135 [16];
  float afVar136 [16];
  float afVar137 [16];
  float afVar138 [16];
  float afVar139 [16];
  float afVar140 [16];
  float afVar141 [16];
  float afVar142 [16];
  float afVar143 [16];
  float afVar144 [16];
  Mat *pMVar145;
  int iVar146;
  int iVar147;
  uint uVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  long lVar155;
  Allocator *pAVar156;
  long lVar157;
  ulong uVar158;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  long lVar162;
  int iVar163;
  _func_int *p_Var164;
  uint uVar165;
  int i;
  int iVar166;
  uint uVar167;
  int iVar168;
  uint uVar169;
  int iVar170;
  int y_6;
  long lVar171;
  void *pvVar172;
  ulong uVar173;
  ulong uVar174;
  undefined1 (*pauVar175) [64];
  float *pfVar176;
  int v_1;
  uint uVar177;
  void *pvVar178;
  undefined1 (*pauVar179) [64];
  int i_4;
  long lVar180;
  Allocator *pAVar181;
  int y;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar294 [32];
  int iVar182;
  ulong uVar183;
  ulong uVar184;
  void *pvVar185;
  ulong uVar186;
  undefined1 (*pauVar187) [32];
  ulong uVar188;
  undefined1 (*pauVar189) [16];
  float *pfVar190;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar191 [16];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar341 [16];
  float fVar339;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined4 uVar340;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar358;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar365;
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  v4sf one;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  __m128 pos;
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [32];
  undefined1 auVar513 [32];
  undefined1 auVar514 [32];
  undefined1 auVar515 [32];
  undefined1 auVar516 [32];
  undefined1 auVar517 [32];
  undefined1 auVar518 [32];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  long lStackY_2d0;
  Allocator *local_2a8;
  Allocator *local_268;
  Allocator *local_228;
  Mat local_1e8;
  _func_int **local_198;
  ulong local_190;
  long local_188;
  Option *local_180;
  Allocator *local_178;
  long local_170;
  int local_168;
  int local_164;
  Mat *local_160;
  undefined1 local_158 [64];
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  Option opt_b;
  
  auVar191 = in_ZMM29._0_16_;
  uVar161 = bottom_blob->w;
  uVar174 = (ulong)uVar161;
  uVar165 = bottom_blob->h;
  uVar173 = bottom_blob->elemsize;
  p_Var164 = this->_vptr_Deconvolution_x86_avx512[-3];
  local_164 = (*(int *)(&this->field_0xd4 + (long)p_Var164) + -1) *
              *(int *)(&this->field_0xdc + (long)p_Var164);
  uVar169 = *(uint *)(&this->field_0xd0 + (long)p_Var164);
  iVar168 = *(int *)(&this->field_0xe4 + (long)p_Var164);
  local_168 = (*(int *)(&this->field_0xd8 + (long)p_Var164) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var164);
  iVar166 = *(int *)(&this->field_0xe8 + (long)p_Var164);
  iVar182 = *(int *)(&this->field_0xfc + (long)p_Var164);
  iVar163 = *(int *)(&this->field_0x100 + (long)p_Var164);
  iVar170 = bottom_blob->elempack;
  if (opt->use_packing_layout == true) {
    if ((uVar169 & 0xf) == 0) {
      uVar159 = 0x10;
    }
    else if ((uVar169 & 7) == 0) {
      uVar159 = 8;
    }
    else {
      uVar159 = (uint)((uVar169 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar159 = 1;
  }
  uVar158 = (long)(int)uVar169 / (long)(int)uVar159 & 0xffffffff;
  local_1e8.cstep = 0;
  local_1e8.data = (Allocator *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1e8.elempack = 0;
  local_1e8.h = 0;
  p_Var164 = this->_vptr_Deconvolution_x86_avx512[-3];
  lStackY_2d0 = 0x10;
  local_1e8.allocator = (Allocator *)local_1e8.data;
  local_1e8.dims = (int)local_1e8.refcount;
  local_1e8.w = local_1e8.refcount._4_4_;
  local_1e8.d = (int)local_1e8.refcount;
  local_1e8.c = local_1e8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var164) < 1) &&
        (*(int *)(&this->field_0xf0 + (long)p_Var164) < 1)) &&
       (*(int *)(&this->field_0xf4 + (long)p_Var164) < 1)) &&
      (*(int *)(&this->field_0xf8 + (long)p_Var164) < 1)) &&
     ((*(int *)(&this->field_0x104 + (long)p_Var164) < 1 ||
      (*(int *)(&this->field_0x108 + (long)p_Var164) < 1)))) {
    lStackY_2d0 = 8;
    if (&local_1e8 != top_blob) {
      piVar9 = top_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      local_1e8.data = top_blob->data;
      local_1e8.refcount._0_4_ = (int)top_blob->refcount;
      local_1e8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_1e8.elemsize = top_blob->elemsize;
      local_1e8.elempack = top_blob->elempack;
      local_1e8.allocator = top_blob->allocator;
      uVar5 = top_blob->dims;
      uVar6 = top_blob->w;
      uVar7 = top_blob->h;
      uVar8 = top_blob->d;
      local_1e8.c = top_blob->c;
      local_1e8.cstep = top_blob->cstep;
      lStackY_2d0 = 8;
      local_1e8.dims = uVar5;
      local_1e8.w = uVar6;
      local_1e8.h = uVar7;
      local_1e8.d = uVar8;
    }
  }
  iVar182 = (uVar161 - 1) * iVar168 + local_164 + iVar182 + 1;
  iVar168 = (int)((long)(int)uVar169 / (long)(int)uVar159);
  local_180 = opt;
  local_160 = top_blob;
  Mat::create(&local_1e8,iVar182,iVar163 + (uVar165 - 1) * iVar166 + local_168 + 1,iVar168,
              (uVar173 / (ulong)(long)iVar170) * (ulong)uVar159,uVar159,
              *(Allocator **)(&opt->lightmode + lStackY_2d0));
  afVar137 = _ps512_cephes_exp_p5;
  afVar136 = _ps512_cephes_exp_p4;
  afVar135 = _ps512_cephes_exp_p3;
  afVar134 = _ps512_cephes_exp_p2;
  afVar133 = _ps512_cephes_exp_p1;
  afVar132 = _ps512_cephes_exp_p0;
  afVar131 = _ps512_cephes_LOG2EF;
  afVar130 = _ps512_exp_lo;
  afVar129 = _ps512_exp_hi;
  afVar128 = _ps512_1;
  if (((Allocator *)local_1e8.data != (Allocator *)0x0) &&
     (local_1e8.cstep * (long)local_1e8.c != 0)) {
    local_198 = this->_vptr_Deconvolution_x86_avx512;
    p_Var164 = local_198[-3];
    uVar169 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
    uVar160 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
    iVar166 = uVar160 * uVar169;
    local_188 = (long)iVar166;
    if (local_180->use_sgemm_convolution == true) {
      piVar9 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      piStack_c0 = bottom_blob->refcount;
      local_b8 = bottom_blob->elemsize;
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      iVar163 = bottom_blob->h;
      iVar170 = bottom_blob->w;
      uVar117 = bottom_blob->dims;
      uVar118 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
        iVar170 = bottom_blob->w;
        iVar163 = bottom_blob->h;
      }
      _local_a0 = CONCAT44(iVar163 * iVar170,uVar117);
      _uStack_98 = CONCAT44(uVar118,1);
      local_d8 = 0;
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      auStack_e8 = SUB1612(ZEXT816(0),0);
      opt_b.lightmode = local_180->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_180->field_0x1;
      opt_b.num_threads = local_180->num_threads;
      opt_b.workspace_allocator = local_180->workspace_allocator;
      opt_b.openmp_blocktime = local_180->openmp_blocktime;
      opt_b.use_winograd_convolution = local_180->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_180->use_sgemm_convolution;
      opt_b.use_int8_inference = local_180->use_int8_inference;
      opt_b.use_vulkan_compute = local_180->use_vulkan_compute;
      opt_b.use_bf16_storage = local_180->use_bf16_storage;
      opt_b.use_fp16_packed = local_180->use_fp16_packed;
      opt_b.use_fp16_storage = local_180->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_180->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_180->use_int8_packed;
      opt_b.use_int8_storage = local_180->use_int8_storage;
      opt_b.use_int8_arithmetic = local_180->use_int8_arithmetic;
      opt_b.use_packing_layout = local_180->use_packing_layout;
      opt_b.use_shader_pack8 = local_180->use_shader_pack8;
      opt_b.use_subgroup_basic = local_180->use_subgroup_basic;
      opt_b.use_subgroup_vote = local_180->use_subgroup_vote;
      opt_b.use_subgroup_ballot = local_180->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = local_180->use_subgroup_shuffle;
      opt_b.use_image_storage = local_180->use_image_storage;
      opt_b.use_tensor_storage = local_180->use_tensor_storage;
      opt_b.use_reserved_0 = local_180->use_reserved_0;
      opt_b.flush_denormals = local_180->flush_denormals;
      opt_b.use_local_pool_allocator = local_180->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_180->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_180->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_180->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_180->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_180->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_180->use_a53_a55_optimized_kernel;
      opt_b.use_reserved_7 = local_180->use_reserved_7;
      opt_b.use_reserved_8 = local_180->use_reserved_8;
      opt_b.use_reserved_9 = local_180->use_reserved_9;
      opt_b.use_reserved_10 = local_180->use_reserved_10;
      opt_b.use_reserved_11 = local_180->use_reserved_11;
      opt_b.blob_allocator = local_1e8.allocator;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      (*this->gemm->_vptr_Layer[7])();
      pp_Var10 = this->_vptr_Deconvolution_x86_avx512;
      p_Var164 = pp_Var10[-3];
      iVar182 = (iVar182 * *(int *)(&this->field_0xe8 + (long)p_Var164) -
                *(int *)(&this->field_0xe4 + (long)p_Var164) * uVar161) * uVar159;
      if (uVar159 == 1) {
        if ((int)uVar161 < 1) {
          uVar174 = 0;
        }
        if ((int)uVar165 < 1) {
          uVar165 = 0;
        }
        local_188 = (long)iVar166;
        uVar173 = 0;
        if (0 < iVar168) {
          uVar173 = uVar158;
        }
        lVar157 = (long)local_1e8.h * (long)local_1e8.w;
        pp_Var10 = this->_vptr_Deconvolution_x86_avx512;
        pAVar181 = (Allocator *)local_1e8.data;
        for (uVar158 = 0; uVar158 != uVar173; uVar158 = uVar158 + 1) {
          iVar168 = (int)((local_1e8.elemsize * lVar157 + 0xf & 0xfffffffffffffff0) /
                         local_1e8.elemsize);
          if (local_1e8.dims == 4) {
            iVar168 = (int)lVar157;
          }
          p_Var164 = pp_Var10[-3];
          uVar340 = 0;
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var164) != 0) &&
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var164) *
              *(long *)(&this->field_0x1e8 + (long)p_Var164) != 0)) {
            uVar340 = *(undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var164) + uVar158 * 4);
          }
          pfVar176 = (float *)(uVar158 * iStack_ec * local_108 * local_188 + (long)local_118);
          iVar168 = iVar168 * local_1e8.d;
          if (iVar168 < 1) {
            iVar168 = 0;
          }
          for (lVar162 = 0; iVar168 != (int)lVar162; lVar162 = lVar162 + 1) {
            *(undefined4 *)((long)&pAVar181->_vptr_Allocator + lVar162 * 4) = uVar340;
          }
          p_Var164 = pp_Var10[-3];
          for (iVar168 = 0; iVar168 < *(int *)(&this->field_0xd8 + (long)p_Var164);
              iVar168 = iVar168 + 1) {
            for (iVar166 = 0; iVar166 < *(int *)(&this->field_0xd4 + (long)p_Var164);
                iVar166 = iVar166 + 1) {
              pfVar190 = (float *)((long)(_func_int ***)local_1e8.data +
                                  (long)iVar166 * (long)*(int *)(&this->field_0xdc + (long)p_Var164)
                                  * 4 + (long)iVar168 *
                                        (long)*(int *)(&this->field_0xe0 + (long)p_Var164) *
                                        (long)local_1e8.w * local_1e8.elemsize +
                                        local_1e8.cstep * local_1e8.elemsize * uVar158);
              for (uVar161 = 0; uVar188 = uVar174, uVar161 != uVar165; uVar161 = uVar161 + 1) {
                while ((int)uVar188 != 0) {
                  *pfVar190 = *pfVar190 + *pfVar176;
                  p_Var164 = pp_Var10[-3];
                  pfVar190 = pfVar190 + *(int *)(&this->field_0xe4 + (long)p_Var164);
                  pfVar176 = pfVar176 + 1;
                  uVar188 = (ulong)((int)uVar188 - 1);
                }
                pfVar190 = pfVar190 + iVar182;
              }
            }
          }
          pAVar181 = (Allocator *)
                     ((long)&pAVar181->_vptr_Allocator + local_1e8.cstep * local_1e8.elemsize);
        }
      }
      else if (uVar159 == 0x10) {
        if ((int)uVar161 < 1) {
          uVar161 = 0;
        }
        if ((int)uVar165 < 1) {
          uVar165 = 0;
        }
        if (iVar168 < 1) {
          uVar158 = 0;
        }
        for (uVar173 = 0; uVar173 != uVar158; uVar173 = uVar173 + 1) {
          pauVar175 = (undefined1 (*) [64])
                      ((long)iStack_ec * uVar173 * (long)iVar166 * local_108 + (long)local_118);
          pAVar181 = (Allocator *)
                     ((long)(_func_int ***)local_1e8.data +
                     local_1e8.cstep * uVar173 * local_1e8.elemsize);
          uVar188 = (long)local_1e8.h * (long)local_1e8.w;
          uVar174 = (local_1e8.elemsize * uVar188 + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          if (local_1e8.dims == 4) {
            uVar174 = uVar188;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var164) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var164) *
              *(long *)(&this->field_0x1e8 + (long)p_Var164) == 0)) {
            iVar168 = local_1e8.d * (int)uVar174;
            pAVar156 = pAVar181;
            if (iVar168 < 1) {
              iVar168 = 0;
            }
            while (iVar168 != 0) {
              pAVar156->_vptr_Allocator = (_func_int **)0x0;
              pAVar156[1]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[2]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[3]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[4]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[5]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[6]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[7]._vptr_Allocator = (_func_int **)0x0;
              pAVar156 = pAVar156 + 8;
              iVar168 = iVar168 + -1;
            }
          }
          else {
            plVar1 = (long *)(*(long *)(&this->field_0x1a8 + (long)p_Var164) + uVar173 * 0x40);
            AVar119._vptr_Allocator = (_func_int **)*plVar1;
            AVar120._vptr_Allocator = (_func_int **)plVar1[1];
            AVar121._vptr_Allocator = (_func_int **)plVar1[2];
            AVar122._vptr_Allocator = (_func_int **)plVar1[3];
            AVar123._vptr_Allocator = (_func_int **)plVar1[4];
            AVar124._vptr_Allocator = (_func_int **)plVar1[5];
            AVar125._vptr_Allocator = (_func_int **)plVar1[6];
            AVar126._vptr_Allocator = (_func_int **)plVar1[7];
            iVar168 = local_1e8.d * (int)uVar174;
            pAVar156 = pAVar181;
            if (iVar168 < 1) {
              iVar168 = 0;
            }
            while (iVar168 != 0) {
              pAVar156->_vptr_Allocator = AVar119._vptr_Allocator;
              pAVar156[1]._vptr_Allocator = AVar120._vptr_Allocator;
              pAVar156[2]._vptr_Allocator = AVar121._vptr_Allocator;
              pAVar156[3]._vptr_Allocator = AVar122._vptr_Allocator;
              pAVar156[4]._vptr_Allocator = AVar123._vptr_Allocator;
              pAVar156[5]._vptr_Allocator = AVar124._vptr_Allocator;
              pAVar156[6]._vptr_Allocator = AVar125._vptr_Allocator;
              pAVar156[7]._vptr_Allocator = AVar126._vptr_Allocator;
              pAVar156 = pAVar156 + 8;
              iVar168 = iVar168 + -1;
            }
          }
          p_Var164 = pp_Var10[-3];
          for (iVar168 = 0; iVar168 < *(int *)(&this->field_0xd8 + (long)p_Var164);
              iVar168 = iVar168 + 1) {
            for (iVar163 = 0; iVar163 < *(int *)(&this->field_0xd4 + (long)p_Var164);
                iVar163 = iVar163 + 1) {
              pauVar179 = (undefined1 (*) [64])
                          ((long)&pAVar181->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var164) * iVar163 * 0x10) * 4
                          + (long)iVar168 * (long)*(int *)(&this->field_0xe0 + (long)p_Var164) *
                            local_1e8.elemsize * (long)local_1e8.w);
              for (uVar169 = 0; uVar159 = uVar161, uVar169 != uVar165; uVar169 = uVar169 + 1) {
                while (uVar159 != 0) {
                  auVar338 = vaddps_avx512f(*pauVar175,*pauVar179);
                  *pauVar179 = auVar338;
                  p_Var164 = pp_Var10[-3];
                  pauVar179 = pauVar179 + *(int *)(&this->field_0xe4 + (long)p_Var164);
                  pauVar175 = pauVar175 + 1;
                  uVar159 = uVar159 - 1;
                }
                pauVar179 = (undefined1 (*) [64])(*pauVar179 + (long)iVar182 * 4);
              }
            }
          }
        }
      }
      else if (uVar159 == 8) {
        if ((int)uVar161 < 1) {
          uVar174 = 0;
        }
        if ((int)uVar165 < 1) {
          uVar165 = 0;
        }
        local_188 = (long)iVar166;
        if (iVar168 < 1) {
          uVar158 = 0;
        }
        for (uVar173 = 0; uVar173 != uVar158; uVar173 = uVar173 + 1) {
          pfVar176 = (float *)((long)iStack_ec * uVar173 * local_188 * local_108 + (long)local_118);
          pAVar181 = (Allocator *)
                     ((long)(_func_int ***)local_1e8.data +
                     local_1e8.cstep * uVar173 * local_1e8.elemsize);
          uVar186 = (long)local_1e8.h * (long)local_1e8.w;
          uVar188 = (local_1e8.elemsize * uVar186 + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          if (local_1e8.dims == 4) {
            uVar188 = uVar186;
          }
          p_Var164 = pp_Var10[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var164) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var164) *
              *(long *)(&this->field_0x1e8 + (long)p_Var164) == 0)) {
            iVar168 = local_1e8.d * (int)uVar188;
            pAVar156 = pAVar181;
            if (iVar168 < 1) {
              iVar168 = 0;
            }
            while (iVar168 != 0) {
              pAVar156->_vptr_Allocator = (_func_int **)0x0;
              pAVar156[1]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[2]._vptr_Allocator = (_func_int **)0x0;
              pAVar156[3]._vptr_Allocator = (_func_int **)0x0;
              pAVar156 = pAVar156 + 4;
              iVar168 = iVar168 + -1;
            }
          }
          else {
            auVar247 = *(undefined1 (*) [32])
                        (*(long *)(&this->field_0x1a8 + (long)p_Var164) + uVar173 * 0x20);
            iVar168 = local_1e8.d * (int)uVar188;
            pAVar156 = pAVar181;
            if (iVar168 < 1) {
              iVar168 = 0;
            }
            while (iVar168 != 0) {
              *(undefined1 (*) [32])pAVar156 = auVar247;
              pAVar156 = pAVar156 + 4;
              iVar168 = iVar168 + -1;
            }
          }
          p_Var164 = pp_Var10[-3];
          for (iVar168 = 0; iVar168 < *(int *)(&this->field_0xd8 + (long)p_Var164);
              iVar168 = iVar168 + 1) {
            for (iVar166 = 0; iVar166 < *(int *)(&this->field_0xd4 + (long)p_Var164);
                iVar166 = iVar166 + 1) {
              pauVar187 = (undefined1 (*) [32])
                          ((long)&pAVar181->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var164) * iVar166 * 8) * 4 +
                          (long)iVar168 * (long)*(int *)(&this->field_0xe0 + (long)p_Var164) *
                          local_1e8.elemsize * (long)local_1e8.w);
              for (uVar161 = 0; uVar188 = uVar174, uVar161 != uVar165; uVar161 = uVar161 + 1) {
                while ((int)uVar188 != 0) {
                  auVar247._0_4_ = *pfVar176 + *(float *)*pauVar187;
                  auVar247._4_4_ = pfVar176[1] + *(float *)(*pauVar187 + 4);
                  auVar247._8_4_ = pfVar176[2] + *(float *)(*pauVar187 + 8);
                  auVar247._12_4_ = pfVar176[3] + *(float *)(*pauVar187 + 0xc);
                  auVar247._16_4_ = pfVar176[4] + *(float *)(*pauVar187 + 0x10);
                  auVar247._20_4_ = pfVar176[5] + *(float *)(*pauVar187 + 0x14);
                  auVar247._24_4_ = pfVar176[6] + *(float *)(*pauVar187 + 0x18);
                  auVar247._28_4_ = pfVar176[7] + *(float *)(*pauVar187 + 0x1c);
                  *pauVar187 = auVar247;
                  p_Var164 = pp_Var10[-3];
                  pauVar187 = pauVar187 + *(int *)(&this->field_0xe4 + (long)p_Var164);
                  pfVar176 = pfVar176 + 8;
                  uVar188 = (ulong)((int)uVar188 - 1);
                }
                pauVar187 = (undefined1 (*) [32])(*pauVar187 + (long)iVar182 * 4);
              }
            }
          }
        }
      }
      else if (uVar159 == 4) {
        if ((int)uVar161 < 1) {
          uVar161 = 0;
        }
        if ((int)uVar165 < 1) {
          uVar165 = 0;
        }
        uVar173 = 0;
        if (0 < iVar168) {
          uVar173 = uVar158;
        }
        pp_Var10 = this->_vptr_Deconvolution_x86_avx512;
        for (uVar174 = 0; uVar174 != uVar173; uVar174 = uVar174 + 1) {
          pfVar176 = (float *)((long)iStack_ec * uVar174 * local_188 * local_108 + (long)local_118);
          pAVar181 = (Allocator *)
                     ((long)(_func_int ***)local_1e8.data +
                     local_1e8.cstep * uVar174 * local_1e8.elemsize);
          uVar188 = (long)local_1e8.h * (long)local_1e8.w;
          uVar158 = (local_1e8.elemsize * uVar188 + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          if (local_1e8.dims == 4) {
            uVar158 = uVar188;
          }
          p_Var164 = pp_Var10[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var164) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var164) *
              *(long *)(&this->field_0x1e8 + (long)p_Var164) == 0)) {
            iVar168 = local_1e8.d * (int)uVar158;
            pAVar156 = pAVar181;
            if (iVar168 < 1) {
              iVar168 = 0;
            }
            while (iVar168 != 0) {
              pAVar156->_vptr_Allocator = (_func_int **)0x0;
              pAVar156[1]._vptr_Allocator = (_func_int **)0x0;
              pAVar156 = pAVar156 + 2;
              iVar168 = iVar168 + -1;
            }
          }
          else {
            auVar191 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1a8 + (long)p_Var164) + uVar174 * 0x10);
            iVar168 = local_1e8.d * (int)uVar158;
            pAVar156 = pAVar181;
            if (iVar168 < 1) {
              iVar168 = 0;
            }
            while (iVar168 != 0) {
              *(undefined1 (*) [16])pAVar156 = auVar191;
              pAVar156 = pAVar156 + 2;
              iVar168 = iVar168 + -1;
            }
          }
          p_Var164 = pp_Var10[-3];
          for (iVar168 = 0; iVar168 < *(int *)(&this->field_0xd8 + (long)p_Var164);
              iVar168 = iVar168 + 1) {
            for (iVar166 = 0; iVar166 < *(int *)(&this->field_0xd4 + (long)p_Var164);
                iVar166 = iVar166 + 1) {
              pauVar189 = (undefined1 (*) [16])
                          ((long)&pAVar181->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var164) * iVar166 * 4) * 4 +
                          (long)iVar168 * (long)*(int *)(&this->field_0xe0 + (long)p_Var164) *
                          local_1e8.elemsize * (long)local_1e8.w);
              for (uVar169 = 0; uVar159 = uVar161, uVar169 != uVar165; uVar169 = uVar169 + 1) {
                while (uVar159 != 0) {
                  auVar191._0_4_ = *pfVar176 + *(float *)*pauVar189;
                  auVar191._4_4_ = pfVar176[1] + *(float *)(*pauVar189 + 4);
                  auVar191._8_4_ = pfVar176[2] + *(float *)(*pauVar189 + 8);
                  auVar191._12_4_ = pfVar176[3] + *(float *)(*pauVar189 + 0xc);
                  *pauVar189 = auVar191;
                  p_Var164 = pp_Var10[-3];
                  pauVar189 = pauVar189 + *(int *)(&this->field_0xe4 + (long)p_Var164);
                  pfVar176 = pfVar176 + 4;
                  uVar159 = uVar159 - 1;
                }
                pauVar189 = (undefined1 (*) [16])(*pauVar189 + (long)iVar182 * 4);
              }
            }
          }
        }
      }
      pLVar15 = this->activation;
      if (pLVar15 != (Layer *)0x0) {
        (*pLVar15->_vptr_Layer[9])(pLVar15,&local_1e8,local_180);
      }
      piVar9 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_f8 == (long *)0x0) {
            free(local_118);
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            free(local_c8);
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if ((iVar170 == 0x10) && (uVar159 == 0x10)) {
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        uVar340 = *(undefined4 *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        auVar338 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar301 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q2);
        auVar302 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q1);
        auVar303 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
        local_158 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar338);
        uVar173 = 0;
        if (0 < (int)uVar169) {
          uVar173 = (ulong)uVar169;
        }
        uVar174 = 0;
        if (0 < (int)uVar160) {
          uVar174 = (ulong)uVar160;
        }
        local_190 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          local_190 = 0;
        }
        uVar158 = 0;
        auVar191 = vxorps_avx512vl(auVar191,auVar191);
        auVar338 = ZEXT1664(auVar191);
        in_ZMM30 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        for (; uVar158 != local_190; uVar158 = uVar158 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar158 * local_1e8.elemsize);
          iVar152 = bottom_blob->w;
          iVar153 = bottom_blob->h;
          uVar186 = 0;
          uVar188 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar188 = uVar186;
          }
          uVar161 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar161 = 0;
          }
          uVar165 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar165 = 0;
          }
          while (uVar167 = (uint)uVar186, uVar167 != uVar165) {
            iVar154 = (1 - uVar169) * iVar168;
            for (uVar148 = 0; uVar148 != uVar161; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar320 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar320 = *(undefined1 (*) [64])(lVar157 + uVar158 * 0x40);
              }
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar158 * (this->weight_data_tm).elemsize +
                        0x3c0;
              for (uVar186 = 0; uVar186 != uVar188; uVar186 = uVar186 + 1) {
                lVar180 = lVar162;
                for (uVar183 = 0; uVar183 != uVar174; uVar183 = uVar183 + 1) {
                  iVar146 = (((int)uVar183 - uVar160) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar146) && (iVar147 = iVar146 / iVar163, iVar146 % iVar163 == 0)) &&
                     (iVar147 < iVar153)) {
                    lVar127 = (long)iVar147 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar186;
                    iVar146 = iVar154;
                    for (lVar171 = 0; uVar173 * 0x400 != lVar171; lVar171 = lVar171 + 0x400) {
                      if (((-1 < iVar146) && (iVar147 = iVar146 / iVar182, iVar146 % iVar182 == 0))
                         && (iVar147 < iVar152)) {
                        lVar155 = (long)(iVar147 << 4);
                        auVar304 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127)));
                        auVar305 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 4)));
                        auVar306 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 8)));
                        auVar307 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar308 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x10)));
                        auVar309 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x14)));
                        auVar310 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x18)));
                        auVar311 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x1c)));
                        auVar312 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x20)));
                        auVar313 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x24)));
                        auVar314 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x28)));
                        auVar315 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x2c)));
                        auVar316 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x30)));
                        auVar317 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x34)));
                        auVar318 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x38)));
                        auVar319 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x3c)));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar304,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x3c0 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar305,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x380 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar306,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x340 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar307,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x300 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar308,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x2c0 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar309,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x280 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar310,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x240 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar311,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x200 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar312,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x1c0 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar313,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x180 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar314,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x140 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar315,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x100 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar316,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0xc0 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar317,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x80 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar318,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x40 + lVar171));
                        auVar320 = vfmadd231ps_avx512f(auVar320,auVar319,
                                                       *(undefined1 (*) [64])(lVar180 + lVar171));
                      }
                      iVar146 = iVar146 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar169 * 0x400;
                }
                lVar162 = lVar162 + (long)(int)(uVar169 * uVar160 * 0x100) * 4;
              }
              auVar304 = auVar320;
              switch(uVar340) {
              case 1:
                auVar304 = vmaxps_avx512f(auVar320,auVar338);
                break;
              case 2:
                uVar186 = vcmpps_avx512f(auVar320,auVar338,1);
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar314._4_4_ = uVar2;
                auVar314._0_4_ = uVar2;
                auVar314._8_4_ = uVar2;
                auVar314._12_4_ = uVar2;
                auVar314._16_4_ = uVar2;
                auVar314._20_4_ = uVar2;
                auVar314._24_4_ = uVar2;
                auVar314._28_4_ = uVar2;
                auVar314._32_4_ = uVar2;
                auVar314._36_4_ = uVar2;
                auVar314._40_4_ = uVar2;
                auVar314._44_4_ = uVar2;
                auVar314._48_4_ = uVar2;
                auVar314._52_4_ = uVar2;
                auVar314._56_4_ = uVar2;
                auVar314._60_4_ = uVar2;
                auVar305 = vmulps_avx512f(auVar320,auVar314);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar304._0_4_ = (uint)bVar16 * auVar305._0_4_ | (uint)!bVar16 * auVar320._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar304._4_4_ = (uint)bVar16 * auVar305._4_4_ | (uint)!bVar16 * auVar320._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar304._8_4_ = (uint)bVar16 * auVar305._8_4_ | (uint)!bVar16 * auVar320._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar304._12_4_ = (uint)bVar16 * auVar305._12_4_ | (uint)!bVar16 * auVar320._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar304._16_4_ = (uint)bVar16 * auVar305._16_4_ | (uint)!bVar16 * auVar320._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar304._20_4_ = (uint)bVar16 * auVar305._20_4_ | (uint)!bVar16 * auVar320._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar304._24_4_ = (uint)bVar16 * auVar305._24_4_ | (uint)!bVar16 * auVar320._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar304._28_4_ = (uint)bVar16 * auVar305._28_4_ | (uint)!bVar16 * auVar320._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar304._32_4_ = (uint)bVar16 * auVar305._32_4_ | (uint)!bVar16 * auVar320._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar304._36_4_ = (uint)bVar16 * auVar305._36_4_ | (uint)!bVar16 * auVar320._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar304._40_4_ = (uint)bVar16 * auVar305._40_4_ | (uint)!bVar16 * auVar320._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar304._44_4_ = (uint)bVar16 * auVar305._44_4_ | (uint)!bVar16 * auVar320._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar304._48_4_ = (uint)bVar16 * auVar305._48_4_ | (uint)!bVar16 * auVar320._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar304._52_4_ = (uint)bVar16 * auVar305._52_4_ | (uint)!bVar16 * auVar320._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar304._56_4_ = (uint)bVar16 * auVar305._56_4_ | (uint)!bVar16 * auVar320._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar304._60_4_ = (uint)bVar16 * auVar305._60_4_ | (uint)!bVar16 * auVar320._60_4_;
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar313._4_4_ = uVar2;
                auVar313._0_4_ = uVar2;
                auVar313._8_4_ = uVar2;
                auVar313._12_4_ = uVar2;
                auVar313._16_4_ = uVar2;
                auVar313._20_4_ = uVar2;
                auVar313._24_4_ = uVar2;
                auVar313._28_4_ = uVar2;
                auVar313._32_4_ = uVar2;
                auVar313._36_4_ = uVar2;
                auVar313._40_4_ = uVar2;
                auVar313._44_4_ = uVar2;
                auVar313._48_4_ = uVar2;
                auVar313._52_4_ = uVar2;
                auVar313._56_4_ = uVar2;
                auVar313._60_4_ = uVar2;
                auVar304 = vmaxps_avx512f(auVar320,auVar313);
                uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar320._4_4_ = uVar2;
                auVar320._0_4_ = uVar2;
                auVar320._8_4_ = uVar2;
                auVar320._12_4_ = uVar2;
                auVar320._16_4_ = uVar2;
                auVar320._20_4_ = uVar2;
                auVar320._24_4_ = uVar2;
                auVar320._28_4_ = uVar2;
                auVar320._32_4_ = uVar2;
                auVar320._36_4_ = uVar2;
                auVar320._40_4_ = uVar2;
                auVar320._44_4_ = uVar2;
                auVar320._48_4_ = uVar2;
                auVar320._52_4_ = uVar2;
                auVar320._56_4_ = uVar2;
                auVar320._60_4_ = uVar2;
                auVar304 = vminps_avx512f(auVar304,auVar320);
                break;
              case 4:
                auVar306._8_4_ = 0x80000000;
                auVar306._0_8_ = 0x8000000080000000;
                auVar306._12_4_ = 0x80000000;
                auVar306._16_4_ = 0x80000000;
                auVar306._20_4_ = 0x80000000;
                auVar306._24_4_ = 0x80000000;
                auVar306._28_4_ = 0x80000000;
                auVar306._32_4_ = 0x80000000;
                auVar306._36_4_ = 0x80000000;
                auVar306._40_4_ = 0x80000000;
                auVar306._44_4_ = 0x80000000;
                auVar306._48_4_ = 0x80000000;
                auVar306._52_4_ = 0x80000000;
                auVar306._56_4_ = 0x80000000;
                auVar306._60_4_ = 0x80000000;
                auVar320 = vxorps_avx512dq(auVar320,auVar306);
                auVar320 = vminps_avx512f(auVar320,(undefined1  [64])afVar129);
                auVar320 = vmaxps_avx512f(auVar320,(undefined1  [64])afVar130);
                auVar304 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar320,
                                               (undefined1  [64])afVar137);
                auVar305 = vrndscaleps_avx512f(auVar304,1);
                uVar186 = vcmpps_avx512f(auVar304,auVar305,1);
                auVar304 = vsubps_avx512f(auVar305,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar312._0_4_ = (uint)bVar16 * auVar304._0_4_ | (uint)!bVar16 * auVar305._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar312._4_4_ = (uint)bVar16 * auVar304._4_4_ | (uint)!bVar16 * auVar305._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar312._8_4_ = (uint)bVar16 * auVar304._8_4_ | (uint)!bVar16 * auVar305._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar312._12_4_ = (uint)bVar16 * auVar304._12_4_ | (uint)!bVar16 * auVar305._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar312._16_4_ = (uint)bVar16 * auVar304._16_4_ | (uint)!bVar16 * auVar305._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar312._20_4_ = (uint)bVar16 * auVar304._20_4_ | (uint)!bVar16 * auVar305._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar312._24_4_ = (uint)bVar16 * auVar304._24_4_ | (uint)!bVar16 * auVar305._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar312._28_4_ = (uint)bVar16 * auVar304._28_4_ | (uint)!bVar16 * auVar305._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar312._32_4_ = (uint)bVar16 * auVar304._32_4_ | (uint)!bVar16 * auVar305._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar312._36_4_ = (uint)bVar16 * auVar304._36_4_ | (uint)!bVar16 * auVar305._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar312._40_4_ = (uint)bVar16 * auVar304._40_4_ | (uint)!bVar16 * auVar305._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar312._44_4_ = (uint)bVar16 * auVar304._44_4_ | (uint)!bVar16 * auVar305._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar312._48_4_ = (uint)bVar16 * auVar304._48_4_ | (uint)!bVar16 * auVar305._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar312._52_4_ = (uint)bVar16 * auVar304._52_4_ | (uint)!bVar16 * auVar305._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar312._56_4_ = (uint)bVar16 * auVar304._56_4_ | (uint)!bVar16 * auVar305._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar312._60_4_ = (uint)bVar16 * auVar304._60_4_ | (uint)!bVar16 * auVar305._60_4_;
                auVar320 = vfmadd231ps_avx512f(auVar320,auVar312,auVar301);
                auVar320 = vfmadd231ps_avx512f(auVar320,auVar312,auVar302);
                auVar304 = vmulps_avx512f(auVar320,auVar320);
                auVar305 = vfmadd213ps_avx512f(auVar320,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar134);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar135);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar136);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar137);
                auVar320 = vfmadd213ps_avx512f(auVar305,auVar304,auVar320);
                auVar320 = vaddps_avx512f(auVar320,(undefined1  [64])afVar128);
                auVar304 = vcvttps2dq_avx512f(auVar312);
                auVar304 = vpaddd_avx512f(auVar304,auVar303);
                auVar304 = vpslld_avx512f(auVar304,0x17);
                auVar320 = vfmadd213ps_avx512f(auVar304,auVar320,in_ZMM30);
                auVar304 = vrcp14ps_avx512f(auVar320);
                auVar320 = vfmsub213ps_avx512f(auVar320,auVar304,in_ZMM30);
                auVar304 = vfnmadd132ps_avx512vl(auVar320,auVar304,auVar304);
                break;
              case 5:
                auVar304 = vminps_avx512f(auVar320,(undefined1  [64])afVar129);
                auVar304 = vmaxps_avx512f(auVar304,(undefined1  [64])afVar130);
                auVar305 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar304,
                                               (undefined1  [64])afVar137);
                auVar306 = vrndscaleps_avx512f(auVar305,1);
                uVar186 = vcmpps_avx512f(auVar305,auVar306,1);
                auVar305 = vsubps_avx512f(auVar306,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar307._0_4_ = (uint)bVar16 * auVar305._0_4_ | (uint)!bVar16 * auVar306._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar307._4_4_ = (uint)bVar16 * auVar305._4_4_ | (uint)!bVar16 * auVar306._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar307._8_4_ = (uint)bVar16 * auVar305._8_4_ | (uint)!bVar16 * auVar306._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar307._12_4_ = (uint)bVar16 * auVar305._12_4_ | (uint)!bVar16 * auVar306._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar307._16_4_ = (uint)bVar16 * auVar305._16_4_ | (uint)!bVar16 * auVar306._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar307._20_4_ = (uint)bVar16 * auVar305._20_4_ | (uint)!bVar16 * auVar306._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar307._24_4_ = (uint)bVar16 * auVar305._24_4_ | (uint)!bVar16 * auVar306._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar307._28_4_ = (uint)bVar16 * auVar305._28_4_ | (uint)!bVar16 * auVar306._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar307._32_4_ = (uint)bVar16 * auVar305._32_4_ | (uint)!bVar16 * auVar306._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar307._36_4_ = (uint)bVar16 * auVar305._36_4_ | (uint)!bVar16 * auVar306._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar307._40_4_ = (uint)bVar16 * auVar305._40_4_ | (uint)!bVar16 * auVar306._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar307._44_4_ = (uint)bVar16 * auVar305._44_4_ | (uint)!bVar16 * auVar306._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar307._48_4_ = (uint)bVar16 * auVar305._48_4_ | (uint)!bVar16 * auVar306._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar307._52_4_ = (uint)bVar16 * auVar305._52_4_ | (uint)!bVar16 * auVar306._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar307._56_4_ = (uint)bVar16 * auVar305._56_4_ | (uint)!bVar16 * auVar306._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar307._60_4_ = (uint)bVar16 * auVar305._60_4_ | (uint)!bVar16 * auVar306._60_4_;
                auVar304 = vfmadd231ps_avx512f(auVar304,auVar307,auVar301);
                auVar304 = vfmadd231ps_avx512f(auVar304,auVar307,auVar302);
                auVar305 = vmulps_avx512f(auVar304,auVar304);
                auVar306 = vfmadd213ps_avx512f(auVar304,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar304,(undefined1  [64])afVar134);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar304,(undefined1  [64])afVar135);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar304,(undefined1  [64])afVar136);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar304,(undefined1  [64])afVar137);
                auVar304 = vfmadd213ps_avx512f(auVar306,auVar305,auVar304);
                auVar304 = vaddps_avx512f(auVar304,(undefined1  [64])afVar128);
                auVar305 = vcvttps2dq_avx512f(auVar307);
                auVar305 = vpaddd_avx512f(auVar305,auVar303);
                auVar305 = vpslld_avx512f(auVar305,0x17);
                auVar304 = vfmadd213ps_avx512f(auVar305,auVar304,in_ZMM30);
                auVar305 = vmaxps_avx512f(auVar304,(undefined1  [64])_ps512_min_norm_pos);
                auVar306 = vpsrld_avx512f(auVar305,0x17);
                auVar305 = vpternlogd_avx512f(auVar305,(undefined1  [64])afVar137,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar186 = vcmpps_avx512f(auVar305,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar307 = vsubps_avx512f(auVar305,(undefined1  [64])afVar128);
                auVar305 = vaddps_avx512f(auVar307,auVar305);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar308._0_4_ = (uint)bVar16 * auVar305._0_4_ | (uint)!bVar16 * auVar307._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar308._4_4_ = (uint)bVar16 * auVar305._4_4_ | (uint)!bVar16 * auVar307._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar308._8_4_ = (uint)bVar16 * auVar305._8_4_ | (uint)!bVar16 * auVar307._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar308._12_4_ = (uint)bVar16 * auVar305._12_4_ | (uint)!bVar16 * auVar307._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar308._16_4_ = (uint)bVar16 * auVar305._16_4_ | (uint)!bVar16 * auVar307._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar308._20_4_ = (uint)bVar16 * auVar305._20_4_ | (uint)!bVar16 * auVar307._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar308._24_4_ = (uint)bVar16 * auVar305._24_4_ | (uint)!bVar16 * auVar307._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar308._28_4_ = (uint)bVar16 * auVar305._28_4_ | (uint)!bVar16 * auVar307._28_4_;
                bVar17 = (byte)(uVar186 >> 8);
                bVar16 = (bool)(bVar17 & 1);
                auVar308._32_4_ = (uint)bVar16 * auVar305._32_4_ | (uint)!bVar16 * auVar307._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar308._36_4_ = (uint)bVar16 * auVar305._36_4_ | (uint)!bVar16 * auVar307._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar308._40_4_ = (uint)bVar16 * auVar305._40_4_ | (uint)!bVar16 * auVar307._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar308._44_4_ = (uint)bVar16 * auVar305._44_4_ | (uint)!bVar16 * auVar307._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar308._48_4_ = (uint)bVar16 * auVar305._48_4_ | (uint)!bVar16 * auVar307._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar308._52_4_ = (uint)bVar16 * auVar305._52_4_ | (uint)!bVar16 * auVar307._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar308._56_4_ = (uint)bVar16 * auVar305._56_4_ | (uint)!bVar16 * auVar307._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar308._60_4_ = (uint)bVar16 * auVar305._60_4_ | (uint)!bVar16 * auVar307._60_4_;
                auVar305 = vmulps_avx512f(auVar308,auVar308);
                auVar307 = vfmadd132ps_avx512f(auVar308,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar308,
                                               (undefined1  [64])_ps512_cephes_log_p2);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar308,
                                               (undefined1  [64])_ps512_cephes_log_p3);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar308,
                                               (undefined1  [64])_ps512_cephes_log_p4);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar308,
                                               (undefined1  [64])_ps512_cephes_log_p5);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar308,
                                               (undefined1  [64])_ps512_cephes_log_p6);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar308,
                                               (undefined1  [64])_ps512_cephes_log_p7);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar308,
                                               (undefined1  [64])_ps512_cephes_log_p8);
                auVar309 = vmulps_avx512f(auVar305,auVar308);
                auVar307 = vfmadd213ps_avx512f(auVar309,auVar307,auVar308);
                uVar183 = vcmpps_avx512f(auVar304,auVar338,2);
                auVar304 = vpsubd_avx512f(auVar306,auVar303);
                auVar304 = vcvtdq2ps_avx512f(auVar304);
                auVar306 = vaddps_avx512f(auVar304,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar309._0_4_ = (uint)bVar16 * auVar304._0_4_ | (uint)!bVar16 * auVar306._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar309._4_4_ = (uint)bVar16 * auVar304._4_4_ | (uint)!bVar16 * auVar306._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar309._8_4_ = (uint)bVar16 * auVar304._8_4_ | (uint)!bVar16 * auVar306._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar309._12_4_ = (uint)bVar16 * auVar304._12_4_ | (uint)!bVar16 * auVar306._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar309._16_4_ = (uint)bVar16 * auVar304._16_4_ | (uint)!bVar16 * auVar306._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar309._20_4_ = (uint)bVar16 * auVar304._20_4_ | (uint)!bVar16 * auVar306._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar309._24_4_ = (uint)bVar16 * auVar304._24_4_ | (uint)!bVar16 * auVar306._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar309._28_4_ = (uint)bVar16 * auVar304._28_4_ | (uint)!bVar16 * auVar306._28_4_;
                bVar16 = (bool)(bVar17 & 1);
                auVar309._32_4_ = (uint)bVar16 * auVar304._32_4_ | (uint)!bVar16 * auVar306._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar309._36_4_ = (uint)bVar16 * auVar304._36_4_ | (uint)!bVar16 * auVar306._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar309._40_4_ = (uint)bVar16 * auVar304._40_4_ | (uint)!bVar16 * auVar306._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar309._44_4_ = (uint)bVar16 * auVar304._44_4_ | (uint)!bVar16 * auVar306._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar309._48_4_ = (uint)bVar16 * auVar304._48_4_ | (uint)!bVar16 * auVar306._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar309._52_4_ = (uint)bVar16 * auVar304._52_4_ | (uint)!bVar16 * auVar306._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar309._56_4_ = (uint)bVar16 * auVar304._56_4_ | (uint)!bVar16 * auVar306._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar309._60_4_ = (uint)bVar16 * auVar304._60_4_ | (uint)!bVar16 * auVar306._60_4_;
                auVar304 = vfmadd231ps_avx512f(auVar307,auVar309,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar304 = vfmadd231ps_avx512f(auVar304,auVar305,local_158);
                auVar304 = vfmadd231ps_avx512f(auVar304,auVar309,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar305 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                auVar304 = vmulps_avx512f(auVar304,auVar305);
                auVar306 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar310._0_4_ = (uint)bVar16 * auVar306._0_4_ | (uint)!bVar16 * auVar304._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar310._4_4_ = (uint)bVar16 * auVar306._4_4_ | (uint)!bVar16 * auVar304._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar310._8_4_ = (uint)bVar16 * auVar306._8_4_ | (uint)!bVar16 * auVar304._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar310._12_4_ = (uint)bVar16 * auVar306._12_4_ | (uint)!bVar16 * auVar304._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar310._16_4_ = (uint)bVar16 * auVar306._16_4_ | (uint)!bVar16 * auVar304._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar310._20_4_ = (uint)bVar16 * auVar306._20_4_ | (uint)!bVar16 * auVar304._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar310._24_4_ = (uint)bVar16 * auVar306._24_4_ | (uint)!bVar16 * auVar304._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar310._28_4_ = (uint)bVar16 * auVar306._28_4_ | (uint)!bVar16 * auVar304._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar310._32_4_ = (uint)bVar16 * auVar306._32_4_ | (uint)!bVar16 * auVar304._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar310._36_4_ = (uint)bVar16 * auVar306._36_4_ | (uint)!bVar16 * auVar304._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar310._40_4_ = (uint)bVar16 * auVar306._40_4_ | (uint)!bVar16 * auVar304._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar310._44_4_ = (uint)bVar16 * auVar306._44_4_ | (uint)!bVar16 * auVar304._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar310._48_4_ = (uint)bVar16 * auVar306._48_4_ | (uint)!bVar16 * auVar304._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar310._52_4_ = (uint)bVar16 * auVar306._52_4_ | (uint)!bVar16 * auVar304._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar310._56_4_ = (uint)bVar16 * auVar306._56_4_ | (uint)!bVar16 * auVar304._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar310._60_4_ = (uint)bVar16 * auVar306._60_4_ | (uint)!bVar16 * auVar304._60_4_;
                auVar304 = vminps_avx512f(auVar310,(undefined1  [64])afVar129);
                auVar304 = vmaxps_avx512f(auVar304,(undefined1  [64])afVar130);
                auVar306 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar304,
                                               (undefined1  [64])afVar137);
                auVar307 = vrndscaleps_avx512f(auVar306,1);
                uVar186 = vcmpps_avx512f(auVar306,auVar307,1);
                auVar306 = vsubps_avx512f(auVar307,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar311._0_4_ = (uint)bVar16 * auVar306._0_4_ | (uint)!bVar16 * auVar307._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar311._4_4_ = (uint)bVar16 * auVar306._4_4_ | (uint)!bVar16 * auVar307._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar311._8_4_ = (uint)bVar16 * auVar306._8_4_ | (uint)!bVar16 * auVar307._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar311._12_4_ = (uint)bVar16 * auVar306._12_4_ | (uint)!bVar16 * auVar307._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar311._16_4_ = (uint)bVar16 * auVar306._16_4_ | (uint)!bVar16 * auVar307._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar311._20_4_ = (uint)bVar16 * auVar306._20_4_ | (uint)!bVar16 * auVar307._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar311._24_4_ = (uint)bVar16 * auVar306._24_4_ | (uint)!bVar16 * auVar307._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar311._28_4_ = (uint)bVar16 * auVar306._28_4_ | (uint)!bVar16 * auVar307._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar311._32_4_ = (uint)bVar16 * auVar306._32_4_ | (uint)!bVar16 * auVar307._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar311._36_4_ = (uint)bVar16 * auVar306._36_4_ | (uint)!bVar16 * auVar307._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar311._40_4_ = (uint)bVar16 * auVar306._40_4_ | (uint)!bVar16 * auVar307._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar311._44_4_ = (uint)bVar16 * auVar306._44_4_ | (uint)!bVar16 * auVar307._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar311._48_4_ = (uint)bVar16 * auVar306._48_4_ | (uint)!bVar16 * auVar307._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar311._52_4_ = (uint)bVar16 * auVar306._52_4_ | (uint)!bVar16 * auVar307._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar311._56_4_ = (uint)bVar16 * auVar306._56_4_ | (uint)!bVar16 * auVar307._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar311._60_4_ = (uint)bVar16 * auVar306._60_4_ | (uint)!bVar16 * auVar307._60_4_;
                auVar304 = vfmadd231ps_avx512f(auVar304,auVar311,auVar301);
                auVar304 = vfmadd231ps_avx512f(auVar304,auVar311,auVar302);
                auVar306 = vmulps_avx512f(auVar304,auVar304);
                auVar307 = vfmadd213ps_avx512f(auVar304,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar304,(undefined1  [64])afVar134);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar304,(undefined1  [64])afVar135);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar304,(undefined1  [64])afVar136);
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar304,(undefined1  [64])afVar137);
                auVar304 = vfmadd213ps_avx512f(auVar307,auVar306,auVar304);
                auVar304 = vaddps_avx512f(auVar304,(undefined1  [64])afVar128);
                auVar306 = vcvttps2dq_avx512f(auVar311);
                auVar306 = vpaddd_avx512f(auVar306,auVar303);
                auVar306 = vpslld_avx512f(auVar306,0x17);
                auVar304 = vfmadd213ps_avx512f(auVar306,auVar304,in_ZMM30);
                auVar306 = vrcp14ps_avx512f(auVar304);
                auVar304 = vfmsub213ps_avx512f(auVar304,auVar306,in_ZMM30);
                auVar304 = vfnmadd132ps_avx512vl(auVar304,auVar306,auVar306);
                auVar304 = vfnmsub213ps_avx512f(auVar304,auVar305,in_ZMM30);
                auVar304 = vmulps_avx512f(auVar304,auVar320);
                break;
              case 6:
                auVar304 = vbroadcastss_avx512f
                                     (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var164)));
                uVar177 = (*(uint **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar305._4_4_ = uVar177;
                auVar305._0_4_ = uVar177;
                auVar305._8_4_ = uVar177;
                auVar305._12_4_ = uVar177;
                auVar305._16_4_ = uVar177;
                auVar305._20_4_ = uVar177;
                auVar305._24_4_ = uVar177;
                auVar305._28_4_ = uVar177;
                auVar305._32_4_ = uVar177;
                auVar305._36_4_ = uVar177;
                auVar305._40_4_ = uVar177;
                auVar305._44_4_ = uVar177;
                auVar305._48_4_ = uVar177;
                auVar305._52_4_ = uVar177;
                auVar305._56_4_ = uVar177;
                auVar305._60_4_ = uVar177;
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar320,auVar305);
                auVar304 = vmaxps_avx512f(auVar304,auVar338);
                auVar304 = vminps_avx512f(auVar304,in_ZMM30);
                auVar304 = vmulps_avx512f(auVar304,auVar320);
              }
              *(undefined1 (*) [64])local_268 = auVar304;
              local_268 = local_268 + 8;
              iVar154 = iVar154 + 1;
            }
            uVar186 = (ulong)(uVar167 + 1);
          }
        }
      }
      afVar142 = _ps512_cephes_log_p8;
      afVar141 = _ps512_cephes_log_p7;
      afVar140 = _ps512_cephes_log_p6;
      afVar139 = _ps512_cephes_log_p5;
      afVar138 = _ps512_cephes_log_p4;
      afVar137 = _ps512_cephes_exp_p5;
      afVar136 = _ps512_cephes_exp_p4;
      afVar135 = _ps512_cephes_exp_p3;
      afVar134 = _ps512_cephes_exp_p2;
      afVar133 = _ps512_cephes_exp_p1;
      afVar132 = _ps512_cephes_exp_p0;
      afVar131 = _ps512_cephes_LOG2EF;
      afVar130 = _ps512_exp_lo;
      afVar129 = _ps512_exp_hi;
      afVar128 = _ps512_1;
      if ((iVar170 == 8) && (uVar159 == 0x10)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        uVar340 = *(undefined4 *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        auVar338 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar301 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q2);
        auVar302 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q1);
        auVar303 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
        auVar320 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar338);
        uVar174 = 0;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar174;
        }
        auVar304 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar191 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar191);
        auVar305 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (; uVar174 != uVar188; uVar174 = uVar174 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar174 * local_1e8.elemsize);
          iVar152 = bottom_blob->w;
          iVar153 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar154 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar306 = *(undefined1 (*) [64])(lVar157 + uVar174 * 0x40);
              }
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar174 * (this->weight_data_tm).elemsize +
                        0x1c0;
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                lVar180 = lVar162;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar146 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar146) && (iVar147 = iVar146 / iVar163, iVar146 % iVar163 == 0)) &&
                     (iVar147 < iVar153)) {
                    lVar127 = (long)iVar147 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar183;
                    iVar146 = iVar154;
                    for (lVar171 = 0; uVar173 * 0x200 != lVar171; lVar171 = lVar171 + 0x200) {
                      if (((-1 < iVar146) && (iVar147 = iVar146 / iVar182, iVar146 % iVar182 == 0))
                         && (iVar147 < iVar152)) {
                        lVar155 = (long)(iVar147 << 3);
                        auVar307 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127)));
                        auVar308 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 4)));
                        auVar309 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 8)));
                        auVar310 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar311 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x10)));
                        auVar312 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x14)));
                        auVar313 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x18)));
                        auVar314 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x1c)));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar307,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x1c0 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar308,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x180 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar309,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x140 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar310,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x100 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar311,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0xc0 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar312,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x80 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar313,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x40 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar314,
                                                       *(undefined1 (*) [64])(lVar180 + lVar171));
                      }
                      iVar146 = iVar146 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x200;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x80) * 4;
              }
              auVar315 = auVar306;
              switch(uVar340) {
              case 1:
                auVar315 = vmaxps_avx512f(auVar306,in_ZMM30);
                break;
              case 2:
                uVar183 = vcmpps_avx512f(auVar306,in_ZMM30,1);
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar104._4_4_ = uVar2;
                auVar104._0_4_ = uVar2;
                auVar104._8_4_ = uVar2;
                auVar104._12_4_ = uVar2;
                auVar104._16_4_ = uVar2;
                auVar104._20_4_ = uVar2;
                auVar104._24_4_ = uVar2;
                auVar104._28_4_ = uVar2;
                auVar104._32_4_ = uVar2;
                auVar104._36_4_ = uVar2;
                auVar104._40_4_ = uVar2;
                auVar104._44_4_ = uVar2;
                auVar104._48_4_ = uVar2;
                auVar104._52_4_ = uVar2;
                auVar104._56_4_ = uVar2;
                auVar104._60_4_ = uVar2;
                auVar307 = vmulps_avx512f(auVar306,auVar104);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar315._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar306._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar315._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar306._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar315._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar306._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar315._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar306._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar315._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar306._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar315._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar306._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar315._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar306._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar315._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar306._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar315._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar306._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar315._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar306._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar315._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar306._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar315._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar306._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar315._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar306._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar315._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar306._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar315._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar306._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar315._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar306._60_4_;
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar102._4_4_ = uVar2;
                auVar102._0_4_ = uVar2;
                auVar102._8_4_ = uVar2;
                auVar102._12_4_ = uVar2;
                auVar102._16_4_ = uVar2;
                auVar102._20_4_ = uVar2;
                auVar102._24_4_ = uVar2;
                auVar102._28_4_ = uVar2;
                auVar102._32_4_ = uVar2;
                auVar102._36_4_ = uVar2;
                auVar102._40_4_ = uVar2;
                auVar102._44_4_ = uVar2;
                auVar102._48_4_ = uVar2;
                auVar102._52_4_ = uVar2;
                auVar102._56_4_ = uVar2;
                auVar102._60_4_ = uVar2;
                auVar306 = vmaxps_avx512f(auVar306,auVar102);
                uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar103._4_4_ = uVar2;
                auVar103._0_4_ = uVar2;
                auVar103._8_4_ = uVar2;
                auVar103._12_4_ = uVar2;
                auVar103._16_4_ = uVar2;
                auVar103._20_4_ = uVar2;
                auVar103._24_4_ = uVar2;
                auVar103._28_4_ = uVar2;
                auVar103._32_4_ = uVar2;
                auVar103._36_4_ = uVar2;
                auVar103._40_4_ = uVar2;
                auVar103._44_4_ = uVar2;
                auVar103._48_4_ = uVar2;
                auVar103._52_4_ = uVar2;
                auVar103._56_4_ = uVar2;
                auVar103._60_4_ = uVar2;
                auVar315 = vminps_avx512f(auVar306,auVar103);
                break;
              case 4:
                auVar306 = vxorps_avx512dq(auVar306,auVar338);
                auVar306 = vminps_avx512f(auVar306,(undefined1  [64])afVar129);
                auVar306 = vmaxps_avx512f(auVar306,(undefined1  [64])afVar130);
                auVar307 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar306,
                                               (undefined1  [64])afVar137);
                auVar308 = vrndscaleps_avx512f(auVar307,1);
                uVar183 = vcmpps_avx512f(auVar307,auVar308,1);
                auVar307 = vsubps_avx512f(auVar308,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar323._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar308._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar323._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar308._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar323._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar308._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar323._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar308._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar323._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar308._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar323._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar308._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar323._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar308._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar323._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar308._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar323._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar308._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar323._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar308._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar323._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar308._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar323._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar308._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar323._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar308._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar323._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar308._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar323._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar308._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar323._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar308._60_4_;
                auVar306 = vfmadd231ps_avx512f(auVar306,auVar323,auVar301);
                auVar306 = vfmadd231ps_avx512f(auVar306,auVar323,auVar302);
                auVar307 = vmulps_avx512f(auVar306,auVar306);
                auVar308 = vfmadd213ps_avx512f(auVar306,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar134);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar135);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar136);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar137);
                auVar306 = vfmadd213ps_avx512f(auVar308,auVar307,auVar306);
                auVar306 = vaddps_avx512f(auVar306,(undefined1  [64])afVar128);
                auVar307 = vcvttps2dq_avx512f(auVar323);
                auVar307 = vpaddd_avx512f(auVar307,auVar303);
                auVar307 = vpslld_avx512f(auVar307,0x17);
                auVar306 = vfmadd213ps_avx512f(auVar307,auVar306,auVar304);
                auVar307 = vrcp14ps_avx512f(auVar306);
                auVar306 = vfmsub213ps_avx512f(auVar306,auVar307,auVar304);
                auVar315 = vfnmadd132ps_avx512vl(auVar306,auVar307,auVar307);
                break;
              case 5:
                auVar307 = vminps_avx512f(auVar306,(undefined1  [64])afVar129);
                auVar307 = vmaxps_avx512f(auVar307,(undefined1  [64])afVar130);
                auVar308 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar307,
                                               (undefined1  [64])afVar137);
                auVar309 = vrndscaleps_avx512f(auVar308,1);
                uVar183 = vcmpps_avx512f(auVar308,auVar309,1);
                auVar308 = vsubps_avx512f(auVar309,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar317._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar317._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar317._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar317._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar317._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar317._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar317._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar317._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar317._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar317._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar317._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar317._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar317._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar317._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar317._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar317._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar317,auVar301);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar317,auVar302);
                auVar308 = vmulps_avx512f(auVar307,auVar307);
                auVar309 = vfmadd213ps_avx512f(auVar307,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar134);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar135);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar136);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar137);
                auVar307 = vfmadd213ps_avx512f(auVar309,auVar308,auVar307);
                auVar307 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                auVar308 = vcvttps2dq_avx512f(auVar317);
                auVar308 = vpaddd_avx512f(auVar308,auVar303);
                auVar308 = vpslld_avx512f(auVar308,0x17);
                auVar307 = vfmadd213ps_avx512f(auVar308,auVar307,auVar304);
                auVar308 = vmaxps_avx512f(auVar307,(undefined1  [64])_ps512_min_norm_pos);
                auVar309 = vpsrld_avx512f(auVar308,0x17);
                auVar308 = vpternlogd_avx512f(auVar308,(undefined1  [64])afVar137,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar183 = vcmpps_avx512f(auVar308,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar310 = vsubps_avx512f(auVar308,(undefined1  [64])afVar128);
                auVar308 = vaddps_avx512f(auVar310,auVar308);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar318._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar310._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar318._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar310._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar318._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar310._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar318._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar310._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar318._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar310._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar318._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar310._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar318._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar310._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar318._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar310._28_4_;
                bVar17 = (byte)(uVar183 >> 8);
                bVar16 = (bool)(bVar17 & 1);
                auVar318._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar310._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar318._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar310._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar318._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar310._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar318._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar310._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar318._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar310._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar318._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar310._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar318._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar310._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar318._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar310._60_4_;
                auVar308 = vmulps_avx512f(auVar318,auVar318);
                auVar310 = vfmadd132ps_avx512f(auVar318,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar318,
                                               (undefined1  [64])_ps512_cephes_log_p2);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar318,
                                               (undefined1  [64])_ps512_cephes_log_p3);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar318,(undefined1  [64])afVar138);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar318,(undefined1  [64])afVar139);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar318,(undefined1  [64])afVar140);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar318,(undefined1  [64])afVar141);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar318,(undefined1  [64])afVar142);
                auVar311 = vmulps_avx512f(auVar308,auVar318);
                auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar318);
                uVar184 = vcmpps_avx512f(auVar307,in_ZMM30,2);
                auVar307 = vpsubd_avx512f(auVar309,auVar303);
                auVar307 = vcvtdq2ps_avx512f(auVar307);
                auVar309 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar319._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar319._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar319._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar319._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar319._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar319._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar319._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar319._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)(bVar17 & 1);
                auVar319._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar319._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar319._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar319._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar319._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar319._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar319._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar319._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar310,auVar319,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar320,auVar308);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar319,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar307 = vmulps_avx512f(auVar307,auVar305);
                auVar308 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar16 = (bool)((byte)uVar184 & 1);
                auVar321._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar307._0_4_;
                bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                auVar321._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar307._4_4_;
                bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                auVar321._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar307._8_4_;
                bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                auVar321._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar307._12_4_;
                bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                auVar321._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar307._16_4_;
                bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                auVar321._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar307._20_4_;
                bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                auVar321._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar307._24_4_;
                bVar16 = (bool)((byte)(uVar184 >> 7) & 1);
                auVar321._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar307._28_4_;
                bVar16 = (bool)((byte)(uVar184 >> 8) & 1);
                auVar321._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar307._32_4_;
                bVar16 = (bool)((byte)(uVar184 >> 9) & 1);
                auVar321._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar307._36_4_;
                bVar16 = (bool)((byte)(uVar184 >> 10) & 1);
                auVar321._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar307._40_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xb) & 1);
                auVar321._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar307._44_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xc) & 1);
                auVar321._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar307._48_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xd) & 1);
                auVar321._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar307._52_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xe) & 1);
                auVar321._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar307._56_4_;
                bVar16 = SUB81(uVar184 >> 0xf,0);
                auVar321._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar307._60_4_;
                auVar307 = vminps_avx512f(auVar321,(undefined1  [64])afVar129);
                auVar307 = vmaxps_avx512f(auVar307,(undefined1  [64])afVar130);
                auVar308 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar307,
                                               (undefined1  [64])afVar137);
                auVar309 = vrndscaleps_avx512f(auVar308,1);
                uVar183 = vcmpps_avx512f(auVar308,auVar309,1);
                auVar308 = vsubps_avx512f(auVar309,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar322._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar322._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar322._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar322._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar322._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar322._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar322._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar322._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar322._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar322._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar322._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar322._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar322._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar322._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar322._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar322._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar322,auVar301);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar322,auVar302);
                auVar308 = vmulps_avx512f(auVar307,auVar307);
                auVar309 = vfmadd213ps_avx512f(auVar307,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar134);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar135);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar136);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar137);
                auVar307 = vfmadd213ps_avx512f(auVar309,auVar308,auVar307);
                auVar307 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                auVar308 = vcvttps2dq_avx512f(auVar322);
                auVar308 = vpaddd_avx512f(auVar308,auVar303);
                auVar308 = vpslld_avx512f(auVar308,0x17);
                auVar307 = vfmadd213ps_avx512f(auVar308,auVar307,auVar304);
                auVar308 = vrcp14ps_avx512f(auVar307);
                auVar307 = vfmsub213ps_avx512f(auVar307,auVar308,auVar304);
                auVar307 = vfnmadd132ps_avx512vl(auVar307,auVar308,auVar308);
                auVar307 = vfnmsub213ps_avx512f(auVar307,auVar305,auVar304);
                auVar315 = vmulps_avx512f(auVar307,auVar306);
                break;
              case 6:
                auVar307 = vbroadcastss_avx512f
                                     (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var164)));
                uVar177 = (*(uint **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar316._4_4_ = uVar177;
                auVar316._0_4_ = uVar177;
                auVar316._8_4_ = uVar177;
                auVar316._12_4_ = uVar177;
                auVar316._16_4_ = uVar177;
                auVar316._20_4_ = uVar177;
                auVar316._24_4_ = uVar177;
                auVar316._28_4_ = uVar177;
                auVar316._32_4_ = uVar177;
                auVar316._36_4_ = uVar177;
                auVar316._40_4_ = uVar177;
                auVar316._44_4_ = uVar177;
                auVar316._48_4_ = uVar177;
                auVar316._52_4_ = uVar177;
                auVar316._56_4_ = uVar177;
                auVar316._60_4_ = uVar177;
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar306,auVar316);
                auVar307 = vmaxps_avx512f(auVar307,in_ZMM30);
                auVar307 = vminps_avx512f(auVar307,auVar304);
                auVar315 = vmulps_avx512f(auVar307,auVar306);
              }
              *(undefined1 (*) [64])local_268 = auVar315;
              local_268 = local_268 + 8;
              iVar154 = iVar154 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      if ((iVar170 == 0x10) && (uVar159 == 8)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar174 = 0;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar174;
        }
        auVar268._8_4_ = 0x42b0c0a5;
        auVar268._0_8_ = 0x42b0c0a542b0c0a5;
        auVar268._12_4_ = 0x42b0c0a5;
        auVar268._16_4_ = 0x42b0c0a5;
        auVar268._20_4_ = 0x42b0c0a5;
        auVar268._24_4_ = 0x42b0c0a5;
        auVar268._28_4_ = 0x42b0c0a5;
        auVar269._8_4_ = 0xc2b0c0a5;
        auVar269._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar269._12_4_ = 0xc2b0c0a5;
        auVar269._16_4_ = 0xc2b0c0a5;
        auVar269._20_4_ = 0xc2b0c0a5;
        auVar269._24_4_ = 0xc2b0c0a5;
        auVar269._28_4_ = 0xc2b0c0a5;
        auVar270._8_4_ = 0x3f000000;
        auVar270._0_8_ = 0x3f0000003f000000;
        auVar270._12_4_ = 0x3f000000;
        auVar270._16_4_ = 0x3f000000;
        auVar270._20_4_ = 0x3f000000;
        auVar270._24_4_ = 0x3f000000;
        auVar270._28_4_ = 0x3f000000;
        auVar271._8_4_ = 0x3fb8aa3b;
        auVar271._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar271._12_4_ = 0x3fb8aa3b;
        auVar271._16_4_ = 0x3fb8aa3b;
        auVar271._20_4_ = 0x3fb8aa3b;
        auVar271._24_4_ = 0x3fb8aa3b;
        auVar271._28_4_ = 0x3fb8aa3b;
        auVar272._8_4_ = 0x3f800000;
        auVar272._0_8_ = 0x3f8000003f800000;
        auVar272._12_4_ = 0x3f800000;
        auVar272._16_4_ = 0x3f800000;
        auVar272._20_4_ = 0x3f800000;
        auVar272._24_4_ = 0x3f800000;
        auVar272._28_4_ = 0x3f800000;
        auVar273._8_4_ = 0x3f318000;
        auVar273._0_8_ = 0x3f3180003f318000;
        auVar273._12_4_ = 0x3f318000;
        auVar273._16_4_ = 0x3f318000;
        auVar273._20_4_ = 0x3f318000;
        auVar273._24_4_ = 0x3f318000;
        auVar273._28_4_ = 0x3f318000;
        auVar247 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar274._8_4_ = 0x3ab743ce;
        auVar274._0_8_ = 0x3ab743ce3ab743ce;
        auVar274._12_4_ = 0x3ab743ce;
        auVar274._16_4_ = 0x3ab743ce;
        auVar274._20_4_ = 0x3ab743ce;
        auVar274._24_4_ = 0x3ab743ce;
        auVar274._28_4_ = 0x3ab743ce;
        auVar275._8_4_ = 0x3c088908;
        auVar275._0_8_ = 0x3c0889083c088908;
        auVar275._12_4_ = 0x3c088908;
        auVar275._16_4_ = 0x3c088908;
        auVar275._20_4_ = 0x3c088908;
        auVar275._24_4_ = 0x3c088908;
        auVar275._28_4_ = 0x3c088908;
        auVar276._8_4_ = 0x3d2aa9c1;
        auVar276._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar276._12_4_ = 0x3d2aa9c1;
        auVar276._16_4_ = 0x3d2aa9c1;
        auVar276._20_4_ = 0x3d2aa9c1;
        auVar276._24_4_ = 0x3d2aa9c1;
        auVar276._28_4_ = 0x3d2aa9c1;
        auVar277._8_4_ = 0x3e2aaaaa;
        auVar277._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar277._12_4_ = 0x3e2aaaaa;
        auVar277._16_4_ = 0x3e2aaaaa;
        auVar277._20_4_ = 0x3e2aaaaa;
        auVar277._24_4_ = 0x3e2aaaaa;
        auVar277._28_4_ = 0x3e2aaaaa;
        auVar278._8_4_ = 0x3f800000;
        auVar278._0_8_ = 0x3f8000003f800000;
        auVar278._12_4_ = 0x3f800000;
        auVar278._16_4_ = 0x3f800000;
        auVar278._20_4_ = 0x3f800000;
        auVar278._24_4_ = 0x3f800000;
        auVar278._28_4_ = 0x3f800000;
        auVar279._8_4_ = 0xb95e8083;
        auVar279._0_8_ = 0xb95e8083b95e8083;
        auVar279._12_4_ = 0xb95e8083;
        auVar279._16_4_ = 0xb95e8083;
        auVar279._20_4_ = 0xb95e8083;
        auVar279._24_4_ = 0xb95e8083;
        auVar279._28_4_ = 0xb95e8083;
        auVar191 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar191);
        auVar248 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar174 != uVar188; uVar174 = uVar174 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar174 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar338 = ZEXT3264(*(undefined1 (*) [32])(lVar157 + uVar174 * 0x20));
              }
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar174 * (this->weight_data_tm).elemsize +
                        0x1e0;
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                lVar180 = lVar162;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    lVar127 = (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar183;
                    iVar147 = iVar146;
                    for (lVar171 = 0; uVar173 * 0x200 != lVar171; lVar171 = lVar171 + 0x200) {
                      if (((-1 < iVar147) && (iVar149 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar149 < iVar153)) {
                        lVar155 = (long)(iVar149 << 4);
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127);
                        auVar443._4_4_ = uVar340;
                        auVar443._0_4_ = uVar340;
                        auVar443._8_4_ = uVar340;
                        auVar443._12_4_ = uVar340;
                        auVar443._16_4_ = uVar340;
                        auVar443._20_4_ = uVar340;
                        auVar443._24_4_ = uVar340;
                        auVar443._28_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 4);
                        auVar441._4_4_ = uVar340;
                        auVar441._0_4_ = uVar340;
                        auVar441._8_4_ = uVar340;
                        auVar441._12_4_ = uVar340;
                        auVar441._16_4_ = uVar340;
                        auVar441._20_4_ = uVar340;
                        auVar441._24_4_ = uVar340;
                        auVar441._28_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 8);
                        auVar512._4_4_ = uVar340;
                        auVar512._0_4_ = uVar340;
                        auVar512._8_4_ = uVar340;
                        auVar512._12_4_ = uVar340;
                        auVar512._16_4_ = uVar340;
                        auVar512._20_4_ = uVar340;
                        auVar512._24_4_ = uVar340;
                        auVar512._28_4_ = uVar340;
                        auVar249 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar250 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x10)));
                        auVar251 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x14)));
                        auVar252 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x18)));
                        auVar253 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x1c)));
                        auVar254 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x20)));
                        auVar255 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x24)));
                        auVar256 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x28)));
                        auVar257 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x2c)));
                        auVar258 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x30)));
                        auVar259 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x34)));
                        auVar260 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x38)));
                        auVar261 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x3c)));
                        auVar192 = vfmadd231ps_fma(auVar338._0_32_,auVar443,
                                                   *(undefined1 (*) [32])
                                                    (lVar180 + -0x1e0 + lVar171));
                        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar441,
                                                   *(undefined1 (*) [32])
                                                    (lVar180 + -0x1c0 + lVar171));
                        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar512,
                                                   *(undefined1 (*) [32])
                                                    (lVar180 + -0x1a0 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (ZEXT1632(auVar192),auVar249,
                                              *(undefined1 (*) [32])(lVar180 + -0x180 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar250,
                                              *(undefined1 (*) [32])(lVar180 + -0x160 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar251,
                                              *(undefined1 (*) [32])(lVar180 + -0x140 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar252,
                                              *(undefined1 (*) [32])(lVar180 + -0x120 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar253,
                                              *(undefined1 (*) [32])(lVar180 + -0x100 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar254,
                                              *(undefined1 (*) [32])(lVar180 + -0xe0 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar255,
                                              *(undefined1 (*) [32])(lVar180 + -0xc0 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar256,
                                              *(undefined1 (*) [32])(lVar180 + -0xa0 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar257,
                                              *(undefined1 (*) [32])(lVar180 + -0x80 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar258,
                                              *(undefined1 (*) [32])(lVar180 + -0x60 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar259,
                                              *(undefined1 (*) [32])(lVar180 + -0x40 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar260,
                                              *(undefined1 (*) [32])(lVar180 + -0x20 + lVar171));
                        auVar249 = vfmadd231ps_avx512vl
                                             (auVar249,auVar261,
                                              *(undefined1 (*) [32])(lVar180 + lVar171));
                        auVar338 = ZEXT3264(auVar249);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x200;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x80) * 4;
              }
              auVar250 = auVar338._0_32_;
              auVar249 = auVar250;
              if (iVar152 - 1U < 6) {
                auVar249 = vmaxps_avx512vl(auVar250,ZEXT1632(auVar191));
                switch(iVar152) {
                case 2:
                  auVar250 = vminps_avx512vl(auVar250,ZEXT1632(auVar191));
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar71._4_4_ = uVar340;
                  auVar71._0_4_ = uVar340;
                  auVar71._8_4_ = uVar340;
                  auVar71._12_4_ = uVar340;
                  auVar71._16_4_ = uVar340;
                  auVar71._20_4_ = uVar340;
                  auVar71._24_4_ = uVar340;
                  auVar71._28_4_ = uVar340;
                  auVar249 = vfmadd231ps_avx512vl(auVar249,auVar250,auVar71);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar69._4_4_ = uVar340;
                  auVar69._0_4_ = uVar340;
                  auVar69._8_4_ = uVar340;
                  auVar69._12_4_ = uVar340;
                  auVar69._16_4_ = uVar340;
                  auVar69._20_4_ = uVar340;
                  auVar69._24_4_ = uVar340;
                  auVar69._28_4_ = uVar340;
                  auVar249 = vmaxps_avx512vl(auVar250,auVar69);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar70._4_4_ = uVar340;
                  auVar70._0_4_ = uVar340;
                  auVar70._8_4_ = uVar340;
                  auVar70._12_4_ = uVar340;
                  auVar70._16_4_ = uVar340;
                  auVar70._20_4_ = uVar340;
                  auVar70._24_4_ = uVar340;
                  auVar70._28_4_ = uVar340;
                  auVar249 = vminps_avx512vl(auVar249,auVar70);
                  break;
                case 4:
                  auVar67._8_4_ = 0x80000000;
                  auVar67._0_8_ = 0x8000000080000000;
                  auVar67._12_4_ = 0x80000000;
                  auVar67._16_4_ = 0x80000000;
                  auVar67._20_4_ = 0x80000000;
                  auVar67._24_4_ = 0x80000000;
                  auVar67._28_4_ = 0x80000000;
                  auVar249 = vxorps_avx512vl(auVar250,auVar67);
                  auVar249 = vminps_avx(auVar249,auVar268);
                  auVar249 = vmaxps_avx(auVar249,auVar269);
                  auVar192 = vfmadd231ps_fma(auVar270,auVar249,auVar271);
                  auVar250 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar250,1);
                  auVar251 = vsubps_avx512vl(auVar250,auVar272);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar267._0_4_ =
                       (float)((uint)bVar16 * auVar251._0_4_ | (uint)!bVar16 * auVar250._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar267._4_4_ =
                       (float)((uint)bVar16 * auVar251._4_4_ | (uint)!bVar16 * auVar250._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar267._8_4_ =
                       (float)((uint)bVar16 * auVar251._8_4_ | (uint)!bVar16 * auVar250._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar267._12_4_ =
                       (float)((uint)bVar16 * auVar251._12_4_ | (uint)!bVar16 * auVar250._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar267._16_4_ =
                       (float)((uint)bVar16 * auVar251._16_4_ | (uint)!bVar16 * auVar250._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar267._20_4_ =
                       (float)((uint)bVar16 * auVar251._20_4_ | (uint)!bVar16 * auVar250._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar267._24_4_ =
                       (float)((uint)bVar16 * auVar251._24_4_ | (uint)!bVar16 * auVar250._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar267._28_4_ =
                       (float)((uint)bVar16 * auVar251._28_4_ | (uint)!bVar16 * auVar250._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar249,auVar267,auVar273);
                  auVar68._8_4_ = 0x395e8083;
                  auVar68._0_8_ = 0x395e8083395e8083;
                  auVar68._12_4_ = 0x395e8083;
                  auVar68._16_4_ = 0x395e8083;
                  auVar68._20_4_ = 0x395e8083;
                  auVar68._24_4_ = 0x395e8083;
                  auVar68._28_4_ = 0x395e8083;
                  auVar249 = vfmsub231ps_avx512vl(ZEXT1632(auVar192),auVar267,auVar68);
                  auVar412._0_4_ = auVar249._0_4_ * auVar249._0_4_;
                  auVar412._4_4_ = auVar249._4_4_ * auVar249._4_4_;
                  auVar412._8_4_ = auVar249._8_4_ * auVar249._8_4_;
                  auVar412._12_4_ = auVar249._12_4_ * auVar249._12_4_;
                  auVar412._16_4_ = auVar249._16_4_ * auVar249._16_4_;
                  auVar412._20_4_ = auVar249._20_4_ * auVar249._20_4_;
                  auVar412._24_4_ = auVar249._24_4_ * auVar249._24_4_;
                  auVar412._28_4_ = 0;
                  auVar192 = vfmadd213ps_fma(auVar247,auVar249,auVar274);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar249,auVar275);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar249,auVar276);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar249,auVar277);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar249,auVar270);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar412,auVar249);
                  auVar345._0_4_ = auVar192._0_4_ + 1.0;
                  auVar345._4_4_ = auVar192._4_4_ + 1.0;
                  auVar345._8_4_ = auVar192._8_4_ + 1.0;
                  auVar345._12_4_ = auVar192._12_4_ + 1.0;
                  auVar345._16_4_ = 0x3f800000;
                  auVar345._20_4_ = 0x3f800000;
                  auVar345._24_4_ = 0x3f800000;
                  auVar345._28_4_ = 0x3f800000;
                  auVar413._0_4_ = (int)auVar267._0_4_;
                  auVar413._4_4_ = (int)auVar267._4_4_;
                  auVar413._8_4_ = (int)auVar267._8_4_;
                  auVar413._12_4_ = (int)auVar267._12_4_;
                  auVar413._16_4_ = (int)auVar267._16_4_;
                  auVar413._20_4_ = (int)auVar267._20_4_;
                  auVar413._24_4_ = (int)auVar267._24_4_;
                  auVar413._28_4_ = (int)auVar267._28_4_;
                  auVar249 = vpslld_avx2(auVar413,0x17);
                  auVar249 = vpaddd_avx2(auVar278,auVar249);
                  auVar192 = vfmadd213ps_fma(auVar249,auVar345,auVar272);
                  auVar249 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar249,auVar272);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar249,auVar249);
                  auVar249 = ZEXT1632(auVar192);
                  break;
                case 5:
                  auVar249 = vminps_avx(auVar250,auVar268);
                  auVar249 = vmaxps_avx(auVar249,auVar269);
                  auVar192 = vfmadd213ps_fma(auVar271,auVar249,auVar270);
                  auVar250 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar250,1);
                  auVar251 = vsubps_avx512vl(auVar250,auVar272);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar262._0_4_ =
                       (float)((uint)bVar16 * auVar251._0_4_ | (uint)!bVar16 * auVar250._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar262._4_4_ =
                       (float)((uint)bVar16 * auVar251._4_4_ | (uint)!bVar16 * auVar250._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar262._8_4_ =
                       (float)((uint)bVar16 * auVar251._8_4_ | (uint)!bVar16 * auVar250._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar262._12_4_ =
                       (float)((uint)bVar16 * auVar251._12_4_ | (uint)!bVar16 * auVar250._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar262._16_4_ =
                       (float)((uint)bVar16 * auVar251._16_4_ | (uint)!bVar16 * auVar250._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar262._20_4_ =
                       (float)((uint)bVar16 * auVar251._20_4_ | (uint)!bVar16 * auVar250._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar262._24_4_ =
                       (float)((uint)bVar16 * auVar251._24_4_ | (uint)!bVar16 * auVar250._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar262._28_4_ =
                       (float)((uint)bVar16 * auVar251._28_4_ | (uint)!bVar16 * auVar250._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar249,auVar262,auVar273);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar262,auVar279);
                  auVar250 = ZEXT1632(auVar192);
                  auVar249 = vfmadd213ps_avx512vl(auVar247,auVar250,auVar274);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar275);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar276);
                  auVar250 = ZEXT1632(auVar192);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar277);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar270);
                  auVar249 = vfmadd213ps_avx512vl
                                       (auVar249,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar250
                                       );
                  auVar250 = vaddps_avx512vl(auVar249,auVar272);
                  auVar442._0_4_ = (int)auVar262._0_4_;
                  auVar442._4_4_ = (int)auVar262._4_4_;
                  auVar442._8_4_ = (int)auVar262._8_4_;
                  auVar442._12_4_ = (int)auVar262._12_4_;
                  auVar442._16_4_ = (int)auVar262._16_4_;
                  auVar442._20_4_ = (int)auVar262._20_4_;
                  auVar442._24_4_ = (int)auVar262._24_4_;
                  auVar442._28_4_ = (int)auVar262._28_4_;
                  auVar249 = vpslld_avx2(auVar442,0x17);
                  auVar249 = vpaddd_avx2(auVar249,auVar278);
                  auVar192 = vfmadd213ps_fma(auVar249,auVar250,auVar272);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),ZEXT1632(auVar191),2);
                  auVar250._8_4_ = 0x800000;
                  auVar250._0_8_ = 0x80000000800000;
                  auVar250._12_4_ = 0x800000;
                  auVar250._16_4_ = 0x800000;
                  auVar250._20_4_ = 0x800000;
                  auVar250._24_4_ = 0x800000;
                  auVar250._28_4_ = 0x800000;
                  auVar249 = vmaxps_avx512vl(ZEXT1632(auVar192),auVar250);
                  auVar443 = vpsrld_avx2(auVar249,0x17);
                  auVar513._8_4_ = 0x807fffff;
                  auVar513._0_8_ = 0x807fffff807fffff;
                  auVar513._12_4_ = 0x807fffff;
                  auVar513._16_4_ = 0x807fffff;
                  auVar513._20_4_ = 0x807fffff;
                  auVar513._24_4_ = 0x807fffff;
                  auVar513._28_4_ = 0x807fffff;
                  auVar253._8_4_ = 0x3f000000;
                  auVar253._0_8_ = 0x3f0000003f000000;
                  auVar253._12_4_ = 0x3f000000;
                  auVar253._16_4_ = 0x3f000000;
                  auVar253._20_4_ = 0x3f000000;
                  auVar253._24_4_ = 0x3f000000;
                  auVar253._28_4_ = 0x3f000000;
                  auVar249 = vpternlogd_avx512vl(auVar249,auVar513,auVar253,0xea);
                  auVar254._8_4_ = 0x3f3504f3;
                  auVar254._0_8_ = 0x3f3504f33f3504f3;
                  auVar254._12_4_ = 0x3f3504f3;
                  auVar254._16_4_ = 0x3f3504f3;
                  auVar254._20_4_ = 0x3f3504f3;
                  auVar254._24_4_ = 0x3f3504f3;
                  auVar254._28_4_ = 0x3f3504f3;
                  uVar184 = vcmpps_avx512vl(auVar249,auVar254,1);
                  auVar251 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                  auVar250 = vaddps_avx512vl(auVar249,auVar251);
                  auVar252 = vaddps_avx512vl(auVar250,auVar249);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar263._0_4_ =
                       (float)((uint)bVar16 * auVar252._0_4_ | (uint)!bVar16 * auVar250._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar263._4_4_ =
                       (float)((uint)bVar16 * auVar252._4_4_ | (uint)!bVar16 * auVar250._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar263._8_4_ =
                       (float)((uint)bVar16 * auVar252._8_4_ | (uint)!bVar16 * auVar250._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar263._12_4_ =
                       (float)((uint)bVar16 * auVar252._12_4_ | (uint)!bVar16 * auVar250._12_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar263._16_4_ =
                       (float)((uint)bVar16 * auVar252._16_4_ | (uint)!bVar16 * auVar250._16_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar263._20_4_ =
                       (float)((uint)bVar16 * auVar252._20_4_ | (uint)!bVar16 * auVar250._20_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar263._24_4_ =
                       (float)((uint)bVar16 * auVar252._24_4_ | (uint)!bVar16 * auVar250._24_4_);
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar263._28_4_ = (uint)bVar16 * auVar252._28_4_ | (uint)!bVar16 * auVar250._28_4_
                  ;
                  auVar113._4_4_ = auVar263._4_4_ * auVar263._4_4_;
                  auVar113._0_4_ = auVar263._0_4_ * auVar263._0_4_;
                  auVar113._8_4_ = auVar263._8_4_ * auVar263._8_4_;
                  auVar113._12_4_ = auVar263._12_4_ * auVar263._12_4_;
                  auVar113._16_4_ = auVar263._16_4_ * auVar263._16_4_;
                  auVar113._20_4_ = auVar263._20_4_ * auVar263._20_4_;
                  auVar113._24_4_ = auVar263._24_4_ * auVar263._24_4_;
                  auVar113._28_4_ = auVar249._28_4_;
                  auVar249 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar255._8_4_ = 0xbdebd1b8;
                  auVar255._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar255._12_4_ = 0xbdebd1b8;
                  auVar255._16_4_ = 0xbdebd1b8;
                  auVar255._20_4_ = 0xbdebd1b8;
                  auVar255._24_4_ = 0xbdebd1b8;
                  auVar255._28_4_ = 0xbdebd1b8;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar255);
                  auVar256._8_4_ = 0x3def251a;
                  auVar256._0_8_ = 0x3def251a3def251a;
                  auVar256._12_4_ = 0x3def251a;
                  auVar256._16_4_ = 0x3def251a;
                  auVar256._20_4_ = 0x3def251a;
                  auVar256._24_4_ = 0x3def251a;
                  auVar256._28_4_ = 0x3def251a;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar256);
                  auVar257._8_4_ = 0xbdfe5d4f;
                  auVar257._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar257._12_4_ = 0xbdfe5d4f;
                  auVar257._16_4_ = 0xbdfe5d4f;
                  auVar257._20_4_ = 0xbdfe5d4f;
                  auVar257._24_4_ = 0xbdfe5d4f;
                  auVar257._28_4_ = 0xbdfe5d4f;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar257);
                  auVar258._8_4_ = 0x3e11e9bf;
                  auVar258._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar258._12_4_ = 0x3e11e9bf;
                  auVar258._16_4_ = 0x3e11e9bf;
                  auVar258._20_4_ = 0x3e11e9bf;
                  auVar258._24_4_ = 0x3e11e9bf;
                  auVar258._28_4_ = 0x3e11e9bf;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar258);
                  auVar259._8_4_ = 0xbe2aae50;
                  auVar259._0_8_ = 0xbe2aae50be2aae50;
                  auVar259._12_4_ = 0xbe2aae50;
                  auVar259._16_4_ = 0xbe2aae50;
                  auVar259._20_4_ = 0xbe2aae50;
                  auVar259._24_4_ = 0xbe2aae50;
                  auVar259._28_4_ = 0xbe2aae50;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar259);
                  auVar260._8_4_ = 0x3e4cceac;
                  auVar260._0_8_ = 0x3e4cceac3e4cceac;
                  auVar260._12_4_ = 0x3e4cceac;
                  auVar260._16_4_ = 0x3e4cceac;
                  auVar260._20_4_ = 0x3e4cceac;
                  auVar260._24_4_ = 0x3e4cceac;
                  auVar260._28_4_ = 0x3e4cceac;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar260);
                  auVar261._8_4_ = 0xbe7ffffc;
                  auVar261._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar261._12_4_ = 0xbe7ffffc;
                  auVar261._16_4_ = 0xbe7ffffc;
                  auVar261._20_4_ = 0xbe7ffffc;
                  auVar261._24_4_ = 0xbe7ffffc;
                  auVar261._28_4_ = 0xbe7ffffc;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar261);
                  auVar65._8_4_ = 0x3eaaaaaa;
                  auVar65._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar65._12_4_ = 0x3eaaaaaa;
                  auVar65._16_4_ = 0x3eaaaaaa;
                  auVar65._20_4_ = 0x3eaaaaaa;
                  auVar65._24_4_ = 0x3eaaaaaa;
                  auVar65._28_4_ = 0x3eaaaaaa;
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar65);
                  auVar250 = vmulps_avx512vl(auVar113,auVar263);
                  auVar250 = vmulps_avx512vl(auVar250,auVar249);
                  auVar66._8_4_ = 0xffffff82;
                  auVar66._0_8_ = 0xffffff82ffffff82;
                  auVar66._12_4_ = 0xffffff82;
                  auVar66._16_4_ = 0xffffff82;
                  auVar66._20_4_ = 0xffffff82;
                  auVar66._24_4_ = 0xffffff82;
                  auVar66._28_4_ = 0xffffff82;
                  auVar249 = vpaddd_avx512vl(auVar443,auVar66);
                  auVar249 = vcvtdq2ps_avx(auVar249);
                  auVar252 = vsubps_avx512vl(auVar249,auVar272);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar264._0_4_ = (uint)bVar16 * auVar252._0_4_ | (uint)!bVar16 * auVar249._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar264._4_4_ = (uint)bVar16 * auVar252._4_4_ | (uint)!bVar16 * auVar249._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar264._8_4_ = (uint)bVar16 * auVar252._8_4_ | (uint)!bVar16 * auVar249._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar264._12_4_ = (uint)bVar16 * auVar252._12_4_ | (uint)!bVar16 * auVar249._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar264._16_4_ = (uint)bVar16 * auVar252._16_4_ | (uint)!bVar16 * auVar249._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar264._20_4_ = (uint)bVar16 * auVar252._20_4_ | (uint)!bVar16 * auVar249._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar264._24_4_ = (uint)bVar16 * auVar252._24_4_ | (uint)!bVar16 * auVar249._24_4_
                  ;
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar264._28_4_ = (uint)bVar16 * auVar252._28_4_ | (uint)!bVar16 * auVar249._28_4_
                  ;
                  auVar249 = vfmadd231ps_avx512vl(auVar250,auVar264,auVar279);
                  auVar249 = vfmsub231ps_avx512vl(auVar249,auVar270,auVar113);
                  auVar249 = vsubps_avx512vl(auVar249,auVar263);
                  auVar192 = vfmsub231ps_fma(auVar249,auVar273,auVar264);
                  auVar249 = vmulps_avx512vl(ZEXT1632(auVar192),auVar248);
                  auVar250 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar265._0_4_ = (uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar265._4_4_ = (uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar265._8_4_ = (uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar265._12_4_ = (uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar265._16_4_ = (uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar265._20_4_ = (uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar265._24_4_ = (uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_
                  ;
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar265._28_4_ = (uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_
                  ;
                  auVar249 = vminps_avx(auVar265,auVar268);
                  auVar249 = vmaxps_avx(auVar249,auVar269);
                  auVar192 = vfmadd213ps_fma(auVar271,auVar249,auVar270);
                  auVar250 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar250,1);
                  auVar252 = vsubps_avx512vl(auVar250,auVar272);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar266._0_4_ =
                       (float)((uint)bVar16 * auVar252._0_4_ | (uint)!bVar16 * auVar250._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar266._4_4_ =
                       (float)((uint)bVar16 * auVar252._4_4_ | (uint)!bVar16 * auVar250._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar266._8_4_ =
                       (float)((uint)bVar16 * auVar252._8_4_ | (uint)!bVar16 * auVar250._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar266._12_4_ =
                       (float)((uint)bVar16 * auVar252._12_4_ | (uint)!bVar16 * auVar250._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar266._16_4_ =
                       (float)((uint)bVar16 * auVar252._16_4_ | (uint)!bVar16 * auVar250._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar266._20_4_ =
                       (float)((uint)bVar16 * auVar252._20_4_ | (uint)!bVar16 * auVar250._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar266._24_4_ =
                       (float)((uint)bVar16 * auVar252._24_4_ | (uint)!bVar16 * auVar250._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar266._28_4_ =
                       (float)((uint)bVar16 * auVar252._28_4_ | (uint)!bVar16 * auVar250._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar249,auVar266,auVar273);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar266,auVar279);
                  auVar250 = ZEXT1632(auVar192);
                  auVar249 = vfmadd213ps_avx512vl(auVar247,auVar250,auVar274);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar275);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar276);
                  auVar250 = ZEXT1632(auVar192);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar277);
                  auVar249 = vfmadd213ps_avx512vl(auVar249,auVar250,auVar270);
                  auVar249 = vfmadd213ps_avx512vl
                                       (auVar249,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar250
                                       );
                  auVar250 = vaddps_avx512vl(auVar249,auVar272);
                  auVar444._0_4_ = (int)auVar266._0_4_;
                  auVar444._4_4_ = (int)auVar266._4_4_;
                  auVar444._8_4_ = (int)auVar266._8_4_;
                  auVar444._12_4_ = (int)auVar266._12_4_;
                  auVar444._16_4_ = (int)auVar266._16_4_;
                  auVar444._20_4_ = (int)auVar266._20_4_;
                  auVar444._24_4_ = (int)auVar266._24_4_;
                  auVar444._28_4_ = (int)auVar266._28_4_;
                  auVar249 = vpslld_avx2(auVar444,0x17);
                  auVar249 = vpaddd_avx2(auVar249,auVar278);
                  auVar192 = vfmadd213ps_fma(auVar249,auVar250,auVar272);
                  auVar250 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar250,auVar272);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar250,auVar250);
                  auVar251 = vfnmadd213ps_avx512vl(ZEXT1632(auVar192),auVar248,auVar251);
                  auVar249._4_4_ = auVar251._4_4_ * auVar338._4_4_;
                  auVar249._0_4_ = auVar251._0_4_ * auVar338._0_4_;
                  auVar249._8_4_ = auVar251._8_4_ * auVar338._8_4_;
                  auVar249._12_4_ = auVar251._12_4_ * auVar338._12_4_;
                  auVar249._16_4_ = auVar251._16_4_ * auVar338._16_4_;
                  auVar249._20_4_ = auVar251._20_4_ * auVar338._20_4_;
                  auVar249._24_4_ = auVar251._24_4_ * auVar338._24_4_;
                  auVar249._28_4_ = auVar250._28_4_;
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar252._4_4_ = uVar340;
                  auVar252._0_4_ = uVar340;
                  auVar252._8_4_ = uVar340;
                  auVar252._12_4_ = uVar340;
                  auVar252._16_4_ = uVar340;
                  auVar252._20_4_ = uVar340;
                  auVar252._24_4_ = uVar340;
                  auVar252._28_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar251._4_4_ = uVar340;
                  auVar251._0_4_ = uVar340;
                  auVar251._8_4_ = uVar340;
                  auVar251._12_4_ = uVar340;
                  auVar251._16_4_ = uVar340;
                  auVar251._20_4_ = uVar340;
                  auVar251._24_4_ = uVar340;
                  auVar251._28_4_ = uVar340;
                  auVar249 = vfmadd213ps_avx512vl(auVar252,auVar250,auVar251);
                  auVar249 = vmaxps_avx512vl(auVar249,ZEXT1632(auVar191));
                  auVar250 = vminps_avx(auVar249,auVar272);
                  auVar249._4_4_ = auVar250._4_4_ * auVar338._4_4_;
                  auVar249._0_4_ = auVar250._0_4_ * auVar338._0_4_;
                  auVar249._8_4_ = auVar250._8_4_ * auVar338._8_4_;
                  auVar249._12_4_ = auVar250._12_4_ * auVar338._12_4_;
                  auVar249._16_4_ = auVar250._16_4_ * auVar338._16_4_;
                  auVar249._20_4_ = auVar250._20_4_ * auVar338._20_4_;
                  auVar249._24_4_ = auVar250._24_4_ * auVar338._24_4_;
                  auVar249._28_4_ = auVar250._28_4_;
                }
              }
              *(undefined1 (*) [32])local_268 = auVar249;
              local_268 = local_268 + 4;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      afVar144 = _ps512_cephes_log_p8;
      afVar143 = _ps512_cephes_log_p7;
      afVar142 = _ps512_cephes_log_p6;
      afVar141 = _ps512_cephes_log_p5;
      afVar140 = _ps512_cephes_log_p4;
      afVar139 = _ps512_cephes_log_p3;
      afVar138 = _ps512_cephes_log_p2;
      afVar137 = _ps512_cephes_exp_p5;
      afVar136 = _ps512_cephes_exp_p4;
      afVar135 = _ps512_cephes_exp_p3;
      afVar134 = _ps512_cephes_exp_p2;
      afVar133 = _ps512_cephes_exp_p1;
      afVar132 = _ps512_cephes_exp_p0;
      afVar131 = _ps512_cephes_LOG2EF;
      afVar130 = _ps512_exp_lo;
      afVar129 = _ps512_exp_hi;
      afVar128 = _ps512_1;
      if ((iVar170 == 4) && (uVar159 == 0x10)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        uVar340 = *(undefined4 *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        auVar338 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar301 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q2);
        auVar302 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q1);
        auVar303 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
        auVar320 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar338);
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar174 = 0;
        if (0 < (int)uVar165) {
          uVar174 = (ulong)uVar165;
        }
        uVar169 = local_1e8.c;
        if (local_1e8.c < 1) {
          uVar169 = 0;
        }
        uVar158 = 0;
        auVar304 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar191 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar191);
        auVar305 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (; uVar158 != uVar169; uVar158 = uVar158 + 1) {
          local_2a8 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar158 * local_1e8.elemsize);
          iVar152 = bottom_blob->w;
          iVar153 = bottom_blob->h;
          uVar186 = 0;
          uVar188 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar188 = uVar186;
          }
          uVar160 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar160 = 0;
          }
          uVar167 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar167 = 0;
          }
          local_158._0_4_ = uVar167;
          while (uVar148 = (uint)uVar186, uVar148 != uVar167) {
            iVar154 = (1 - uVar161) * iVar168;
            for (uVar177 = 0; uVar177 != uVar160; uVar177 = uVar177 + 1) {
              if (lVar157 == 0) {
                auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar306 = *(undefined1 (*) [64])(lVar157 + uVar158 * 0x40);
              }
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar158 * (this->weight_data_tm).elemsize +
                        0xc0;
              for (uVar186 = 0; uVar186 != uVar188; uVar186 = uVar186 + 1) {
                lVar180 = lVar162;
                for (uVar183 = 0; uVar183 != uVar174; uVar183 = uVar183 + 1) {
                  iVar146 = (((int)uVar183 - uVar165) + 1) * iVar166 + uVar148;
                  if (((-1 < iVar146) && (iVar147 = iVar146 / iVar163, iVar146 % iVar163 == 0)) &&
                     (iVar147 < iVar153)) {
                    lVar127 = (long)iVar147 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar186;
                    iVar146 = iVar154;
                    for (lVar171 = 0; uVar173 * 0x100 != lVar171; lVar171 = lVar171 + 0x100) {
                      if (((-1 < iVar146) && (iVar147 = iVar146 / iVar182, iVar146 % iVar182 == 0))
                         && (iVar147 < iVar152)) {
                        lVar155 = (long)(iVar147 << 2);
                        auVar307 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127)));
                        auVar308 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 4)));
                        auVar309 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 8)));
                        auVar310 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar307,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0xc0 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar308,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x80 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar309,
                                                       *(undefined1 (*) [64])
                                                        (lVar180 + -0x40 + lVar171));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar310,
                                                       *(undefined1 (*) [64])(lVar180 + lVar171));
                      }
                      iVar146 = iVar146 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x100;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x40) * 4;
              }
              auVar330 = auVar306;
              switch(uVar340) {
              case 1:
                auVar330 = vmaxps_avx512f(auVar306,in_ZMM30);
                break;
              case 2:
                uVar186 = vcmpps_avx512f(auVar306,in_ZMM30,1);
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar108._4_4_ = uVar2;
                auVar108._0_4_ = uVar2;
                auVar108._8_4_ = uVar2;
                auVar108._12_4_ = uVar2;
                auVar108._16_4_ = uVar2;
                auVar108._20_4_ = uVar2;
                auVar108._24_4_ = uVar2;
                auVar108._28_4_ = uVar2;
                auVar108._32_4_ = uVar2;
                auVar108._36_4_ = uVar2;
                auVar108._40_4_ = uVar2;
                auVar108._44_4_ = uVar2;
                auVar108._48_4_ = uVar2;
                auVar108._52_4_ = uVar2;
                auVar108._56_4_ = uVar2;
                auVar108._60_4_ = uVar2;
                auVar307 = vmulps_avx512f(auVar306,auVar108);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar330._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar306._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar330._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar306._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar330._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar306._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar330._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar306._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar330._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar306._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar330._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar306._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar330._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar306._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar330._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar306._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar330._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar306._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar330._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar306._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar330._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar306._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar330._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar306._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar330._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar306._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar330._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar306._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar330._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar306._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar330._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar306._60_4_;
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar106._4_4_ = uVar2;
                auVar106._0_4_ = uVar2;
                auVar106._8_4_ = uVar2;
                auVar106._12_4_ = uVar2;
                auVar106._16_4_ = uVar2;
                auVar106._20_4_ = uVar2;
                auVar106._24_4_ = uVar2;
                auVar106._28_4_ = uVar2;
                auVar106._32_4_ = uVar2;
                auVar106._36_4_ = uVar2;
                auVar106._40_4_ = uVar2;
                auVar106._44_4_ = uVar2;
                auVar106._48_4_ = uVar2;
                auVar106._52_4_ = uVar2;
                auVar106._56_4_ = uVar2;
                auVar106._60_4_ = uVar2;
                auVar306 = vmaxps_avx512f(auVar306,auVar106);
                uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar107._4_4_ = uVar2;
                auVar107._0_4_ = uVar2;
                auVar107._8_4_ = uVar2;
                auVar107._12_4_ = uVar2;
                auVar107._16_4_ = uVar2;
                auVar107._20_4_ = uVar2;
                auVar107._24_4_ = uVar2;
                auVar107._28_4_ = uVar2;
                auVar107._32_4_ = uVar2;
                auVar107._36_4_ = uVar2;
                auVar107._40_4_ = uVar2;
                auVar107._44_4_ = uVar2;
                auVar107._48_4_ = uVar2;
                auVar107._52_4_ = uVar2;
                auVar107._56_4_ = uVar2;
                auVar107._60_4_ = uVar2;
                auVar330 = vminps_avx512f(auVar306,auVar107);
                break;
              case 4:
                auVar306 = vxorps_avx512dq(auVar306,auVar338);
                auVar306 = vminps_avx512f(auVar306,(undefined1  [64])afVar129);
                auVar306 = vmaxps_avx512f(auVar306,(undefined1  [64])afVar130);
                auVar307 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar306,
                                               (undefined1  [64])afVar137);
                auVar308 = vrndscaleps_avx512f(auVar307,1);
                uVar186 = vcmpps_avx512f(auVar307,auVar308,1);
                auVar307 = vsubps_avx512f(auVar308,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar329._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar308._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar329._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar308._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar329._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar308._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar329._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar308._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar329._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar308._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar329._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar308._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar329._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar308._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar329._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar308._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar329._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar308._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar329._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar308._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar329._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar308._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar329._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar308._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar329._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar308._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar329._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar308._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar329._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar308._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar329._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar308._60_4_;
                auVar306 = vfmadd231ps_avx512f(auVar306,auVar329,auVar301);
                auVar306 = vfmadd231ps_avx512f(auVar306,auVar329,auVar302);
                auVar307 = vmulps_avx512f(auVar306,auVar306);
                auVar308 = vfmadd213ps_avx512f(auVar306,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar134);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar135);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar136);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar137);
                auVar306 = vfmadd213ps_avx512f(auVar308,auVar307,auVar306);
                auVar306 = vaddps_avx512f(auVar306,(undefined1  [64])afVar128);
                auVar307 = vcvttps2dq_avx512f(auVar329);
                auVar307 = vpaddd_avx512f(auVar307,auVar303);
                auVar307 = vpslld_avx512f(auVar307,0x17);
                auVar306 = vfmadd213ps_avx512f(auVar307,auVar306,auVar304);
                auVar307 = vrcp14ps_avx512f(auVar306);
                auVar306 = vfmsub213ps_avx512f(auVar306,auVar307,auVar304);
                auVar330 = vfnmadd132ps_avx512vl(auVar306,auVar307,auVar307);
                break;
              case 5:
                auVar307 = vminps_avx512f(auVar306,(undefined1  [64])afVar129);
                auVar307 = vmaxps_avx512f(auVar307,(undefined1  [64])afVar130);
                auVar308 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar307,
                                               (undefined1  [64])afVar137);
                auVar309 = vrndscaleps_avx512f(auVar308,1);
                uVar186 = vcmpps_avx512f(auVar308,auVar309,1);
                auVar308 = vsubps_avx512f(auVar309,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar324._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar324._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar324._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar324._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar324._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar324._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar324._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar324._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar324._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar324._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar324._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar324._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar324._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar324._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar324._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar324._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar324,auVar301);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar324,auVar302);
                auVar308 = vmulps_avx512f(auVar307,auVar307);
                auVar309 = vfmadd213ps_avx512f(auVar307,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar134);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar135);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar136);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar137);
                auVar307 = vfmadd213ps_avx512f(auVar309,auVar308,auVar307);
                auVar307 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                auVar308 = vcvttps2dq_avx512f(auVar324);
                auVar308 = vpaddd_avx512f(auVar308,auVar303);
                auVar308 = vpslld_avx512f(auVar308,0x17);
                auVar307 = vfmadd213ps_avx512f(auVar308,auVar307,auVar304);
                auVar308 = vmaxps_avx512f(auVar307,(undefined1  [64])_ps512_min_norm_pos);
                auVar309 = vpsrld_avx512f(auVar308,0x17);
                auVar308 = vpternlogd_avx512f(auVar308,(undefined1  [64])afVar137,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar186 = vcmpps_avx512f(auVar308,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar310 = vsubps_avx512f(auVar308,(undefined1  [64])afVar128);
                auVar308 = vaddps_avx512f(auVar310,auVar308);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar325._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar310._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar325._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar310._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar325._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar310._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar325._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar310._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar325._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar310._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar325._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar310._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar325._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar310._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar325._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar310._28_4_;
                bVar17 = (byte)(uVar186 >> 8);
                bVar16 = (bool)(bVar17 & 1);
                auVar325._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar310._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar325._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar310._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar325._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar310._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar325._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar310._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar325._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar310._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar325._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar310._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar325._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar310._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar325._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar310._60_4_;
                auVar308 = vmulps_avx512f(auVar325,auVar325);
                auVar310 = vfmadd132ps_avx512f(auVar325,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar325,(undefined1  [64])afVar138);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar325,(undefined1  [64])afVar139);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar325,(undefined1  [64])afVar140);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar325,(undefined1  [64])afVar141);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar325,(undefined1  [64])afVar142);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar325,(undefined1  [64])afVar143);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar325,(undefined1  [64])afVar144);
                auVar311 = vmulps_avx512f(auVar308,auVar325);
                auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar325);
                uVar183 = vcmpps_avx512f(auVar307,in_ZMM30,2);
                auVar307 = vpsubd_avx512f(auVar309,auVar303);
                auVar307 = vcvtdq2ps_avx512f(auVar307);
                auVar309 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar326._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar326._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar326._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar326._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar326._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar326._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar326._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar326._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)(bVar17 & 1);
                auVar326._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar326._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar326._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar326._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar326._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar326._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar326._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar326._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar310,auVar326,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar320,auVar308);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar326,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar307 = vmulps_avx512f(auVar307,auVar305);
                auVar308 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar327._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar307._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar327._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar307._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar327._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar307._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar327._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar307._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar327._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar307._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar327._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar307._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar327._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar307._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar327._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar307._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar327._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar307._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar327._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar307._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar327._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar307._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar327._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar307._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar327._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar307._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar327._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar307._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar327._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar307._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar327._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar307._60_4_;
                auVar307 = vminps_avx512f(auVar327,(undefined1  [64])afVar129);
                auVar307 = vmaxps_avx512f(auVar307,(undefined1  [64])afVar130);
                auVar308 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar307,
                                               (undefined1  [64])afVar137);
                auVar309 = vrndscaleps_avx512f(auVar308,1);
                uVar186 = vcmpps_avx512f(auVar308,auVar309,1);
                auVar308 = vsubps_avx512f(auVar309,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar186 & 1);
                auVar328._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar186 >> 1) & 1);
                auVar328._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar186 >> 2) & 1);
                auVar328._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar186 >> 3) & 1);
                auVar328._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar186 >> 4) & 1);
                auVar328._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar186 >> 5) & 1);
                auVar328._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar186 >> 6) & 1);
                auVar328._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar186 >> 7) & 1);
                auVar328._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)((byte)(uVar186 >> 8) & 1);
                auVar328._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar186 >> 9) & 1);
                auVar328._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar186 >> 10) & 1);
                auVar328._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xb) & 1);
                auVar328._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xc) & 1);
                auVar328._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xd) & 1);
                auVar328._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar186 >> 0xe) & 1);
                auVar328._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar186 >> 0xf,0);
                auVar328._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar328,auVar301);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar328,auVar302);
                auVar308 = vmulps_avx512f(auVar307,auVar307);
                auVar309 = vfmadd213ps_avx512f(auVar307,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar134);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar135);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar136);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar137);
                auVar307 = vfmadd213ps_avx512f(auVar309,auVar308,auVar307);
                auVar307 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                auVar308 = vcvttps2dq_avx512f(auVar328);
                auVar308 = vpaddd_avx512f(auVar308,auVar303);
                auVar308 = vpslld_avx512f(auVar308,0x17);
                auVar307 = vfmadd213ps_avx512f(auVar308,auVar307,auVar304);
                auVar308 = vrcp14ps_avx512f(auVar307);
                auVar307 = vfmsub213ps_avx512f(auVar307,auVar308,auVar304);
                auVar307 = vfnmadd132ps_avx512vl(auVar307,auVar308,auVar308);
                auVar307 = vfnmsub213ps_avx512f(auVar307,auVar305,auVar304);
                auVar330 = vmulps_avx512f(auVar307,auVar306);
                break;
              case 6:
                auVar307 = vbroadcastss_avx512f
                                     (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var164)));
                uVar3 = (*(uint **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar105._4_4_ = uVar3;
                auVar105._0_4_ = uVar3;
                auVar105._8_4_ = uVar3;
                auVar105._12_4_ = uVar3;
                auVar105._16_4_ = uVar3;
                auVar105._20_4_ = uVar3;
                auVar105._24_4_ = uVar3;
                auVar105._28_4_ = uVar3;
                auVar105._32_4_ = uVar3;
                auVar105._36_4_ = uVar3;
                auVar105._40_4_ = uVar3;
                auVar105._44_4_ = uVar3;
                auVar105._48_4_ = uVar3;
                auVar105._52_4_ = uVar3;
                auVar105._56_4_ = uVar3;
                auVar105._60_4_ = uVar3;
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar306,auVar105);
                auVar307 = vmaxps_avx512f(auVar307,in_ZMM30);
                auVar307 = vminps_avx512f(auVar307,auVar304);
                auVar330 = vmulps_avx512f(auVar307,auVar306);
              }
              *(undefined1 (*) [64])local_2a8 = auVar330;
              local_2a8 = local_2a8 + 8;
              iVar154 = iVar154 + 1;
            }
            uVar186 = (ulong)(uVar148 + 1);
          }
        }
      }
      if ((iVar170 == 0x10) && (uVar159 == 4)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar174 = 0;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar174;
        }
        auVar214._8_4_ = 0x42b0c0a5;
        auVar214._0_8_ = 0x42b0c0a542b0c0a5;
        auVar214._12_4_ = 0x42b0c0a5;
        auVar215._8_4_ = 0xc2b0c0a5;
        auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar215._12_4_ = 0xc2b0c0a5;
        auVar216._8_4_ = 0x3f000000;
        auVar216._0_8_ = 0x3f0000003f000000;
        auVar216._12_4_ = 0x3f000000;
        auVar217._8_4_ = 0x3fb8aa3b;
        auVar217._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar217._12_4_ = 0x3fb8aa3b;
        auVar218._8_4_ = 0x3f800000;
        auVar218._0_8_ = 0x3f8000003f800000;
        auVar218._12_4_ = 0x3f800000;
        auVar219._8_4_ = 0x3f318000;
        auVar219._0_8_ = 0x3f3180003f318000;
        auVar219._12_4_ = 0x3f318000;
        auVar191 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar220._8_4_ = 0x3ab743ce;
        auVar220._0_8_ = 0x3ab743ce3ab743ce;
        auVar220._12_4_ = 0x3ab743ce;
        auVar221._8_4_ = 0x3c088908;
        auVar221._0_8_ = 0x3c0889083c088908;
        auVar221._12_4_ = 0x3c088908;
        auVar225._8_4_ = 0x3d2aa9c1;
        auVar225._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar225._12_4_ = 0x3d2aa9c1;
        auVar222._8_4_ = 0x3e2aaaaa;
        auVar222._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar222._12_4_ = 0x3e2aaaaa;
        auVar223._8_4_ = 0x3f800000;
        auVar223._0_8_ = 0x3f8000003f800000;
        auVar223._12_4_ = 0x3f800000;
        auVar224._8_4_ = 0xb95e8083;
        auVar224._0_8_ = 0xb95e8083b95e8083;
        auVar224._12_4_ = 0xb95e8083;
        auVar192 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar192);
        auVar193 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; uVar174 != uVar188; uVar174 = uVar174 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar174 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar207 = ZEXT816(0) << 0x40;
              }
              else {
                auVar207 = *(undefined1 (*) [16])(lVar157 + uVar174 * 0x10);
              }
              auVar338 = ZEXT1664(auVar207);
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar174 * (this->weight_data_tm).elemsize +
                        0xf0;
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                lVar180 = lVar162;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    lVar127 = (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar183;
                    iVar147 = iVar146;
                    for (lVar171 = 0; uVar173 * 0x100 != lVar171; lVar171 = lVar171 + 0x100) {
                      if (((-1 < iVar147) && (iVar149 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar149 < iVar153)) {
                        lVar155 = (long)(iVar149 << 4);
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127);
                        auVar207._4_4_ = uVar340;
                        auVar207._0_4_ = uVar340;
                        auVar207._8_4_ = uVar340;
                        auVar207._12_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 4);
                        auVar426._4_4_ = uVar340;
                        auVar426._0_4_ = uVar340;
                        auVar426._8_4_ = uVar340;
                        auVar426._12_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 8);
                        auVar489._4_4_ = uVar340;
                        auVar489._0_4_ = uVar340;
                        auVar489._8_4_ = uVar340;
                        auVar489._12_4_ = uVar340;
                        auVar194 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar195 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x10)));
                        auVar196 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x14)));
                        auVar197 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x18)));
                        auVar198 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x1c)));
                        auVar199 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x20)));
                        auVar200 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x24)));
                        auVar201 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x28)));
                        auVar202 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x2c)));
                        auVar203 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x30)));
                        auVar204 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x34)));
                        auVar205 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x38)));
                        auVar206 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x3c)));
                        auVar207 = vfmadd231ps_fma(auVar338._0_16_,auVar207,
                                                   *(undefined1 (*) [16])(lVar180 + -0xf0 + lVar171)
                                                  );
                        auVar207 = vfmadd231ps_fma(auVar207,auVar426,
                                                   *(undefined1 (*) [16])(lVar180 + -0xe0 + lVar171)
                                                  );
                        auVar207 = vfmadd231ps_fma(auVar207,auVar489,
                                                   *(undefined1 (*) [16])(lVar180 + -0xd0 + lVar171)
                                                  );
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar194,
                                              *(undefined1 (*) [16])(lVar180 + -0xc0 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar195,
                                              *(undefined1 (*) [16])(lVar180 + -0xb0 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar196,
                                              *(undefined1 (*) [16])(lVar180 + -0xa0 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar197,
                                              *(undefined1 (*) [16])(lVar180 + -0x90 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar198,
                                              *(undefined1 (*) [16])(lVar180 + -0x80 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar199,
                                              *(undefined1 (*) [16])(lVar180 + -0x70 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar200,
                                              *(undefined1 (*) [16])(lVar180 + -0x60 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar201,
                                              *(undefined1 (*) [16])(lVar180 + -0x50 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar202,
                                              *(undefined1 (*) [16])(lVar180 + -0x40 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar203,
                                              *(undefined1 (*) [16])(lVar180 + -0x30 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar204,
                                              *(undefined1 (*) [16])(lVar180 + -0x20 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar205,
                                              *(undefined1 (*) [16])(lVar180 + -0x10 + lVar171));
                        auVar207 = vfmadd231ps_avx512vl
                                             (auVar207,auVar206,
                                              *(undefined1 (*) [16])(lVar180 + lVar171));
                        auVar338 = ZEXT1664(auVar207);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x100;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x40) * 4;
              }
              auVar207 = auVar338._0_16_;
              auVar194 = auVar207;
              if (iVar152 - 1U < 6) {
                auVar194 = vmaxps_avx512vl(auVar207,auVar192);
                switch(iVar152) {
                case 2:
                  auVar207 = vminps_avx512vl(auVar207,auVar192);
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar26._4_4_ = uVar340;
                  auVar26._0_4_ = uVar340;
                  auVar26._8_4_ = uVar340;
                  auVar26._12_4_ = uVar340;
                  auVar194 = vfmadd231ps_avx512vl(auVar194,auVar207,auVar26);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar24._4_4_ = uVar340;
                  auVar24._0_4_ = uVar340;
                  auVar24._8_4_ = uVar340;
                  auVar24._12_4_ = uVar340;
                  auVar207 = vmaxps_avx512vl(auVar207,auVar24);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar25._4_4_ = uVar340;
                  auVar25._0_4_ = uVar340;
                  auVar25._8_4_ = uVar340;
                  auVar25._12_4_ = uVar340;
                  auVar194 = vminps_avx512vl(auVar207,auVar25);
                  break;
                case 4:
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar207 = vxorps_avx512vl(auVar207,auVar22);
                  auVar207 = vminps_avx(auVar207,auVar214);
                  auVar194 = vmaxps_avx(auVar207,auVar215);
                  auVar195 = vfmadd231ps_fma(auVar216,auVar194,auVar217);
                  auVar494._0_4_ = (int)auVar195._0_4_;
                  auVar494._4_4_ = (int)auVar195._4_4_;
                  auVar494._8_4_ = (int)auVar195._8_4_;
                  auVar494._12_4_ = (int)auVar195._12_4_;
                  auVar207 = vcvtdq2ps_avx(auVar494);
                  uVar183 = vcmpps_avx512vl(auVar195,auVar207,1);
                  auVar195 = vsubps_avx512vl(auVar207,auVar218);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar213._0_4_ =
                       (float)((uint)bVar16 * auVar195._0_4_ | (uint)!bVar16 * auVar207._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar213._4_4_ =
                       (float)((uint)bVar16 * auVar195._4_4_ | (uint)!bVar16 * auVar207._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar213._8_4_ =
                       (float)((uint)bVar16 * auVar195._8_4_ | (uint)!bVar16 * auVar207._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar213._12_4_ =
                       (float)((uint)bVar16 * auVar195._12_4_ | (uint)!bVar16 * auVar207._12_4_);
                  auVar207 = vfmsub231ps_fma(auVar194,auVar213,auVar219);
                  auVar23._8_4_ = 0x395e8083;
                  auVar23._0_8_ = 0x395e8083395e8083;
                  auVar23._12_4_ = 0x395e8083;
                  auVar194 = vfmsub231ps_avx512vl(auVar207,auVar213,auVar23);
                  auVar392._0_4_ = auVar194._0_4_ * auVar194._0_4_;
                  auVar392._4_4_ = auVar194._4_4_ * auVar194._4_4_;
                  auVar392._8_4_ = auVar194._8_4_ * auVar194._8_4_;
                  auVar392._12_4_ = auVar194._12_4_ * auVar194._12_4_;
                  auVar207 = vfmadd213ps_fma(auVar191,auVar194,auVar220);
                  auVar207 = vfmadd213ps_fma(auVar207,auVar194,auVar221);
                  auVar207 = vfmadd213ps_fma(auVar207,auVar194,auVar225);
                  auVar207 = vfmadd213ps_fma(auVar207,auVar194,auVar222);
                  auVar207 = vfmadd213ps_fma(auVar207,auVar194,auVar216);
                  auVar207 = vfmadd213ps_fma(auVar207,auVar392,auVar194);
                  auVar341._0_4_ = auVar207._0_4_ + 1.0;
                  auVar341._4_4_ = auVar207._4_4_ + 1.0;
                  auVar341._8_4_ = auVar207._8_4_ + 1.0;
                  auVar341._12_4_ = auVar207._12_4_ + 1.0;
                  auVar393._0_4_ = (int)auVar213._0_4_;
                  auVar393._4_4_ = (int)auVar213._4_4_;
                  auVar393._8_4_ = (int)auVar213._8_4_;
                  auVar393._12_4_ = (int)auVar213._12_4_;
                  auVar207 = vpslld_avx(auVar393,0x17);
                  auVar207 = vpaddd_avx(auVar223,auVar207);
                  auVar194 = vfmadd213ps_fma(auVar207,auVar341,auVar218);
                  auVar207 = vrcpps_avx(auVar194);
                  auVar194 = vfmsub213ps_fma(auVar194,auVar207,auVar218);
                  auVar194 = vfnmadd132ps_fma(auVar194,auVar207,auVar207);
                  break;
                case 5:
                  auVar194 = vminps_avx(auVar207,auVar214);
                  auVar195 = vmaxps_avx(auVar194,auVar215);
                  auVar196 = vfmadd213ps_fma(auVar217,auVar195,auVar216);
                  auVar490._0_4_ = (int)auVar196._0_4_;
                  auVar490._4_4_ = (int)auVar196._4_4_;
                  auVar490._8_4_ = (int)auVar196._8_4_;
                  auVar490._12_4_ = (int)auVar196._12_4_;
                  auVar194 = vcvtdq2ps_avx(auVar490);
                  uVar183 = vcmpps_avx512vl(auVar196,auVar194,1);
                  auVar196 = vsubps_avx512vl(auVar194,auVar218);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar208._0_4_ =
                       (float)((uint)bVar16 * auVar196._0_4_ | (uint)!bVar16 * auVar194._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar208._4_4_ =
                       (float)((uint)bVar16 * auVar196._4_4_ | (uint)!bVar16 * auVar194._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar208._8_4_ =
                       (float)((uint)bVar16 * auVar196._8_4_ | (uint)!bVar16 * auVar194._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar208._12_4_ =
                       (float)((uint)bVar16 * auVar196._12_4_ | (uint)!bVar16 * auVar194._12_4_);
                  auVar194 = vfmsub231ps_fma(auVar195,auVar208,auVar219);
                  auVar194 = vfnmsub231ps_fma(auVar194,auVar208,auVar224);
                  auVar427._0_4_ = auVar194._0_4_ * auVar194._0_4_;
                  auVar427._4_4_ = auVar194._4_4_ * auVar194._4_4_;
                  auVar427._8_4_ = auVar194._8_4_ * auVar194._8_4_;
                  auVar427._12_4_ = auVar194._12_4_ * auVar194._12_4_;
                  auVar195 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar220);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar221);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar225);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar222);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar216);
                  auVar194 = vfmadd213ps_avx512vl(auVar195,auVar427,auVar194);
                  auVar195 = vaddps_avx512vl(auVar194,auVar218);
                  auVar428._0_4_ = (int)auVar208._0_4_;
                  auVar428._4_4_ = (int)auVar208._4_4_;
                  auVar428._8_4_ = (int)auVar208._8_4_;
                  auVar428._12_4_ = (int)auVar208._12_4_;
                  auVar194 = vpslld_avx(auVar428,0x17);
                  auVar194 = vpaddd_avx(auVar194,auVar223);
                  auVar194 = vfmadd213ps_fma(auVar194,auVar195,auVar218);
                  uVar183 = vcmpps_avx512vl(auVar194,auVar192,2);
                  auVar197._8_4_ = 0x800000;
                  auVar197._0_8_ = 0x80000000800000;
                  auVar197._12_4_ = 0x800000;
                  auVar194 = vmaxps_avx512vl(auVar194,auVar197);
                  auVar196 = vpsrld_avx(auVar194,0x17);
                  auVar491._8_4_ = 0x807fffff;
                  auVar491._0_8_ = 0x807fffff807fffff;
                  auVar491._12_4_ = 0x807fffff;
                  auVar198._8_4_ = 0x3f000000;
                  auVar198._0_8_ = 0x3f0000003f000000;
                  auVar198._12_4_ = 0x3f000000;
                  auVar194 = vpternlogd_avx512vl(auVar194,auVar491,auVar198,0xea);
                  auVar199._8_4_ = 0x3f3504f3;
                  auVar199._0_8_ = 0x3f3504f33f3504f3;
                  auVar199._12_4_ = 0x3f3504f3;
                  uVar184 = vcmpps_avx512vl(auVar194,auVar199,1);
                  auVar200._8_4_ = 0xbf800000;
                  auVar200._0_8_ = 0xbf800000bf800000;
                  auVar200._12_4_ = 0xbf800000;
                  auVar195 = vaddps_avx512vl(auVar194,auVar200);
                  auVar194 = vaddps_avx512vl(auVar195,auVar194);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar209._0_4_ =
                       (float)((uint)bVar16 * auVar194._0_4_ | (uint)!bVar16 * auVar195._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar209._4_4_ =
                       (float)((uint)bVar16 * auVar194._4_4_ | (uint)!bVar16 * auVar195._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar209._8_4_ =
                       (float)((uint)bVar16 * auVar194._8_4_ | (uint)!bVar16 * auVar195._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar209._12_4_ =
                       (float)((uint)bVar16 * auVar194._12_4_ | (uint)!bVar16 * auVar195._12_4_);
                  auVar390._0_4_ = auVar209._0_4_ * auVar209._0_4_;
                  auVar390._4_4_ = auVar209._4_4_ * auVar209._4_4_;
                  auVar390._8_4_ = auVar209._8_4_ * auVar209._8_4_;
                  auVar390._12_4_ = auVar209._12_4_ * auVar209._12_4_;
                  auVar194 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar201._8_4_ = 0xbdebd1b8;
                  auVar201._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar201._12_4_ = 0xbdebd1b8;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar201);
                  auVar202._8_4_ = 0x3def251a;
                  auVar202._0_8_ = 0x3def251a3def251a;
                  auVar202._12_4_ = 0x3def251a;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar202);
                  auVar203._8_4_ = 0xbdfe5d4f;
                  auVar203._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar203._12_4_ = 0xbdfe5d4f;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar203);
                  auVar204._8_4_ = 0x3e11e9bf;
                  auVar204._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar204._12_4_ = 0x3e11e9bf;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar204);
                  auVar205._8_4_ = 0xbe2aae50;
                  auVar205._0_8_ = 0xbe2aae50be2aae50;
                  auVar205._12_4_ = 0xbe2aae50;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar205);
                  auVar206._8_4_ = 0x3e4cceac;
                  auVar206._0_8_ = 0x3e4cceac3e4cceac;
                  auVar206._12_4_ = 0x3e4cceac;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar206);
                  auVar19._8_4_ = 0xbe7ffffc;
                  auVar19._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar19._12_4_ = 0xbe7ffffc;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar19);
                  auVar20._8_4_ = 0x3eaaaaaa;
                  auVar20._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar20._12_4_ = 0x3eaaaaaa;
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar209,auVar20);
                  auVar195 = vmulps_avx512vl(auVar390,auVar209);
                  auVar195 = vmulps_avx512vl(auVar195,auVar194);
                  auVar21._8_4_ = 0xffffff82;
                  auVar21._0_8_ = 0xffffff82ffffff82;
                  auVar21._12_4_ = 0xffffff82;
                  auVar194 = vpaddd_avx512vl(auVar196,auVar21);
                  auVar194 = vcvtdq2ps_avx(auVar194);
                  auVar196 = vsubps_avx512vl(auVar194,auVar218);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar210._0_4_ = (uint)bVar16 * auVar196._0_4_ | (uint)!bVar16 * auVar194._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar210._4_4_ = (uint)bVar16 * auVar196._4_4_ | (uint)!bVar16 * auVar194._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar210._8_4_ = (uint)bVar16 * auVar196._8_4_ | (uint)!bVar16 * auVar194._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar210._12_4_ = (uint)bVar16 * auVar196._12_4_ | (uint)!bVar16 * auVar194._12_4_
                  ;
                  auVar194 = vfmadd231ps_avx512vl(auVar195,auVar210,auVar224);
                  auVar194 = vfmsub231ps_avx512vl(auVar194,auVar216,auVar390);
                  auVar194 = vsubps_avx512vl(auVar194,auVar209);
                  auVar194 = vfnmadd231ps_fma(auVar194,auVar219,auVar210);
                  auVar195 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar211._0_4_ =
                       (uint)bVar16 * auVar195._0_4_ |
                       (uint)!bVar16 * (int)(auVar194._0_4_ + auVar194._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar211._4_4_ =
                       (uint)bVar16 * auVar195._4_4_ |
                       (uint)!bVar16 * (int)(auVar194._4_4_ + auVar194._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar211._8_4_ =
                       (uint)bVar16 * auVar195._8_4_ |
                       (uint)!bVar16 * (int)(auVar194._8_4_ + auVar194._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar211._12_4_ =
                       (uint)bVar16 * auVar195._12_4_ |
                       (uint)!bVar16 * (int)(auVar194._12_4_ + auVar194._12_4_);
                  auVar194 = vminps_avx(auVar211,auVar214);
                  auVar195 = vmaxps_avx(auVar194,auVar215);
                  auVar196 = vfmadd213ps_fma(auVar217,auVar195,auVar216);
                  auVar492._0_4_ = (int)auVar196._0_4_;
                  auVar492._4_4_ = (int)auVar196._4_4_;
                  auVar492._8_4_ = (int)auVar196._8_4_;
                  auVar492._12_4_ = (int)auVar196._12_4_;
                  auVar194 = vcvtdq2ps_avx(auVar492);
                  uVar183 = vcmpps_avx512vl(auVar196,auVar194,1);
                  auVar196 = vsubps_avx512vl(auVar194,auVar218);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar212._0_4_ =
                       (float)((uint)bVar16 * auVar196._0_4_ | (uint)!bVar16 * auVar194._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar212._4_4_ =
                       (float)((uint)bVar16 * auVar196._4_4_ | (uint)!bVar16 * auVar194._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar212._8_4_ =
                       (float)((uint)bVar16 * auVar196._8_4_ | (uint)!bVar16 * auVar194._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar212._12_4_ =
                       (float)((uint)bVar16 * auVar196._12_4_ | (uint)!bVar16 * auVar194._12_4_);
                  auVar194 = vfmsub231ps_fma(auVar195,auVar212,auVar219);
                  auVar194 = vfnmsub231ps_fma(auVar194,auVar212,auVar224);
                  auVar429._0_4_ = auVar194._0_4_ * auVar194._0_4_;
                  auVar429._4_4_ = auVar194._4_4_ * auVar194._4_4_;
                  auVar429._8_4_ = auVar194._8_4_ * auVar194._8_4_;
                  auVar429._12_4_ = auVar194._12_4_ * auVar194._12_4_;
                  auVar195 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar220);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar221);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar225);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar222);
                  auVar195 = vfmadd213ps_avx512vl(auVar195,auVar194,auVar216);
                  auVar194 = vfmadd213ps_avx512vl(auVar195,auVar429,auVar194);
                  auVar195 = vaddps_avx512vl(auVar194,auVar218);
                  auVar391._0_4_ = (int)auVar212._0_4_;
                  auVar391._4_4_ = (int)auVar212._4_4_;
                  auVar391._8_4_ = (int)auVar212._8_4_;
                  auVar391._12_4_ = (int)auVar212._12_4_;
                  auVar194 = vpslld_avx(auVar391,0x17);
                  auVar194 = vpaddd_avx(auVar223,auVar194);
                  auVar195 = vfmadd213ps_fma(auVar194,auVar195,auVar218);
                  auVar194 = vrcpps_avx(auVar195);
                  auVar493._0_4_ = auVar194._0_4_ + auVar194._0_4_;
                  auVar493._4_4_ = auVar194._4_4_ + auVar194._4_4_;
                  auVar493._8_4_ = auVar194._8_4_ + auVar194._8_4_;
                  auVar493._12_4_ = auVar194._12_4_ + auVar194._12_4_;
                  auVar195 = vfmsub213ps_avx512vl(auVar195,auVar493,auVar193);
                  auVar194 = vfnmadd213ps_fma(auVar195,auVar194,auVar493);
                  auVar194 = vfmsub213ps_fma(auVar194,auVar207,auVar207);
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar196._4_4_ = uVar340;
                  auVar196._0_4_ = uVar340;
                  auVar196._8_4_ = uVar340;
                  auVar196._12_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar195._4_4_ = uVar340;
                  auVar195._0_4_ = uVar340;
                  auVar195._8_4_ = uVar340;
                  auVar195._12_4_ = uVar340;
                  auVar207 = vfmadd213ps_avx512vl(auVar196,auVar207,auVar195);
                  auVar207 = vmaxps_avx512vl(auVar207,auVar192);
                  auVar207 = vminps_avx(auVar207,auVar218);
                  auVar194._0_4_ = auVar207._0_4_ * auVar338._0_4_;
                  auVar194._4_4_ = auVar207._4_4_ * auVar338._4_4_;
                  auVar194._8_4_ = auVar207._8_4_ * auVar338._8_4_;
                  auVar194._12_4_ = auVar207._12_4_ * auVar338._12_4_;
                }
              }
              *(undefined1 (*) [16])local_268 = auVar194;
              local_268 = local_268 + 2;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      afVar144 = _ps512_cephes_log_p8;
      afVar143 = _ps512_cephes_log_p7;
      afVar142 = _ps512_cephes_log_p6;
      afVar141 = _ps512_cephes_log_p5;
      afVar140 = _ps512_cephes_log_p4;
      afVar139 = _ps512_cephes_log_p3;
      afVar138 = _ps512_cephes_log_p2;
      afVar137 = _ps512_cephes_exp_p5;
      afVar136 = _ps512_cephes_exp_p4;
      afVar135 = _ps512_cephes_exp_p3;
      afVar134 = _ps512_cephes_exp_p2;
      afVar133 = _ps512_cephes_exp_p1;
      afVar132 = _ps512_cephes_exp_p0;
      afVar131 = _ps512_cephes_LOG2EF;
      afVar130 = _ps512_exp_lo;
      afVar129 = _ps512_exp_hi;
      afVar128 = _ps512_1;
      if ((iVar170 == 1) && (uVar159 == 0x10)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        uVar340 = *(undefined4 *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        auVar338 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar301 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q2);
        auVar302 = vxorps_avx512dq(auVar338,(undefined1  [64])_ps512_cephes_log_q1);
        auVar303 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
        auVar320 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar338);
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar174 = 0;
        if (0 < (int)uVar165) {
          uVar174 = (ulong)uVar165;
        }
        uVar158 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar158 = 0;
        }
        uVar188 = 0;
        auVar304 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar191 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar191);
        auVar305 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (; uVar188 != uVar158; uVar188 = uVar188 + 1) {
          local_2a8 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar188 * local_1e8.elemsize);
          iVar152 = bottom_blob->w;
          iVar153 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar154 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar306 = *(undefined1 (*) [64])(lVar157 + uVar188 * 0x40);
              }
              pvVar185 = (void *)((this->weight_data_tm).cstep * uVar188 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                pvVar178 = pvVar185;
                for (uVar184 = 0; uVar184 != uVar174; uVar184 = uVar184 + 1) {
                  iVar146 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar146) && (iVar147 = iVar146 / iVar163, iVar146 % iVar163 == 0)) &&
                     (iVar147 < iVar153)) {
                    iVar146 = iVar154;
                    for (lVar162 = 0; uVar173 * 0x40 != lVar162; lVar162 = lVar162 + 0x40) {
                      if (((-1 < iVar146) && (iVar149 = iVar146 / iVar182, iVar146 % iVar182 == 0))
                         && (iVar149 < iVar152)) {
                        auVar307 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                               (long)iVar149 * 4 +
                                                               (long)iVar147 *
                                                               (long)bottom_blob->w *
                                                               bottom_blob->elemsize +
                                                               bottom_blob->cstep *
                                                               bottom_blob->elemsize * uVar183)));
                        auVar306 = vfmadd231ps_avx512f(auVar306,auVar307,
                                                       *(undefined1 (*) [64])
                                                        ((long)pvVar178 + lVar162));
                      }
                      iVar146 = iVar146 + iVar168;
                    }
                  }
                  pvVar178 = (void *)((long)pvVar178 + (long)(int)uVar161 * 0x40);
                }
                pvVar185 = (void *)((long)pvVar185 + (long)(int)(uVar161 * uVar165 * 0x10) * 4);
              }
              auVar337 = auVar306;
              switch(uVar340) {
              case 1:
                auVar337 = vmaxps_avx512f(auVar306,in_ZMM30);
                break;
              case 2:
                uVar183 = vcmpps_avx512f(auVar306,in_ZMM30,1);
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar112._4_4_ = uVar2;
                auVar112._0_4_ = uVar2;
                auVar112._8_4_ = uVar2;
                auVar112._12_4_ = uVar2;
                auVar112._16_4_ = uVar2;
                auVar112._20_4_ = uVar2;
                auVar112._24_4_ = uVar2;
                auVar112._28_4_ = uVar2;
                auVar112._32_4_ = uVar2;
                auVar112._36_4_ = uVar2;
                auVar112._40_4_ = uVar2;
                auVar112._44_4_ = uVar2;
                auVar112._48_4_ = uVar2;
                auVar112._52_4_ = uVar2;
                auVar112._56_4_ = uVar2;
                auVar112._60_4_ = uVar2;
                auVar307 = vmulps_avx512f(auVar306,auVar112);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar337._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar306._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar337._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar306._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar337._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar306._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar337._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar306._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar337._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar306._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar337._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar306._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar337._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar306._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar337._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar306._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar337._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar306._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar337._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar306._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar337._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar306._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar337._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar306._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar337._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar306._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar337._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar306._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar337._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar306._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar337._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar306._60_4_;
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                auVar110._4_4_ = uVar2;
                auVar110._0_4_ = uVar2;
                auVar110._8_4_ = uVar2;
                auVar110._12_4_ = uVar2;
                auVar110._16_4_ = uVar2;
                auVar110._20_4_ = uVar2;
                auVar110._24_4_ = uVar2;
                auVar110._28_4_ = uVar2;
                auVar110._32_4_ = uVar2;
                auVar110._36_4_ = uVar2;
                auVar110._40_4_ = uVar2;
                auVar110._44_4_ = uVar2;
                auVar110._48_4_ = uVar2;
                auVar110._52_4_ = uVar2;
                auVar110._56_4_ = uVar2;
                auVar110._60_4_ = uVar2;
                auVar306 = vmaxps_avx512f(auVar306,auVar110);
                uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar111._4_4_ = uVar2;
                auVar111._0_4_ = uVar2;
                auVar111._8_4_ = uVar2;
                auVar111._12_4_ = uVar2;
                auVar111._16_4_ = uVar2;
                auVar111._20_4_ = uVar2;
                auVar111._24_4_ = uVar2;
                auVar111._28_4_ = uVar2;
                auVar111._32_4_ = uVar2;
                auVar111._36_4_ = uVar2;
                auVar111._40_4_ = uVar2;
                auVar111._44_4_ = uVar2;
                auVar111._48_4_ = uVar2;
                auVar111._52_4_ = uVar2;
                auVar111._56_4_ = uVar2;
                auVar111._60_4_ = uVar2;
                auVar337 = vminps_avx512f(auVar306,auVar111);
                break;
              case 4:
                auVar306 = vxorps_avx512dq(auVar306,auVar338);
                auVar306 = vminps_avx512f(auVar306,(undefined1  [64])afVar129);
                auVar306 = vmaxps_avx512f(auVar306,(undefined1  [64])afVar130);
                auVar307 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar306,
                                               (undefined1  [64])afVar137);
                auVar308 = vrndscaleps_avx512f(auVar307,1);
                uVar183 = vcmpps_avx512f(auVar307,auVar308,1);
                auVar307 = vsubps_avx512f(auVar308,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar336._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar308._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar336._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar308._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar336._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar308._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar336._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar308._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar336._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar308._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar336._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar308._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar336._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar308._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar336._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar308._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar336._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar308._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar336._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar308._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar336._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar308._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar336._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar308._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar336._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar308._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar336._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar308._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar336._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar308._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar336._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar308._60_4_;
                auVar306 = vfmadd231ps_avx512f(auVar306,auVar336,auVar301);
                auVar306 = vfmadd231ps_avx512f(auVar306,auVar336,auVar302);
                auVar307 = vmulps_avx512f(auVar306,auVar306);
                auVar308 = vfmadd213ps_avx512f(auVar306,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar134);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar135);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar136);
                auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar137);
                auVar306 = vfmadd213ps_avx512f(auVar308,auVar307,auVar306);
                auVar306 = vaddps_avx512f(auVar306,(undefined1  [64])afVar128);
                auVar307 = vcvttps2dq_avx512f(auVar336);
                auVar307 = vpaddd_avx512f(auVar307,auVar303);
                auVar307 = vpslld_avx512f(auVar307,0x17);
                auVar306 = vfmadd213ps_avx512f(auVar307,auVar306,auVar304);
                auVar307 = vrcp14ps_avx512f(auVar306);
                auVar306 = vfmsub213ps_avx512f(auVar306,auVar307,auVar304);
                auVar337 = vfnmadd132ps_avx512vl(auVar306,auVar307,auVar307);
                break;
              case 5:
                auVar307 = vminps_avx512f(auVar306,(undefined1  [64])afVar129);
                auVar307 = vmaxps_avx512f(auVar307,(undefined1  [64])afVar130);
                auVar308 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar307,
                                               (undefined1  [64])afVar137);
                auVar309 = vrndscaleps_avx512f(auVar308,1);
                uVar183 = vcmpps_avx512f(auVar308,auVar309,1);
                auVar308 = vsubps_avx512f(auVar309,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar331._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar331._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar331._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar331._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar331._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar331._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar331._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar331._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar331._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar331._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar331._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar331._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar331._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar331._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar331._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar331._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar331,auVar301);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar331,auVar302);
                auVar308 = vmulps_avx512f(auVar307,auVar307);
                auVar309 = vfmadd213ps_avx512f(auVar307,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar134);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar135);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar136);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar137);
                auVar307 = vfmadd213ps_avx512f(auVar309,auVar308,auVar307);
                auVar307 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                auVar308 = vcvttps2dq_avx512f(auVar331);
                auVar308 = vpaddd_avx512f(auVar308,auVar303);
                auVar308 = vpslld_avx512f(auVar308,0x17);
                auVar307 = vfmadd213ps_avx512f(auVar308,auVar307,auVar304);
                auVar308 = vmaxps_avx512f(auVar307,(undefined1  [64])_ps512_min_norm_pos);
                auVar309 = vpsrld_avx512f(auVar308,0x17);
                auVar308 = vpternlogd_avx512f(auVar308,(undefined1  [64])afVar137,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar183 = vcmpps_avx512f(auVar308,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar310 = vsubps_avx512f(auVar308,(undefined1  [64])afVar128);
                auVar308 = vaddps_avx512f(auVar310,auVar308);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar332._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar310._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar332._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar310._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar332._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar310._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar332._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar310._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar332._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar310._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar332._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar310._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar332._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar310._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar332._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar310._28_4_;
                bVar17 = (byte)(uVar183 >> 8);
                bVar16 = (bool)(bVar17 & 1);
                auVar332._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar310._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar332._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar310._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar332._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar310._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar332._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar310._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar332._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar310._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar332._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar310._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar332._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar310._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar332._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar310._60_4_;
                auVar308 = vmulps_avx512f(auVar332,auVar332);
                auVar310 = vfmadd132ps_avx512f(auVar332,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar332,(undefined1  [64])afVar138);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar332,(undefined1  [64])afVar139);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar332,(undefined1  [64])afVar140);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar332,(undefined1  [64])afVar141);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar332,(undefined1  [64])afVar142);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar332,(undefined1  [64])afVar143);
                auVar310 = vfmadd213ps_avx512f(auVar310,auVar332,(undefined1  [64])afVar144);
                auVar311 = vmulps_avx512f(auVar308,auVar332);
                auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar332);
                uVar184 = vcmpps_avx512f(auVar307,in_ZMM30,2);
                auVar307 = vpsubd_avx512f(auVar309,auVar303);
                auVar307 = vcvtdq2ps_avx512f(auVar307);
                auVar309 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar333._0_4_ = (uint)bVar16 * auVar307._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar333._4_4_ = (uint)bVar16 * auVar307._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar333._8_4_ = (uint)bVar16 * auVar307._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar333._12_4_ = (uint)bVar16 * auVar307._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar333._16_4_ = (uint)bVar16 * auVar307._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar333._20_4_ = (uint)bVar16 * auVar307._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar333._24_4_ = (uint)bVar16 * auVar307._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar333._28_4_ = (uint)bVar16 * auVar307._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)(bVar17 & 1);
                auVar333._32_4_ = (uint)bVar16 * auVar307._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar333._36_4_ = (uint)bVar16 * auVar307._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar333._40_4_ = (uint)bVar16 * auVar307._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar333._44_4_ = (uint)bVar16 * auVar307._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar333._48_4_ = (uint)bVar16 * auVar307._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar333._52_4_ = (uint)bVar16 * auVar307._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar333._56_4_ = (uint)bVar16 * auVar307._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar333._60_4_ = (uint)bVar16 * auVar307._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar310,auVar333,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar320,auVar308);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar333,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar307 = vmulps_avx512f(auVar307,auVar305);
                auVar308 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar16 = (bool)((byte)uVar184 & 1);
                auVar334._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar307._0_4_;
                bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                auVar334._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar307._4_4_;
                bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                auVar334._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar307._8_4_;
                bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                auVar334._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar307._12_4_;
                bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                auVar334._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar307._16_4_;
                bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                auVar334._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar307._20_4_;
                bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                auVar334._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar307._24_4_;
                bVar16 = (bool)((byte)(uVar184 >> 7) & 1);
                auVar334._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar307._28_4_;
                bVar16 = (bool)((byte)(uVar184 >> 8) & 1);
                auVar334._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar307._32_4_;
                bVar16 = (bool)((byte)(uVar184 >> 9) & 1);
                auVar334._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar307._36_4_;
                bVar16 = (bool)((byte)(uVar184 >> 10) & 1);
                auVar334._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar307._40_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xb) & 1);
                auVar334._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar307._44_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xc) & 1);
                auVar334._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar307._48_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xd) & 1);
                auVar334._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar307._52_4_;
                bVar16 = (bool)((byte)(uVar184 >> 0xe) & 1);
                auVar334._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar307._56_4_;
                bVar16 = SUB81(uVar184 >> 0xf,0);
                auVar334._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar307._60_4_;
                auVar307 = vminps_avx512f(auVar334,(undefined1  [64])afVar129);
                auVar307 = vmaxps_avx512f(auVar307,(undefined1  [64])afVar130);
                auVar308 = vfmadd213ps_avx512f((undefined1  [64])afVar131,auVar307,
                                               (undefined1  [64])afVar137);
                auVar309 = vrndscaleps_avx512f(auVar308,1);
                uVar183 = vcmpps_avx512f(auVar308,auVar309,1);
                auVar308 = vsubps_avx512f(auVar309,(undefined1  [64])afVar128);
                bVar16 = (bool)((byte)uVar183 & 1);
                auVar335._0_4_ = (uint)bVar16 * auVar308._0_4_ | (uint)!bVar16 * auVar309._0_4_;
                bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                auVar335._4_4_ = (uint)bVar16 * auVar308._4_4_ | (uint)!bVar16 * auVar309._4_4_;
                bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                auVar335._8_4_ = (uint)bVar16 * auVar308._8_4_ | (uint)!bVar16 * auVar309._8_4_;
                bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                auVar335._12_4_ = (uint)bVar16 * auVar308._12_4_ | (uint)!bVar16 * auVar309._12_4_;
                bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                auVar335._16_4_ = (uint)bVar16 * auVar308._16_4_ | (uint)!bVar16 * auVar309._16_4_;
                bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                auVar335._20_4_ = (uint)bVar16 * auVar308._20_4_ | (uint)!bVar16 * auVar309._20_4_;
                bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                auVar335._24_4_ = (uint)bVar16 * auVar308._24_4_ | (uint)!bVar16 * auVar309._24_4_;
                bVar16 = (bool)((byte)(uVar183 >> 7) & 1);
                auVar335._28_4_ = (uint)bVar16 * auVar308._28_4_ | (uint)!bVar16 * auVar309._28_4_;
                bVar16 = (bool)((byte)(uVar183 >> 8) & 1);
                auVar335._32_4_ = (uint)bVar16 * auVar308._32_4_ | (uint)!bVar16 * auVar309._32_4_;
                bVar16 = (bool)((byte)(uVar183 >> 9) & 1);
                auVar335._36_4_ = (uint)bVar16 * auVar308._36_4_ | (uint)!bVar16 * auVar309._36_4_;
                bVar16 = (bool)((byte)(uVar183 >> 10) & 1);
                auVar335._40_4_ = (uint)bVar16 * auVar308._40_4_ | (uint)!bVar16 * auVar309._40_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xb) & 1);
                auVar335._44_4_ = (uint)bVar16 * auVar308._44_4_ | (uint)!bVar16 * auVar309._44_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xc) & 1);
                auVar335._48_4_ = (uint)bVar16 * auVar308._48_4_ | (uint)!bVar16 * auVar309._48_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xd) & 1);
                auVar335._52_4_ = (uint)bVar16 * auVar308._52_4_ | (uint)!bVar16 * auVar309._52_4_;
                bVar16 = (bool)((byte)(uVar183 >> 0xe) & 1);
                auVar335._56_4_ = (uint)bVar16 * auVar308._56_4_ | (uint)!bVar16 * auVar309._56_4_;
                bVar16 = SUB81(uVar183 >> 0xf,0);
                auVar335._60_4_ = (uint)bVar16 * auVar308._60_4_ | (uint)!bVar16 * auVar309._60_4_;
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar335,auVar301);
                auVar307 = vfmadd231ps_avx512f(auVar307,auVar335,auVar302);
                auVar308 = vmulps_avx512f(auVar307,auVar307);
                auVar309 = vfmadd213ps_avx512f(auVar307,(undefined1  [64])afVar132,
                                               (undefined1  [64])afVar133);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar134);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar135);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar136);
                auVar309 = vfmadd213ps_avx512f(auVar309,auVar307,(undefined1  [64])afVar137);
                auVar307 = vfmadd213ps_avx512f(auVar309,auVar308,auVar307);
                auVar307 = vaddps_avx512f(auVar307,(undefined1  [64])afVar128);
                auVar308 = vcvttps2dq_avx512f(auVar335);
                auVar308 = vpaddd_avx512f(auVar308,auVar303);
                auVar308 = vpslld_avx512f(auVar308,0x17);
                auVar307 = vfmadd213ps_avx512f(auVar308,auVar307,auVar304);
                auVar308 = vrcp14ps_avx512f(auVar307);
                auVar307 = vfmsub213ps_avx512f(auVar307,auVar308,auVar304);
                auVar307 = vfnmadd132ps_avx512vl(auVar307,auVar308,auVar308);
                auVar307 = vfnmsub213ps_avx512f(auVar307,auVar305,auVar304);
                auVar337 = vmulps_avx512f(auVar307,auVar306);
                break;
              case 6:
                auVar307 = vbroadcastss_avx512f
                                     (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var164)));
                uVar177 = (*(uint **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar109._4_4_ = uVar177;
                auVar109._0_4_ = uVar177;
                auVar109._8_4_ = uVar177;
                auVar109._12_4_ = uVar177;
                auVar109._16_4_ = uVar177;
                auVar109._20_4_ = uVar177;
                auVar109._24_4_ = uVar177;
                auVar109._28_4_ = uVar177;
                auVar109._32_4_ = uVar177;
                auVar109._36_4_ = uVar177;
                auVar109._40_4_ = uVar177;
                auVar109._44_4_ = uVar177;
                auVar109._48_4_ = uVar177;
                auVar109._52_4_ = uVar177;
                auVar109._56_4_ = uVar177;
                auVar109._60_4_ = uVar177;
                auVar307 = vfmadd213ps_avx512f(auVar307,auVar306,auVar109);
                auVar307 = vmaxps_avx512f(auVar307,in_ZMM30);
                auVar307 = vminps_avx512f(auVar307,auVar304);
                auVar337 = vmulps_avx512f(auVar307,auVar306);
              }
              *(undefined1 (*) [64])local_2a8 = auVar337;
              local_2a8 = local_2a8 + 8;
              iVar154 = iVar154 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      if ((iVar170 == 0x10) && (uVar159 == 1)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0x114 + (long)p_Var164);
        local_170 = local_1e8.elemsize * local_1e8.cstep;
        uVar174 = 0;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar188 = uVar174;
        }
        uVar169 = local_1e8.w;
        if (local_1e8.w < 1) {
          uVar169 = 0;
        }
        uVar160 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar160 = 0;
        }
        local_158._0_4_ = uVar160;
        local_190 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          local_190 = uVar174;
        }
        iVar182 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        local_178 = (Allocator *)local_1e8.data;
        iVar153 = bottom_blob->w;
        iVar154 = bottom_blob->h;
        for (; uVar174 != local_190; uVar174 = uVar174 + 1) {
          local_268 = (Allocator *)((long)&local_178->_vptr_Allocator + local_170 * uVar174);
          for (iVar146 = 0; iVar146 != local_158._0_4_; iVar146 = iVar146 + 1) {
            pfVar176 = *(float **)(&this->field_0x118 + (long)p_Var164);
            sVar11 = (this->weight_data_tm).cstep;
            sVar12 = (this->weight_data_tm).elemsize;
            pvVar185 = (this->weight_data_tm).data;
            iVar147 = (1 - uVar161) * iVar168;
            for (uVar160 = 0; uVar160 != uVar169; uVar160 = uVar160 + 1) {
              if (lVar157 == 0) {
                fVar339 = 0.0;
              }
              else {
                fVar339 = *(float *)(lVar157 + uVar174 * 4);
              }
              auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar178 = (void *)(sVar11 * uVar174 * sVar12 + (long)pvVar185);
              for (uVar186 = 0; uVar186 != uVar188; uVar186 = uVar186 + 1) {
                pvVar172 = pvVar178;
                for (uVar183 = 0; uVar183 != uVar158; uVar183 = uVar183 + 1) {
                  iVar149 = (((int)uVar183 - uVar165) + 1) * iVar182 + iVar146;
                  if (((-1 < iVar149) && (iVar150 = iVar149 / iVar152, iVar149 % iVar152 == 0)) &&
                     (iVar150 < iVar154)) {
                    iVar149 = iVar147;
                    for (lVar162 = 0; uVar173 * 0x40 != lVar162; lVar162 = lVar162 + 0x40) {
                      if (((-1 < iVar149) && (iVar151 = iVar149 / iVar163, iVar149 % iVar163 == 0))
                         && (iVar151 < iVar153)) {
                        auVar338 = vfmadd231ps_avx512f(auVar338,*(undefined1 (*) [64])
                                                                 ((long)bottom_blob->data +
                                                                 (long)(iVar151 << 4) * 4 +
                                                                 (long)iVar150 *
                                                                 (long)bottom_blob->w *
                                                                 bottom_blob->elemsize +
                                                                 bottom_blob->cstep *
                                                                 bottom_blob->elemsize * uVar186),
                                                       *(undefined1 (*) [64])
                                                        ((long)pvVar172 + lVar162));
                      }
                      iVar149 = iVar149 + iVar168;
                    }
                  }
                  pvVar172 = (void *)((long)pvVar172 + (long)(int)uVar161 * 0x40);
                }
                pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar161 * uVar165 * 0x10) * 4);
              }
              auVar247 = vextractf64x4_avx512f(auVar338,1);
              fVar358 = auVar338._4_4_ + auVar247._4_4_;
              auVar192._0_4_ = auVar338._0_4_ + auVar247._0_4_ + auVar338._16_4_ + auVar247._16_4_;
              auVar192._4_4_ = fVar358 + fVar358;
              auVar192._8_4_ = auVar338._8_4_ + auVar247._8_4_ + auVar338._24_4_ + auVar247._24_4_;
              auVar192._12_4_ =
                   auVar338._12_4_ + auVar247._12_4_ + auVar338._28_4_ + auVar247._28_4_;
              auVar191 = vshufpd_avx(auVar192,auVar192,1);
              auVar193._0_4_ = auVar191._0_4_ + auVar192._0_4_;
              auVar193._4_4_ = auVar191._4_4_ + auVar192._4_4_;
              auVar193._8_4_ = auVar191._8_4_ + auVar192._8_4_;
              auVar193._12_4_ = auVar191._12_4_ + auVar192._12_4_;
              auVar191 = vmovshdup_avx(auVar193);
              fVar339 = auVar191._0_4_ + fVar339 + auVar193._0_4_;
              auVar191 = ZEXT416((uint)fVar339);
              fVar358 = fVar339;
              if (iVar166 - 1U < 6) {
                switch(iVar166) {
                case 1:
                  auVar191 = vmaxss_avx(ZEXT416((uint)fVar339),ZEXT416(0));
                  fVar358 = auVar191._0_4_;
                  break;
                case 2:
                  uVar18 = vcmpss_avx512f(ZEXT416((uint)fVar339),ZEXT416(0),0xe);
                  bVar16 = (bool)((byte)uVar18 & 1);
                  fVar358 = (float)((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * (int)*pfVar176) *
                            fVar339;
                  break;
                case 3:
                  auVar191 = vmaxss_avx(auVar191,ZEXT416((uint)*pfVar176));
                  fVar358 = auVar191._0_4_;
                  if (pfVar176[1] < auVar191._0_4_) {
                    fVar358 = pfVar176[1];
                  }
                  break;
                case 4:
                  auVar191 = vminss_avx(auVar191,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar192 = vxorps_avx512vl(auVar191,auVar28);
                  uVar18 = vcmpss_avx512f(auVar191,ZEXT416(0xc2b0c0a5),1);
                  bVar16 = (bool)((byte)uVar18 & 1);
                  fVar339 = expf((float)((uint)bVar16 * 0x42b0c0a5 + (uint)!bVar16 * auVar192._0_4_)
                                );
                  fVar358 = 1.0 / (fVar339 + 1.0);
                  break;
                case 5:
                  fVar358 = expf(fVar339);
                  fVar358 = logf(fVar358 + 1.0);
                  fVar358 = tanhf(fVar358);
                  fVar358 = fVar358 * fVar339;
                  break;
                case 6:
                  fVar4 = *pfVar176;
                  auVar27._8_4_ = 0x80000000;
                  auVar27._0_8_ = 0x8000000080000000;
                  auVar27._12_4_ = 0x80000000;
                  auVar192 = vxorps_avx512vl(ZEXT416((uint)pfVar176[1]),auVar27);
                  fVar365 = auVar192._0_4_ / fVar4;
                  fVar358 = 0.0;
                  if ((fVar365 <= fVar339) && (fVar358 = fVar339, fVar339 <= fVar365 + 1.0 / fVar4))
                  {
                    auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar191,
                                               ZEXT416((uint)pfVar176[1]));
                    fVar358 = auVar191._0_4_ * fVar339;
                  }
                }
              }
              *(float *)&local_268->_vptr_Allocator = fVar358;
              local_268 = (Allocator *)((long)&local_268->_vptr_Allocator + 4);
              iVar147 = iVar147 + 1;
            }
          }
        }
      }
      if ((iVar170 == 8) && (uVar159 == 8)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar173 = 0;
        uVar174 = 0;
        if (0 < (int)uVar161) {
          uVar174 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar173;
        }
        auVar355._8_4_ = 0x42b0c0a5;
        auVar355._0_8_ = 0x42b0c0a542b0c0a5;
        auVar355._12_4_ = 0x42b0c0a5;
        auVar355._16_4_ = 0x42b0c0a5;
        auVar355._20_4_ = 0x42b0c0a5;
        auVar355._24_4_ = 0x42b0c0a5;
        auVar355._28_4_ = 0x42b0c0a5;
        auVar362._8_4_ = 0xc2b0c0a5;
        auVar362._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar362._12_4_ = 0xc2b0c0a5;
        auVar362._16_4_ = 0xc2b0c0a5;
        auVar362._20_4_ = 0xc2b0c0a5;
        auVar362._24_4_ = 0xc2b0c0a5;
        auVar362._28_4_ = 0xc2b0c0a5;
        auVar369._8_4_ = 0x3f000000;
        auVar369._0_8_ = 0x3f0000003f000000;
        auVar369._12_4_ = 0x3f000000;
        auVar369._16_4_ = 0x3f000000;
        auVar369._20_4_ = 0x3f000000;
        auVar369._24_4_ = 0x3f000000;
        auVar369._28_4_ = 0x3f000000;
        auVar375._8_4_ = 0x3fb8aa3b;
        auVar375._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar375._12_4_ = 0x3fb8aa3b;
        auVar375._16_4_ = 0x3fb8aa3b;
        auVar375._20_4_ = 0x3fb8aa3b;
        auVar375._24_4_ = 0x3fb8aa3b;
        auVar375._28_4_ = 0x3fb8aa3b;
        auVar381._8_4_ = 0x3f800000;
        auVar381._0_8_ = 0x3f8000003f800000;
        auVar381._12_4_ = 0x3f800000;
        auVar381._16_4_ = 0x3f800000;
        auVar381._20_4_ = 0x3f800000;
        auVar381._24_4_ = 0x3f800000;
        auVar381._28_4_ = 0x3f800000;
        auVar387._8_4_ = 0x3f318000;
        auVar387._0_8_ = 0x3f3180003f318000;
        auVar387._12_4_ = 0x3f318000;
        auVar387._16_4_ = 0x3f318000;
        auVar387._20_4_ = 0x3f318000;
        auVar387._24_4_ = 0x3f318000;
        auVar387._28_4_ = 0x3f318000;
        auVar247 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar456._8_4_ = 0x3ab743ce;
        auVar456._0_8_ = 0x3ab743ce3ab743ce;
        auVar456._12_4_ = 0x3ab743ce;
        auVar456._16_4_ = 0x3ab743ce;
        auVar456._20_4_ = 0x3ab743ce;
        auVar456._24_4_ = 0x3ab743ce;
        auVar456._28_4_ = 0x3ab743ce;
        auVar462._8_4_ = 0x3c088908;
        auVar462._0_8_ = 0x3c0889083c088908;
        auVar462._12_4_ = 0x3c088908;
        auVar462._16_4_ = 0x3c088908;
        auVar462._20_4_ = 0x3c088908;
        auVar462._24_4_ = 0x3c088908;
        auVar462._28_4_ = 0x3c088908;
        auVar468._8_4_ = 0x3d2aa9c1;
        auVar468._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar468._12_4_ = 0x3d2aa9c1;
        auVar468._16_4_ = 0x3d2aa9c1;
        auVar468._20_4_ = 0x3d2aa9c1;
        auVar468._24_4_ = 0x3d2aa9c1;
        auVar468._28_4_ = 0x3d2aa9c1;
        auVar474._8_4_ = 0x3e2aaaaa;
        auVar474._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar474._12_4_ = 0x3e2aaaaa;
        auVar474._16_4_ = 0x3e2aaaaa;
        auVar474._20_4_ = 0x3e2aaaaa;
        auVar474._24_4_ = 0x3e2aaaaa;
        auVar474._28_4_ = 0x3e2aaaaa;
        auVar480._8_4_ = 0x3f800000;
        auVar480._0_8_ = 0x3f8000003f800000;
        auVar480._12_4_ = 0x3f800000;
        auVar480._16_4_ = 0x3f800000;
        auVar480._20_4_ = 0x3f800000;
        auVar480._24_4_ = 0x3f800000;
        auVar480._28_4_ = 0x3f800000;
        auVar486._8_4_ = 0xb95e8083;
        auVar486._0_8_ = 0xb95e8083b95e8083;
        auVar486._12_4_ = 0xb95e8083;
        auVar486._16_4_ = 0xb95e8083;
        auVar486._20_4_ = 0xb95e8083;
        auVar486._24_4_ = 0xb95e8083;
        auVar486._28_4_ = 0xb95e8083;
        auVar248 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar268 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar269 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar270 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar271 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar272 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar274 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar191 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar191);
        auVar275 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar173 != uVar188; uVar173 = uVar173 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar173 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar338 = ZEXT3264(*(undefined1 (*) [32])(lVar157 + uVar173 * 0x20));
              }
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar173 * (this->weight_data_tm).elemsize +
                        0xe0;
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                lVar180 = lVar162;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    lVar127 = (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar183;
                    iVar147 = iVar146;
                    for (lVar171 = 0; uVar174 * 0x100 != lVar171; lVar171 = lVar171 + 0x100) {
                      if (((-1 < iVar147) && (iVar149 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar149 < iVar153)) {
                        lVar155 = (long)(iVar149 << 3);
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127);
                        auVar414._4_4_ = uVar340;
                        auVar414._0_4_ = uVar340;
                        auVar414._8_4_ = uVar340;
                        auVar414._12_4_ = uVar340;
                        auVar414._16_4_ = uVar340;
                        auVar414._20_4_ = uVar340;
                        auVar414._24_4_ = uVar340;
                        auVar414._28_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 4);
                        auVar445._4_4_ = uVar340;
                        auVar445._0_4_ = uVar340;
                        auVar445._8_4_ = uVar340;
                        auVar445._12_4_ = uVar340;
                        auVar445._16_4_ = uVar340;
                        auVar445._20_4_ = uVar340;
                        auVar445._24_4_ = uVar340;
                        auVar445._28_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 8);
                        auVar514._4_4_ = uVar340;
                        auVar514._0_4_ = uVar340;
                        auVar514._8_4_ = uVar340;
                        auVar514._12_4_ = uVar340;
                        auVar514._16_4_ = uVar340;
                        auVar514._20_4_ = uVar340;
                        auVar514._24_4_ = uVar340;
                        auVar514._28_4_ = uVar340;
                        auVar276 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar277 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x10)));
                        auVar278 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x14)));
                        auVar279 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x18)));
                        auVar249 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x1c)));
                        auVar192 = vfmadd231ps_fma(auVar338._0_32_,auVar414,
                                                   *(undefined1 (*) [32])(lVar180 + -0xe0 + lVar171)
                                                  );
                        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar445,
                                                   *(undefined1 (*) [32])(lVar180 + -0xc0 + lVar171)
                                                  );
                        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar514,
                                                   *(undefined1 (*) [32])(lVar180 + -0xa0 + lVar171)
                                                  );
                        auVar276 = vfmadd231ps_avx512vl
                                             (ZEXT1632(auVar192),auVar276,
                                              *(undefined1 (*) [32])(lVar180 + -0x80 + lVar171));
                        auVar276 = vfmadd231ps_avx512vl
                                             (auVar276,auVar277,
                                              *(undefined1 (*) [32])(lVar180 + -0x60 + lVar171));
                        auVar276 = vfmadd231ps_avx512vl
                                             (auVar276,auVar278,
                                              *(undefined1 (*) [32])(lVar180 + -0x40 + lVar171));
                        auVar276 = vfmadd231ps_avx512vl
                                             (auVar276,auVar279,
                                              *(undefined1 (*) [32])(lVar180 + -0x20 + lVar171));
                        auVar276 = vfmadd231ps_avx512vl
                                             (auVar276,auVar249,
                                              *(undefined1 (*) [32])(lVar180 + lVar171));
                        auVar338 = ZEXT3264(auVar276);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x100;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x40) * 4;
              }
              auVar276 = auVar338._0_32_;
              auVar280 = auVar276;
              if (iVar152 - 1U < 6) {
                auVar280 = vmaxps_avx512vl(auVar276,ZEXT1632(auVar191));
                switch(iVar152) {
                case 2:
                  auVar276 = vminps_avx512vl(auVar276,ZEXT1632(auVar191));
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar83._4_4_ = uVar340;
                  auVar83._0_4_ = uVar340;
                  auVar83._8_4_ = uVar340;
                  auVar83._12_4_ = uVar340;
                  auVar83._16_4_ = uVar340;
                  auVar83._20_4_ = uVar340;
                  auVar83._24_4_ = uVar340;
                  auVar83._28_4_ = uVar340;
                  auVar280 = vfmadd231ps_avx512vl(auVar280,auVar276,auVar83);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar81._4_4_ = uVar340;
                  auVar81._0_4_ = uVar340;
                  auVar81._8_4_ = uVar340;
                  auVar81._12_4_ = uVar340;
                  auVar81._16_4_ = uVar340;
                  auVar81._20_4_ = uVar340;
                  auVar81._24_4_ = uVar340;
                  auVar81._28_4_ = uVar340;
                  auVar276 = vmaxps_avx512vl(auVar276,auVar81);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar82._4_4_ = uVar340;
                  auVar82._0_4_ = uVar340;
                  auVar82._8_4_ = uVar340;
                  auVar82._12_4_ = uVar340;
                  auVar82._16_4_ = uVar340;
                  auVar82._20_4_ = uVar340;
                  auVar82._24_4_ = uVar340;
                  auVar82._28_4_ = uVar340;
                  auVar280 = vminps_avx512vl(auVar276,auVar82);
                  break;
                case 4:
                  auVar79._8_4_ = 0x80000000;
                  auVar79._0_8_ = 0x8000000080000000;
                  auVar79._12_4_ = 0x80000000;
                  auVar79._16_4_ = 0x80000000;
                  auVar79._20_4_ = 0x80000000;
                  auVar79._24_4_ = 0x80000000;
                  auVar79._28_4_ = 0x80000000;
                  auVar276 = vxorps_avx512vl(auVar276,auVar79);
                  auVar276 = vminps_avx(auVar276,auVar355);
                  auVar276 = vmaxps_avx(auVar276,auVar362);
                  auVar192 = vfmadd231ps_fma(auVar369,auVar276,auVar375);
                  auVar277 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar277,1);
                  auVar278 = vsubps_avx512vl(auVar277,auVar381);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar286._0_4_ =
                       (float)((uint)bVar16 * auVar278._0_4_ | (uint)!bVar16 * auVar277._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar286._4_4_ =
                       (float)((uint)bVar16 * auVar278._4_4_ | (uint)!bVar16 * auVar277._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar286._8_4_ =
                       (float)((uint)bVar16 * auVar278._8_4_ | (uint)!bVar16 * auVar277._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar286._12_4_ =
                       (float)((uint)bVar16 * auVar278._12_4_ | (uint)!bVar16 * auVar277._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar286._16_4_ =
                       (float)((uint)bVar16 * auVar278._16_4_ | (uint)!bVar16 * auVar277._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar286._20_4_ =
                       (float)((uint)bVar16 * auVar278._20_4_ | (uint)!bVar16 * auVar277._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar286._24_4_ =
                       (float)((uint)bVar16 * auVar278._24_4_ | (uint)!bVar16 * auVar277._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar286._28_4_ =
                       (float)((uint)bVar16 * auVar278._28_4_ | (uint)!bVar16 * auVar277._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar276,auVar286,auVar387);
                  auVar80._8_4_ = 0x395e8083;
                  auVar80._0_8_ = 0x395e8083395e8083;
                  auVar80._12_4_ = 0x395e8083;
                  auVar80._16_4_ = 0x395e8083;
                  auVar80._20_4_ = 0x395e8083;
                  auVar80._24_4_ = 0x395e8083;
                  auVar80._28_4_ = 0x395e8083;
                  auVar276 = vfmsub231ps_avx512vl(ZEXT1632(auVar192),auVar286,auVar80);
                  auVar415._0_4_ = auVar276._0_4_ * auVar276._0_4_;
                  auVar415._4_4_ = auVar276._4_4_ * auVar276._4_4_;
                  auVar415._8_4_ = auVar276._8_4_ * auVar276._8_4_;
                  auVar415._12_4_ = auVar276._12_4_ * auVar276._12_4_;
                  auVar415._16_4_ = auVar276._16_4_ * auVar276._16_4_;
                  auVar415._20_4_ = auVar276._20_4_ * auVar276._20_4_;
                  auVar415._24_4_ = auVar276._24_4_ * auVar276._24_4_;
                  auVar415._28_4_ = 0;
                  auVar192 = vfmadd213ps_fma(auVar247,auVar276,auVar456);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar276,auVar462);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar276,auVar468);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar276,auVar474);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar276,auVar369);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar415,auVar276);
                  auVar346._0_4_ = auVar192._0_4_ + 1.0;
                  auVar346._4_4_ = auVar192._4_4_ + 1.0;
                  auVar346._8_4_ = auVar192._8_4_ + 1.0;
                  auVar346._12_4_ = auVar192._12_4_ + 1.0;
                  auVar346._16_4_ = 0x3f800000;
                  auVar346._20_4_ = 0x3f800000;
                  auVar346._24_4_ = 0x3f800000;
                  auVar346._28_4_ = 0x3f800000;
                  auVar416._0_4_ = (int)auVar286._0_4_;
                  auVar416._4_4_ = (int)auVar286._4_4_;
                  auVar416._8_4_ = (int)auVar286._8_4_;
                  auVar416._12_4_ = (int)auVar286._12_4_;
                  auVar416._16_4_ = (int)auVar286._16_4_;
                  auVar416._20_4_ = (int)auVar286._20_4_;
                  auVar416._24_4_ = (int)auVar286._24_4_;
                  auVar416._28_4_ = (int)auVar286._28_4_;
                  auVar276 = vpslld_avx2(auVar416,0x17);
                  auVar276 = vpaddd_avx2(auVar480,auVar276);
                  auVar192 = vfmadd213ps_fma(auVar276,auVar346,auVar381);
                  auVar276 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar276,auVar381);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar276,auVar276);
                  auVar280 = ZEXT1632(auVar192);
                  break;
                case 5:
                  auVar276 = vminps_avx(auVar276,auVar355);
                  auVar276 = vmaxps_avx(auVar276,auVar362);
                  auVar192 = vfmadd213ps_fma(auVar375,auVar276,auVar369);
                  auVar277 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar277,1);
                  auVar278 = vsubps_avx512vl(auVar277,auVar381);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar281._0_4_ =
                       (float)((uint)bVar16 * auVar278._0_4_ | (uint)!bVar16 * auVar277._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar281._4_4_ =
                       (float)((uint)bVar16 * auVar278._4_4_ | (uint)!bVar16 * auVar277._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar281._8_4_ =
                       (float)((uint)bVar16 * auVar278._8_4_ | (uint)!bVar16 * auVar277._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar281._12_4_ =
                       (float)((uint)bVar16 * auVar278._12_4_ | (uint)!bVar16 * auVar277._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar281._16_4_ =
                       (float)((uint)bVar16 * auVar278._16_4_ | (uint)!bVar16 * auVar277._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar281._20_4_ =
                       (float)((uint)bVar16 * auVar278._20_4_ | (uint)!bVar16 * auVar277._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar281._24_4_ =
                       (float)((uint)bVar16 * auVar278._24_4_ | (uint)!bVar16 * auVar277._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar281._28_4_ =
                       (float)((uint)bVar16 * auVar278._28_4_ | (uint)!bVar16 * auVar277._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar276,auVar281,auVar387);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar281,auVar486);
                  auVar277 = ZEXT1632(auVar192);
                  auVar276 = vfmadd213ps_avx512vl(auVar247,auVar277,auVar456);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar462);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar468);
                  auVar277 = ZEXT1632(auVar192);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar474);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar369);
                  auVar276 = vfmadd213ps_avx512vl
                                       (auVar276,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar277
                                       );
                  auVar277 = vaddps_avx512vl(auVar276,auVar381);
                  auVar446._0_4_ = (int)auVar281._0_4_;
                  auVar446._4_4_ = (int)auVar281._4_4_;
                  auVar446._8_4_ = (int)auVar281._8_4_;
                  auVar446._12_4_ = (int)auVar281._12_4_;
                  auVar446._16_4_ = (int)auVar281._16_4_;
                  auVar446._20_4_ = (int)auVar281._20_4_;
                  auVar446._24_4_ = (int)auVar281._24_4_;
                  auVar446._28_4_ = (int)auVar281._28_4_;
                  auVar276 = vpslld_avx2(auVar446,0x17);
                  auVar276 = vpaddd_avx2(auVar276,auVar480);
                  auVar192 = vfmadd213ps_fma(auVar276,auVar277,auVar381);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),ZEXT1632(auVar191),2);
                  auVar73._8_4_ = 0x800000;
                  auVar73._0_8_ = 0x80000000800000;
                  auVar73._12_4_ = 0x800000;
                  auVar73._16_4_ = 0x800000;
                  auVar73._20_4_ = 0x800000;
                  auVar73._24_4_ = 0x800000;
                  auVar73._28_4_ = 0x800000;
                  auVar276 = vmaxps_avx512vl(ZEXT1632(auVar192),auVar73);
                  auVar279 = vpsrld_avx2(auVar276,0x17);
                  auVar515._8_4_ = 0x807fffff;
                  auVar515._0_8_ = 0x807fffff807fffff;
                  auVar515._12_4_ = 0x807fffff;
                  auVar515._16_4_ = 0x807fffff;
                  auVar515._20_4_ = 0x807fffff;
                  auVar515._24_4_ = 0x807fffff;
                  auVar515._28_4_ = 0x807fffff;
                  auVar74._8_4_ = 0x3f000000;
                  auVar74._0_8_ = 0x3f0000003f000000;
                  auVar74._12_4_ = 0x3f000000;
                  auVar74._16_4_ = 0x3f000000;
                  auVar74._20_4_ = 0x3f000000;
                  auVar74._24_4_ = 0x3f000000;
                  auVar74._28_4_ = 0x3f000000;
                  auVar276 = vpternlogd_avx512vl(auVar276,auVar515,auVar74,0xea);
                  auVar75._8_4_ = 0x3f3504f3;
                  auVar75._0_8_ = 0x3f3504f33f3504f3;
                  auVar75._12_4_ = 0x3f3504f3;
                  auVar75._16_4_ = 0x3f3504f3;
                  auVar75._20_4_ = 0x3f3504f3;
                  auVar75._24_4_ = 0x3f3504f3;
                  auVar75._28_4_ = 0x3f3504f3;
                  uVar184 = vcmpps_avx512vl(auVar276,auVar75,1);
                  auVar277 = vaddps_avx512vl(auVar276,auVar248);
                  auVar278 = vaddps_avx512vl(auVar277,auVar276);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar282._0_4_ =
                       (float)((uint)bVar16 * auVar278._0_4_ | (uint)!bVar16 * auVar277._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar282._4_4_ =
                       (float)((uint)bVar16 * auVar278._4_4_ | (uint)!bVar16 * auVar277._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar282._8_4_ =
                       (float)((uint)bVar16 * auVar278._8_4_ | (uint)!bVar16 * auVar277._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar282._12_4_ =
                       (float)((uint)bVar16 * auVar278._12_4_ | (uint)!bVar16 * auVar277._12_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar282._16_4_ =
                       (float)((uint)bVar16 * auVar278._16_4_ | (uint)!bVar16 * auVar277._16_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar282._20_4_ =
                       (float)((uint)bVar16 * auVar278._20_4_ | (uint)!bVar16 * auVar277._20_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar282._24_4_ =
                       (float)((uint)bVar16 * auVar278._24_4_ | (uint)!bVar16 * auVar277._24_4_);
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar282._28_4_ = (uint)bVar16 * auVar278._28_4_ | (uint)!bVar16 * auVar277._28_4_
                  ;
                  auVar114._4_4_ = auVar282._4_4_ * auVar282._4_4_;
                  auVar114._0_4_ = auVar282._0_4_ * auVar282._0_4_;
                  auVar114._8_4_ = auVar282._8_4_ * auVar282._8_4_;
                  auVar114._12_4_ = auVar282._12_4_ * auVar282._12_4_;
                  auVar114._16_4_ = auVar282._16_4_ * auVar282._16_4_;
                  auVar114._20_4_ = auVar282._20_4_ * auVar282._20_4_;
                  auVar114._24_4_ = auVar282._24_4_ * auVar282._24_4_;
                  auVar114._28_4_ = auVar276._28_4_;
                  auVar76._8_4_ = 0xbdebd1b8;
                  auVar76._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar76._12_4_ = 0xbdebd1b8;
                  auVar76._16_4_ = 0xbdebd1b8;
                  auVar76._20_4_ = 0xbdebd1b8;
                  auVar76._24_4_ = 0xbdebd1b8;
                  auVar76._28_4_ = 0xbdebd1b8;
                  auVar276 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar76);
                  auVar77._8_4_ = 0x3def251a;
                  auVar77._0_8_ = 0x3def251a3def251a;
                  auVar77._12_4_ = 0x3def251a;
                  auVar77._16_4_ = 0x3def251a;
                  auVar77._20_4_ = 0x3def251a;
                  auVar77._24_4_ = 0x3def251a;
                  auVar77._28_4_ = 0x3def251a;
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar282,auVar77);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar282,auVar269);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar282,auVar270);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar282,auVar271);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar282,auVar272);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar282,auVar273);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar282,auVar274);
                  auVar277 = vmulps_avx512vl(auVar114,auVar282);
                  auVar277 = vmulps_avx512vl(auVar277,auVar276);
                  auVar78._8_4_ = 0xffffff82;
                  auVar78._0_8_ = 0xffffff82ffffff82;
                  auVar78._12_4_ = 0xffffff82;
                  auVar78._16_4_ = 0xffffff82;
                  auVar78._20_4_ = 0xffffff82;
                  auVar78._24_4_ = 0xffffff82;
                  auVar78._28_4_ = 0xffffff82;
                  auVar276 = vpaddd_avx512vl(auVar279,auVar78);
                  auVar276 = vcvtdq2ps_avx(auVar276);
                  auVar278 = vsubps_avx512vl(auVar276,auVar381);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar283._0_4_ = (uint)bVar16 * auVar278._0_4_ | (uint)!bVar16 * auVar276._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar283._4_4_ = (uint)bVar16 * auVar278._4_4_ | (uint)!bVar16 * auVar276._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar283._8_4_ = (uint)bVar16 * auVar278._8_4_ | (uint)!bVar16 * auVar276._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar283._12_4_ = (uint)bVar16 * auVar278._12_4_ | (uint)!bVar16 * auVar276._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar283._16_4_ = (uint)bVar16 * auVar278._16_4_ | (uint)!bVar16 * auVar276._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar283._20_4_ = (uint)bVar16 * auVar278._20_4_ | (uint)!bVar16 * auVar276._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar283._24_4_ = (uint)bVar16 * auVar278._24_4_ | (uint)!bVar16 * auVar276._24_4_
                  ;
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar283._28_4_ = (uint)bVar16 * auVar278._28_4_ | (uint)!bVar16 * auVar276._28_4_
                  ;
                  auVar276 = vfmadd231ps_avx512vl(auVar277,auVar283,auVar486);
                  auVar276 = vfmsub231ps_avx512vl(auVar276,auVar369,auVar114);
                  auVar276 = vsubps_avx512vl(auVar276,auVar282);
                  auVar192 = vfmsub231ps_fma(auVar276,auVar387,auVar283);
                  auVar276 = vmulps_avx512vl(ZEXT1632(auVar192),auVar275);
                  auVar277 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar284._0_4_ = (uint)bVar16 * auVar277._0_4_ | (uint)!bVar16 * auVar276._0_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar284._4_4_ = (uint)bVar16 * auVar277._4_4_ | (uint)!bVar16 * auVar276._4_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar284._8_4_ = (uint)bVar16 * auVar277._8_4_ | (uint)!bVar16 * auVar276._8_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar284._12_4_ = (uint)bVar16 * auVar277._12_4_ | (uint)!bVar16 * auVar276._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar284._16_4_ = (uint)bVar16 * auVar277._16_4_ | (uint)!bVar16 * auVar276._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar284._20_4_ = (uint)bVar16 * auVar277._20_4_ | (uint)!bVar16 * auVar276._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar284._24_4_ = (uint)bVar16 * auVar277._24_4_ | (uint)!bVar16 * auVar276._24_4_
                  ;
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar284._28_4_ = (uint)bVar16 * auVar277._28_4_ | (uint)!bVar16 * auVar276._28_4_
                  ;
                  auVar276 = vminps_avx(auVar284,auVar355);
                  auVar276 = vmaxps_avx(auVar276,auVar362);
                  auVar192 = vfmadd213ps_fma(auVar375,auVar276,auVar369);
                  auVar277 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar277,1);
                  auVar278 = vsubps_avx512vl(auVar277,auVar381);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar285._0_4_ =
                       (float)((uint)bVar16 * auVar278._0_4_ | (uint)!bVar16 * auVar277._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar285._4_4_ =
                       (float)((uint)bVar16 * auVar278._4_4_ | (uint)!bVar16 * auVar277._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar285._8_4_ =
                       (float)((uint)bVar16 * auVar278._8_4_ | (uint)!bVar16 * auVar277._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar285._12_4_ =
                       (float)((uint)bVar16 * auVar278._12_4_ | (uint)!bVar16 * auVar277._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar285._16_4_ =
                       (float)((uint)bVar16 * auVar278._16_4_ | (uint)!bVar16 * auVar277._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar285._20_4_ =
                       (float)((uint)bVar16 * auVar278._20_4_ | (uint)!bVar16 * auVar277._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar285._24_4_ =
                       (float)((uint)bVar16 * auVar278._24_4_ | (uint)!bVar16 * auVar277._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar285._28_4_ =
                       (float)((uint)bVar16 * auVar278._28_4_ | (uint)!bVar16 * auVar277._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar276,auVar285,auVar387);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar285,auVar486);
                  auVar277 = ZEXT1632(auVar192);
                  auVar276 = vfmadd213ps_avx512vl(auVar247,auVar277,auVar456);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar462);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar468);
                  auVar277 = ZEXT1632(auVar192);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar474);
                  auVar276 = vfmadd213ps_avx512vl(auVar276,auVar277,auVar369);
                  auVar276 = vfmadd213ps_avx512vl
                                       (auVar276,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar277
                                       );
                  auVar277 = vaddps_avx512vl(auVar276,auVar381);
                  auVar447._0_4_ = (int)auVar285._0_4_;
                  auVar447._4_4_ = (int)auVar285._4_4_;
                  auVar447._8_4_ = (int)auVar285._8_4_;
                  auVar447._12_4_ = (int)auVar285._12_4_;
                  auVar447._16_4_ = (int)auVar285._16_4_;
                  auVar447._20_4_ = (int)auVar285._20_4_;
                  auVar447._24_4_ = (int)auVar285._24_4_;
                  auVar447._28_4_ = (int)auVar285._28_4_;
                  auVar276 = vpslld_avx2(auVar447,0x17);
                  auVar276 = vpaddd_avx2(auVar276,auVar480);
                  auVar192 = vfmadd213ps_fma(auVar276,auVar277,auVar381);
                  auVar276 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar276,auVar381);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar276,auVar276);
                  auVar277 = vfnmadd213ps_avx512vl(ZEXT1632(auVar192),auVar275,auVar248);
                  auVar280._4_4_ = auVar277._4_4_ * auVar338._4_4_;
                  auVar280._0_4_ = auVar277._0_4_ * auVar338._0_4_;
                  auVar280._8_4_ = auVar277._8_4_ * auVar338._8_4_;
                  auVar280._12_4_ = auVar277._12_4_ * auVar338._12_4_;
                  auVar280._16_4_ = auVar277._16_4_ * auVar338._16_4_;
                  auVar280._20_4_ = auVar277._20_4_ * auVar338._20_4_;
                  auVar280._24_4_ = auVar277._24_4_ * auVar338._24_4_;
                  auVar280._28_4_ = auVar276._28_4_;
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar417._4_4_ = uVar340;
                  auVar417._0_4_ = uVar340;
                  auVar417._8_4_ = uVar340;
                  auVar417._12_4_ = uVar340;
                  auVar417._16_4_ = uVar340;
                  auVar417._20_4_ = uVar340;
                  auVar417._24_4_ = uVar340;
                  auVar417._28_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar72._4_4_ = uVar340;
                  auVar72._0_4_ = uVar340;
                  auVar72._8_4_ = uVar340;
                  auVar72._12_4_ = uVar340;
                  auVar72._16_4_ = uVar340;
                  auVar72._20_4_ = uVar340;
                  auVar72._24_4_ = uVar340;
                  auVar72._28_4_ = uVar340;
                  auVar276 = vfmadd213ps_avx512vl(auVar417,auVar276,auVar72);
                  auVar276 = vmaxps_avx512vl(auVar276,ZEXT1632(auVar191));
                  auVar276 = vminps_avx(auVar276,auVar381);
                  auVar280._4_4_ = auVar276._4_4_ * auVar338._4_4_;
                  auVar280._0_4_ = auVar276._0_4_ * auVar338._0_4_;
                  auVar280._8_4_ = auVar276._8_4_ * auVar338._8_4_;
                  auVar280._12_4_ = auVar276._12_4_ * auVar338._12_4_;
                  auVar280._16_4_ = auVar276._16_4_ * auVar338._16_4_;
                  auVar280._20_4_ = auVar276._20_4_ * auVar338._20_4_;
                  auVar280._24_4_ = auVar276._24_4_ * auVar338._24_4_;
                  auVar280._28_4_ = auVar276._28_4_;
                }
              }
              *(undefined1 (*) [32])local_268 = auVar280;
              local_268 = local_268 + 4;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      if ((iVar170 == 4) && (uVar159 == 8)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar173 = 0;
        uVar174 = 0;
        if (0 < (int)uVar161) {
          uVar174 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar173;
        }
        auVar356._8_4_ = 0x42b0c0a5;
        auVar356._0_8_ = 0x42b0c0a542b0c0a5;
        auVar356._12_4_ = 0x42b0c0a5;
        auVar356._16_4_ = 0x42b0c0a5;
        auVar356._20_4_ = 0x42b0c0a5;
        auVar356._24_4_ = 0x42b0c0a5;
        auVar356._28_4_ = 0x42b0c0a5;
        auVar363._8_4_ = 0xc2b0c0a5;
        auVar363._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar363._12_4_ = 0xc2b0c0a5;
        auVar363._16_4_ = 0xc2b0c0a5;
        auVar363._20_4_ = 0xc2b0c0a5;
        auVar363._24_4_ = 0xc2b0c0a5;
        auVar363._28_4_ = 0xc2b0c0a5;
        auVar370._8_4_ = 0x3f000000;
        auVar370._0_8_ = 0x3f0000003f000000;
        auVar370._12_4_ = 0x3f000000;
        auVar370._16_4_ = 0x3f000000;
        auVar370._20_4_ = 0x3f000000;
        auVar370._24_4_ = 0x3f000000;
        auVar370._28_4_ = 0x3f000000;
        auVar376._8_4_ = 0x3fb8aa3b;
        auVar376._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar376._12_4_ = 0x3fb8aa3b;
        auVar376._16_4_ = 0x3fb8aa3b;
        auVar376._20_4_ = 0x3fb8aa3b;
        auVar376._24_4_ = 0x3fb8aa3b;
        auVar376._28_4_ = 0x3fb8aa3b;
        auVar382._8_4_ = 0x3f800000;
        auVar382._0_8_ = 0x3f8000003f800000;
        auVar382._12_4_ = 0x3f800000;
        auVar382._16_4_ = 0x3f800000;
        auVar382._20_4_ = 0x3f800000;
        auVar382._24_4_ = 0x3f800000;
        auVar382._28_4_ = 0x3f800000;
        auVar388._8_4_ = 0x3f318000;
        auVar388._0_8_ = 0x3f3180003f318000;
        auVar388._12_4_ = 0x3f318000;
        auVar388._16_4_ = 0x3f318000;
        auVar388._20_4_ = 0x3f318000;
        auVar388._24_4_ = 0x3f318000;
        auVar388._28_4_ = 0x3f318000;
        auVar247 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar457._8_4_ = 0x3ab743ce;
        auVar457._0_8_ = 0x3ab743ce3ab743ce;
        auVar457._12_4_ = 0x3ab743ce;
        auVar457._16_4_ = 0x3ab743ce;
        auVar457._20_4_ = 0x3ab743ce;
        auVar457._24_4_ = 0x3ab743ce;
        auVar457._28_4_ = 0x3ab743ce;
        auVar463._8_4_ = 0x3c088908;
        auVar463._0_8_ = 0x3c0889083c088908;
        auVar463._12_4_ = 0x3c088908;
        auVar463._16_4_ = 0x3c088908;
        auVar463._20_4_ = 0x3c088908;
        auVar463._24_4_ = 0x3c088908;
        auVar463._28_4_ = 0x3c088908;
        auVar469._8_4_ = 0x3d2aa9c1;
        auVar469._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar469._12_4_ = 0x3d2aa9c1;
        auVar469._16_4_ = 0x3d2aa9c1;
        auVar469._20_4_ = 0x3d2aa9c1;
        auVar469._24_4_ = 0x3d2aa9c1;
        auVar469._28_4_ = 0x3d2aa9c1;
        auVar475._8_4_ = 0x3e2aaaaa;
        auVar475._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar475._12_4_ = 0x3e2aaaaa;
        auVar475._16_4_ = 0x3e2aaaaa;
        auVar475._20_4_ = 0x3e2aaaaa;
        auVar475._24_4_ = 0x3e2aaaaa;
        auVar475._28_4_ = 0x3e2aaaaa;
        auVar481._8_4_ = 0x3f800000;
        auVar481._0_8_ = 0x3f8000003f800000;
        auVar481._12_4_ = 0x3f800000;
        auVar481._16_4_ = 0x3f800000;
        auVar481._20_4_ = 0x3f800000;
        auVar481._24_4_ = 0x3f800000;
        auVar481._28_4_ = 0x3f800000;
        auVar487._8_4_ = 0xb95e8083;
        auVar487._0_8_ = 0xb95e8083b95e8083;
        auVar487._12_4_ = 0xb95e8083;
        auVar487._16_4_ = 0xb95e8083;
        auVar487._20_4_ = 0xb95e8083;
        auVar487._24_4_ = 0xb95e8083;
        auVar487._28_4_ = 0xb95e8083;
        auVar248 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar268 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar269 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar270 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar271 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar272 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar274 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar275 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar276 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar277 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar191 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar191);
        auVar278 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar173 != uVar188; uVar173 = uVar173 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar173 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar338 = ZEXT3264(*(undefined1 (*) [32])(lVar157 + uVar173 * 0x20));
              }
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar173 * (this->weight_data_tm).elemsize +
                        0x60;
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                lVar180 = lVar162;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    lVar127 = (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar183;
                    iVar147 = iVar146;
                    for (lVar171 = 0; uVar174 * 0x80 != lVar171; lVar171 = lVar171 + 0x80) {
                      if (((-1 < iVar147) && (iVar149 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar149 < iVar153)) {
                        lVar155 = (long)(iVar149 << 2);
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127);
                        auVar418._4_4_ = uVar340;
                        auVar418._0_4_ = uVar340;
                        auVar418._8_4_ = uVar340;
                        auVar418._12_4_ = uVar340;
                        auVar418._16_4_ = uVar340;
                        auVar418._20_4_ = uVar340;
                        auVar418._24_4_ = uVar340;
                        auVar418._28_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 4);
                        auVar448._4_4_ = uVar340;
                        auVar448._0_4_ = uVar340;
                        auVar448._8_4_ = uVar340;
                        auVar448._12_4_ = uVar340;
                        auVar448._16_4_ = uVar340;
                        auVar448._20_4_ = uVar340;
                        auVar448._24_4_ = uVar340;
                        auVar448._28_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 8);
                        auVar516._4_4_ = uVar340;
                        auVar516._0_4_ = uVar340;
                        auVar516._8_4_ = uVar340;
                        auVar516._12_4_ = uVar340;
                        auVar516._16_4_ = uVar340;
                        auVar516._20_4_ = uVar340;
                        auVar516._24_4_ = uVar340;
                        auVar516._28_4_ = uVar340;
                        auVar279 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar192 = vfmadd231ps_fma(auVar338._0_32_,auVar418,
                                                   *(undefined1 (*) [32])(lVar180 + -0x60 + lVar171)
                                                  );
                        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar448,
                                                   *(undefined1 (*) [32])(lVar180 + -0x40 + lVar171)
                                                  );
                        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar516,
                                                   *(undefined1 (*) [32])(lVar180 + -0x20 + lVar171)
                                                  );
                        auVar279 = vfmadd231ps_avx512vl
                                             (ZEXT1632(auVar192),auVar279,
                                              *(undefined1 (*) [32])(lVar180 + lVar171));
                        auVar338 = ZEXT3264(auVar279);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x80;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x20) * 4;
              }
              auVar279 = auVar338._0_32_;
              auVar287 = auVar279;
              if (iVar152 - 1U < 6) {
                auVar287 = vmaxps_avx512vl(auVar279,ZEXT1632(auVar191));
                switch(iVar152) {
                case 2:
                  auVar279 = vminps_avx512vl(auVar279,ZEXT1632(auVar191));
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar92._4_4_ = uVar340;
                  auVar92._0_4_ = uVar340;
                  auVar92._8_4_ = uVar340;
                  auVar92._12_4_ = uVar340;
                  auVar92._16_4_ = uVar340;
                  auVar92._20_4_ = uVar340;
                  auVar92._24_4_ = uVar340;
                  auVar92._28_4_ = uVar340;
                  auVar287 = vfmadd231ps_avx512vl(auVar287,auVar279,auVar92);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar90._4_4_ = uVar340;
                  auVar90._0_4_ = uVar340;
                  auVar90._8_4_ = uVar340;
                  auVar90._12_4_ = uVar340;
                  auVar90._16_4_ = uVar340;
                  auVar90._20_4_ = uVar340;
                  auVar90._24_4_ = uVar340;
                  auVar90._28_4_ = uVar340;
                  auVar279 = vmaxps_avx512vl(auVar279,auVar90);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar91._4_4_ = uVar340;
                  auVar91._0_4_ = uVar340;
                  auVar91._8_4_ = uVar340;
                  auVar91._12_4_ = uVar340;
                  auVar91._16_4_ = uVar340;
                  auVar91._20_4_ = uVar340;
                  auVar91._24_4_ = uVar340;
                  auVar91._28_4_ = uVar340;
                  auVar287 = vminps_avx512vl(auVar279,auVar91);
                  break;
                case 4:
                  auVar88._8_4_ = 0x80000000;
                  auVar88._0_8_ = 0x8000000080000000;
                  auVar88._12_4_ = 0x80000000;
                  auVar88._16_4_ = 0x80000000;
                  auVar88._20_4_ = 0x80000000;
                  auVar88._24_4_ = 0x80000000;
                  auVar88._28_4_ = 0x80000000;
                  auVar279 = vxorps_avx512vl(auVar279,auVar88);
                  auVar279 = vminps_avx(auVar279,auVar356);
                  auVar279 = vmaxps_avx(auVar279,auVar363);
                  auVar192 = vfmadd231ps_fma(auVar370,auVar279,auVar376);
                  auVar249 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar249,1);
                  auVar250 = vsubps_avx512vl(auVar249,auVar382);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar293._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar293._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar293._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar293._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar293._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar293._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar293._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar293._28_4_ =
                       (float)((uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar293,auVar388);
                  auVar89._8_4_ = 0x395e8083;
                  auVar89._0_8_ = 0x395e8083395e8083;
                  auVar89._12_4_ = 0x395e8083;
                  auVar89._16_4_ = 0x395e8083;
                  auVar89._20_4_ = 0x395e8083;
                  auVar89._24_4_ = 0x395e8083;
                  auVar89._28_4_ = 0x395e8083;
                  auVar279 = vfmsub231ps_avx512vl(ZEXT1632(auVar192),auVar293,auVar89);
                  auVar419._0_4_ = auVar279._0_4_ * auVar279._0_4_;
                  auVar419._4_4_ = auVar279._4_4_ * auVar279._4_4_;
                  auVar419._8_4_ = auVar279._8_4_ * auVar279._8_4_;
                  auVar419._12_4_ = auVar279._12_4_ * auVar279._12_4_;
                  auVar419._16_4_ = auVar279._16_4_ * auVar279._16_4_;
                  auVar419._20_4_ = auVar279._20_4_ * auVar279._20_4_;
                  auVar419._24_4_ = auVar279._24_4_ * auVar279._24_4_;
                  auVar419._28_4_ = 0;
                  auVar192 = vfmadd213ps_fma(auVar247,auVar279,auVar457);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar463);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar469);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar475);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar370);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar419,auVar279);
                  auVar347._0_4_ = auVar192._0_4_ + 1.0;
                  auVar347._4_4_ = auVar192._4_4_ + 1.0;
                  auVar347._8_4_ = auVar192._8_4_ + 1.0;
                  auVar347._12_4_ = auVar192._12_4_ + 1.0;
                  auVar347._16_4_ = 0x3f800000;
                  auVar347._20_4_ = 0x3f800000;
                  auVar347._24_4_ = 0x3f800000;
                  auVar347._28_4_ = 0x3f800000;
                  auVar420._0_4_ = (int)auVar293._0_4_;
                  auVar420._4_4_ = (int)auVar293._4_4_;
                  auVar420._8_4_ = (int)auVar293._8_4_;
                  auVar420._12_4_ = (int)auVar293._12_4_;
                  auVar420._16_4_ = (int)auVar293._16_4_;
                  auVar420._20_4_ = (int)auVar293._20_4_;
                  auVar420._24_4_ = (int)auVar293._24_4_;
                  auVar420._28_4_ = (int)auVar293._28_4_;
                  auVar279 = vpslld_avx2(auVar420,0x17);
                  auVar279 = vpaddd_avx2(auVar481,auVar279);
                  auVar192 = vfmadd213ps_fma(auVar279,auVar347,auVar382);
                  auVar279 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar279,auVar382);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar279,auVar279);
                  auVar287 = ZEXT1632(auVar192);
                  break;
                case 5:
                  auVar279 = vminps_avx(auVar279,auVar356);
                  auVar279 = vmaxps_avx(auVar279,auVar363);
                  auVar192 = vfmadd213ps_fma(auVar376,auVar279,auVar370);
                  auVar249 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar249,1);
                  auVar250 = vsubps_avx512vl(auVar249,auVar382);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar288._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar288._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar288._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar288._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar288._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar288._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar288._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar288._28_4_ =
                       (float)((uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar288,auVar388);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar288,auVar487);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar247,auVar249,auVar457);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar463);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar469);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar475);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar370);
                  auVar279 = vfmadd213ps_avx512vl
                                       (auVar279,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar249
                                       );
                  auVar249 = vaddps_avx512vl(auVar279,auVar382);
                  auVar449._0_4_ = (int)auVar288._0_4_;
                  auVar449._4_4_ = (int)auVar288._4_4_;
                  auVar449._8_4_ = (int)auVar288._8_4_;
                  auVar449._12_4_ = (int)auVar288._12_4_;
                  auVar449._16_4_ = (int)auVar288._16_4_;
                  auVar449._20_4_ = (int)auVar288._20_4_;
                  auVar449._24_4_ = (int)auVar288._24_4_;
                  auVar449._28_4_ = (int)auVar288._28_4_;
                  auVar279 = vpslld_avx2(auVar449,0x17);
                  auVar279 = vpaddd_avx2(auVar279,auVar481);
                  auVar192 = vfmadd213ps_fma(auVar279,auVar249,auVar382);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),ZEXT1632(auVar191),2);
                  auVar85._8_4_ = 0x800000;
                  auVar85._0_8_ = 0x80000000800000;
                  auVar85._12_4_ = 0x800000;
                  auVar85._16_4_ = 0x800000;
                  auVar85._20_4_ = 0x800000;
                  auVar85._24_4_ = 0x800000;
                  auVar85._28_4_ = 0x800000;
                  auVar279 = vmaxps_avx512vl(ZEXT1632(auVar192),auVar85);
                  auVar251 = vpsrld_avx2(auVar279,0x17);
                  auVar517._8_4_ = 0x807fffff;
                  auVar517._0_8_ = 0x807fffff807fffff;
                  auVar517._12_4_ = 0x807fffff;
                  auVar517._16_4_ = 0x807fffff;
                  auVar517._20_4_ = 0x807fffff;
                  auVar517._24_4_ = 0x807fffff;
                  auVar517._28_4_ = 0x807fffff;
                  auVar86._8_4_ = 0x3f000000;
                  auVar86._0_8_ = 0x3f0000003f000000;
                  auVar86._12_4_ = 0x3f000000;
                  auVar86._16_4_ = 0x3f000000;
                  auVar86._20_4_ = 0x3f000000;
                  auVar86._24_4_ = 0x3f000000;
                  auVar86._28_4_ = 0x3f000000;
                  auVar279 = vpternlogd_avx512vl(auVar279,auVar517,auVar86,0xea);
                  uVar184 = vcmpps_avx512vl(auVar279,auVar248,1);
                  auVar249 = vaddps_avx512vl(auVar279,auVar268);
                  auVar250 = vaddps_avx512vl(auVar249,auVar279);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar289._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar289._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar289._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar289._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar289._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar289._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar289._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar289._28_4_ = (uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_
                  ;
                  auVar115._4_4_ = auVar289._4_4_ * auVar289._4_4_;
                  auVar115._0_4_ = auVar289._0_4_ * auVar289._0_4_;
                  auVar115._8_4_ = auVar289._8_4_ * auVar289._8_4_;
                  auVar115._12_4_ = auVar289._12_4_ * auVar289._12_4_;
                  auVar115._16_4_ = auVar289._16_4_ * auVar289._16_4_;
                  auVar115._20_4_ = auVar289._20_4_ * auVar289._20_4_;
                  auVar115._24_4_ = auVar289._24_4_ * auVar289._24_4_;
                  auVar115._28_4_ = auVar279._28_4_;
                  auVar279 = vfmadd213ps_avx512vl(auVar269,auVar289,auVar270);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar289,auVar271);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar289,auVar272);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar289,auVar273);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar289,auVar274);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar289,auVar275);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar289,auVar276);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar289,auVar277);
                  auVar249 = vmulps_avx512vl(auVar115,auVar289);
                  auVar249 = vmulps_avx512vl(auVar249,auVar279);
                  auVar87._8_4_ = 0xffffff82;
                  auVar87._0_8_ = 0xffffff82ffffff82;
                  auVar87._12_4_ = 0xffffff82;
                  auVar87._16_4_ = 0xffffff82;
                  auVar87._20_4_ = 0xffffff82;
                  auVar87._24_4_ = 0xffffff82;
                  auVar87._28_4_ = 0xffffff82;
                  auVar279 = vpaddd_avx512vl(auVar251,auVar87);
                  auVar279 = vcvtdq2ps_avx(auVar279);
                  auVar250 = vsubps_avx512vl(auVar279,auVar382);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar290._0_4_ = (uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar279._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar290._4_4_ = (uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar279._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar290._8_4_ = (uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar279._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar290._12_4_ = (uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar279._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar290._16_4_ = (uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar279._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar290._20_4_ = (uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar279._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar290._24_4_ = (uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar279._24_4_
                  ;
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar290._28_4_ = (uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar279._28_4_
                  ;
                  auVar279 = vfmadd231ps_avx512vl(auVar249,auVar290,auVar487);
                  auVar279 = vfmsub231ps_avx512vl(auVar279,auVar370,auVar115);
                  auVar279 = vsubps_avx512vl(auVar279,auVar289);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar388,auVar290);
                  auVar279 = vmulps_avx512vl(ZEXT1632(auVar192),auVar278);
                  auVar249 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar291._0_4_ = (uint)bVar16 * auVar249._0_4_ | (uint)!bVar16 * auVar279._0_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar291._4_4_ = (uint)bVar16 * auVar249._4_4_ | (uint)!bVar16 * auVar279._4_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar291._8_4_ = (uint)bVar16 * auVar249._8_4_ | (uint)!bVar16 * auVar279._8_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar291._12_4_ = (uint)bVar16 * auVar249._12_4_ | (uint)!bVar16 * auVar279._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar291._16_4_ = (uint)bVar16 * auVar249._16_4_ | (uint)!bVar16 * auVar279._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar291._20_4_ = (uint)bVar16 * auVar249._20_4_ | (uint)!bVar16 * auVar279._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar291._24_4_ = (uint)bVar16 * auVar249._24_4_ | (uint)!bVar16 * auVar279._24_4_
                  ;
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar291._28_4_ = (uint)bVar16 * auVar249._28_4_ | (uint)!bVar16 * auVar279._28_4_
                  ;
                  auVar279 = vminps_avx(auVar291,auVar356);
                  auVar279 = vmaxps_avx(auVar279,auVar363);
                  auVar192 = vfmadd213ps_fma(auVar376,auVar279,auVar370);
                  auVar249 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar249,1);
                  auVar250 = vsubps_avx512vl(auVar249,auVar382);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar292._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar292._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar292._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar292._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar292._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar292._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar292._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar292._28_4_ =
                       (float)((uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar292,auVar388);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar292,auVar487);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar247,auVar249,auVar457);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar463);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar469);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar475);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar370);
                  auVar279 = vfmadd213ps_avx512vl
                                       (auVar279,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar249
                                       );
                  auVar249 = vaddps_avx512vl(auVar279,auVar382);
                  auVar450._0_4_ = (int)auVar292._0_4_;
                  auVar450._4_4_ = (int)auVar292._4_4_;
                  auVar450._8_4_ = (int)auVar292._8_4_;
                  auVar450._12_4_ = (int)auVar292._12_4_;
                  auVar450._16_4_ = (int)auVar292._16_4_;
                  auVar450._20_4_ = (int)auVar292._20_4_;
                  auVar450._24_4_ = (int)auVar292._24_4_;
                  auVar450._28_4_ = (int)auVar292._28_4_;
                  auVar279 = vpslld_avx2(auVar450,0x17);
                  auVar279 = vpaddd_avx2(auVar279,auVar481);
                  auVar192 = vfmadd213ps_fma(auVar279,auVar249,auVar382);
                  auVar279 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar279,auVar382);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar279,auVar279);
                  auVar249 = vfnmadd213ps_avx512vl(ZEXT1632(auVar192),auVar278,auVar268);
                  auVar287._4_4_ = auVar249._4_4_ * auVar338._4_4_;
                  auVar287._0_4_ = auVar249._0_4_ * auVar338._0_4_;
                  auVar287._8_4_ = auVar249._8_4_ * auVar338._8_4_;
                  auVar287._12_4_ = auVar249._12_4_ * auVar338._12_4_;
                  auVar287._16_4_ = auVar249._16_4_ * auVar338._16_4_;
                  auVar287._20_4_ = auVar249._20_4_ * auVar338._20_4_;
                  auVar287._24_4_ = auVar249._24_4_ * auVar338._24_4_;
                  auVar287._28_4_ = auVar279._28_4_;
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar421._4_4_ = uVar340;
                  auVar421._0_4_ = uVar340;
                  auVar421._8_4_ = uVar340;
                  auVar421._12_4_ = uVar340;
                  auVar421._16_4_ = uVar340;
                  auVar421._20_4_ = uVar340;
                  auVar421._24_4_ = uVar340;
                  auVar421._28_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar84._4_4_ = uVar340;
                  auVar84._0_4_ = uVar340;
                  auVar84._8_4_ = uVar340;
                  auVar84._12_4_ = uVar340;
                  auVar84._16_4_ = uVar340;
                  auVar84._20_4_ = uVar340;
                  auVar84._24_4_ = uVar340;
                  auVar84._28_4_ = uVar340;
                  auVar279 = vfmadd213ps_avx512vl(auVar421,auVar279,auVar84);
                  auVar279 = vmaxps_avx512vl(auVar279,ZEXT1632(auVar191));
                  auVar279 = vminps_avx(auVar279,auVar382);
                  auVar287._4_4_ = auVar279._4_4_ * auVar338._4_4_;
                  auVar287._0_4_ = auVar279._0_4_ * auVar338._0_4_;
                  auVar287._8_4_ = auVar279._8_4_ * auVar338._8_4_;
                  auVar287._12_4_ = auVar279._12_4_ * auVar338._12_4_;
                  auVar287._16_4_ = auVar279._16_4_ * auVar338._16_4_;
                  auVar287._20_4_ = auVar279._20_4_ * auVar338._20_4_;
                  auVar287._24_4_ = auVar279._24_4_ * auVar338._24_4_;
                  auVar287._28_4_ = auVar279._28_4_;
                }
              }
              *(undefined1 (*) [32])local_268 = auVar287;
              local_268 = local_268 + 4;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      if ((iVar170 == 8) && (uVar159 == 4)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar173 = 0;
        uVar174 = 0;
        if (0 < (int)uVar161) {
          uVar174 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar173;
        }
        auVar349._8_4_ = 0x42b0c0a5;
        auVar349._0_8_ = 0x42b0c0a542b0c0a5;
        auVar349._12_4_ = 0x42b0c0a5;
        auVar359._8_4_ = 0xc2b0c0a5;
        auVar359._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar359._12_4_ = 0xc2b0c0a5;
        auVar366._8_4_ = 0x3f000000;
        auVar366._0_8_ = 0x3f0000003f000000;
        auVar366._12_4_ = 0x3f000000;
        auVar372._8_4_ = 0x3fb8aa3b;
        auVar372._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar372._12_4_ = 0x3fb8aa3b;
        auVar378._8_4_ = 0x3f800000;
        auVar378._0_8_ = 0x3f8000003f800000;
        auVar378._12_4_ = 0x3f800000;
        auVar384._8_4_ = 0x3f318000;
        auVar384._0_8_ = 0x3f3180003f318000;
        auVar384._12_4_ = 0x3f318000;
        auVar191 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar453._8_4_ = 0x3ab743ce;
        auVar453._0_8_ = 0x3ab743ce3ab743ce;
        auVar453._12_4_ = 0x3ab743ce;
        auVar459._8_4_ = 0x3c088908;
        auVar459._0_8_ = 0x3c0889083c088908;
        auVar459._12_4_ = 0x3c088908;
        auVar465._8_4_ = 0x3d2aa9c1;
        auVar465._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar465._12_4_ = 0x3d2aa9c1;
        auVar471._8_4_ = 0x3e2aaaaa;
        auVar471._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar471._12_4_ = 0x3e2aaaaa;
        auVar477._8_4_ = 0x3f800000;
        auVar477._0_8_ = 0x3f8000003f800000;
        auVar477._12_4_ = 0x3f800000;
        auVar483._8_4_ = 0xb95e8083;
        auVar483._0_8_ = 0xb95e8083b95e8083;
        auVar483._12_4_ = 0xb95e8083;
        auVar192 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar214 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar216 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar217 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar218 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar219 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar220 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar220);
        auVar221 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; uVar173 != uVar188; uVar173 = uVar173 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar173 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar225 = ZEXT816(0) << 0x40;
              }
              else {
                auVar225 = *(undefined1 (*) [16])(lVar157 + uVar173 * 0x10);
              }
              auVar338 = ZEXT1664(auVar225);
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar173 * (this->weight_data_tm).elemsize +
                        0x70;
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                lVar180 = lVar162;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    lVar127 = (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar183;
                    iVar147 = iVar146;
                    for (lVar171 = 0; uVar174 * 0x80 != lVar171; lVar171 = lVar171 + 0x80) {
                      if (((-1 < iVar147) && (iVar149 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar149 < iVar153)) {
                        lVar155 = (long)(iVar149 << 3);
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127);
                        auVar394._4_4_ = uVar340;
                        auVar394._0_4_ = uVar340;
                        auVar394._8_4_ = uVar340;
                        auVar394._12_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 4);
                        auVar430._4_4_ = uVar340;
                        auVar430._0_4_ = uVar340;
                        auVar430._8_4_ = uVar340;
                        auVar430._12_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 8);
                        auVar495._4_4_ = uVar340;
                        auVar495._0_4_ = uVar340;
                        auVar495._8_4_ = uVar340;
                        auVar495._12_4_ = uVar340;
                        auVar222 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar223 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x10)));
                        auVar224 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x14)));
                        auVar207 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x18)));
                        auVar194 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0x1c)));
                        auVar225 = vfmadd231ps_fma(auVar338._0_16_,auVar394,
                                                   *(undefined1 (*) [16])(lVar180 + -0x70 + lVar171)
                                                  );
                        auVar225 = vfmadd231ps_fma(auVar225,auVar430,
                                                   *(undefined1 (*) [16])(lVar180 + -0x60 + lVar171)
                                                  );
                        auVar225 = vfmadd231ps_fma(auVar225,auVar495,
                                                   *(undefined1 (*) [16])(lVar180 + -0x50 + lVar171)
                                                  );
                        auVar225 = vfmadd231ps_avx512vl
                                             (auVar225,auVar222,
                                              *(undefined1 (*) [16])(lVar180 + -0x40 + lVar171));
                        auVar225 = vfmadd231ps_avx512vl
                                             (auVar225,auVar223,
                                              *(undefined1 (*) [16])(lVar180 + -0x30 + lVar171));
                        auVar225 = vfmadd231ps_avx512vl
                                             (auVar225,auVar224,
                                              *(undefined1 (*) [16])(lVar180 + -0x20 + lVar171));
                        auVar225 = vfmadd231ps_avx512vl
                                             (auVar225,auVar207,
                                              *(undefined1 (*) [16])(lVar180 + -0x10 + lVar171));
                        auVar225 = vfmadd231ps_avx512vl
                                             (auVar225,auVar194,
                                              *(undefined1 (*) [16])(lVar180 + lVar171));
                        auVar338 = ZEXT1664(auVar225);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x80;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x20) * 4;
              }
              auVar225 = auVar338._0_16_;
              auVar226 = auVar225;
              if (iVar152 - 1U < 6) {
                auVar226 = vmaxps_avx512vl(auVar225,auVar220);
                switch(iVar152) {
                case 2:
                  auVar225 = vminps_avx512vl(auVar225,auVar220);
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar40._4_4_ = uVar340;
                  auVar40._0_4_ = uVar340;
                  auVar40._8_4_ = uVar340;
                  auVar40._12_4_ = uVar340;
                  auVar226 = vfmadd231ps_avx512vl(auVar226,auVar225,auVar40);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar38._4_4_ = uVar340;
                  auVar38._0_4_ = uVar340;
                  auVar38._8_4_ = uVar340;
                  auVar38._12_4_ = uVar340;
                  auVar225 = vmaxps_avx512vl(auVar225,auVar38);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar39._4_4_ = uVar340;
                  auVar39._0_4_ = uVar340;
                  auVar39._8_4_ = uVar340;
                  auVar39._12_4_ = uVar340;
                  auVar226 = vminps_avx512vl(auVar225,auVar39);
                  break;
                case 4:
                  auVar36._8_4_ = 0x80000000;
                  auVar36._0_8_ = 0x8000000080000000;
                  auVar36._12_4_ = 0x80000000;
                  auVar225 = vxorps_avx512vl(auVar225,auVar36);
                  auVar225 = vminps_avx(auVar225,auVar349);
                  auVar222 = vmaxps_avx(auVar225,auVar359);
                  auVar223 = vfmadd231ps_fma(auVar366,auVar222,auVar372);
                  auVar500._0_4_ = (int)auVar223._0_4_;
                  auVar500._4_4_ = (int)auVar223._4_4_;
                  auVar500._8_4_ = (int)auVar223._8_4_;
                  auVar500._12_4_ = (int)auVar223._12_4_;
                  auVar225 = vcvtdq2ps_avx(auVar500);
                  uVar183 = vcmpps_avx512vl(auVar223,auVar225,1);
                  auVar223 = vsubps_avx512vl(auVar225,auVar378);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar232._0_4_ =
                       (float)((uint)bVar16 * auVar223._0_4_ | (uint)!bVar16 * auVar225._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar232._4_4_ =
                       (float)((uint)bVar16 * auVar223._4_4_ | (uint)!bVar16 * auVar225._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar232._8_4_ =
                       (float)((uint)bVar16 * auVar223._8_4_ | (uint)!bVar16 * auVar225._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar232._12_4_ =
                       (float)((uint)bVar16 * auVar223._12_4_ | (uint)!bVar16 * auVar225._12_4_);
                  auVar225 = vfmsub231ps_fma(auVar222,auVar232,auVar384);
                  auVar37._8_4_ = 0x395e8083;
                  auVar37._0_8_ = 0x395e8083395e8083;
                  auVar37._12_4_ = 0x395e8083;
                  auVar222 = vfmsub231ps_avx512vl(auVar225,auVar232,auVar37);
                  auVar397._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                  auVar397._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                  auVar397._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                  auVar397._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                  auVar225 = vfmadd213ps_fma(auVar191,auVar222,auVar453);
                  auVar225 = vfmadd213ps_fma(auVar225,auVar222,auVar459);
                  auVar225 = vfmadd213ps_fma(auVar225,auVar222,auVar465);
                  auVar225 = vfmadd213ps_fma(auVar225,auVar222,auVar471);
                  auVar225 = vfmadd213ps_fma(auVar225,auVar222,auVar366);
                  auVar225 = vfmadd213ps_fma(auVar225,auVar397,auVar222);
                  auVar342._0_4_ = auVar225._0_4_ + 1.0;
                  auVar342._4_4_ = auVar225._4_4_ + 1.0;
                  auVar342._8_4_ = auVar225._8_4_ + 1.0;
                  auVar342._12_4_ = auVar225._12_4_ + 1.0;
                  auVar398._0_4_ = (int)auVar232._0_4_;
                  auVar398._4_4_ = (int)auVar232._4_4_;
                  auVar398._8_4_ = (int)auVar232._8_4_;
                  auVar398._12_4_ = (int)auVar232._12_4_;
                  auVar225 = vpslld_avx(auVar398,0x17);
                  auVar225 = vpaddd_avx(auVar477,auVar225);
                  auVar222 = vfmadd213ps_fma(auVar225,auVar342,auVar378);
                  auVar225 = vrcpps_avx(auVar222);
                  auVar222 = vfmsub213ps_fma(auVar222,auVar225,auVar378);
                  auVar226 = vfnmadd132ps_fma(auVar222,auVar225,auVar225);
                  break;
                case 5:
                  auVar222 = vminps_avx(auVar225,auVar349);
                  auVar223 = vmaxps_avx(auVar222,auVar359);
                  auVar224 = vfmadd213ps_fma(auVar372,auVar223,auVar366);
                  auVar496._0_4_ = (int)auVar224._0_4_;
                  auVar496._4_4_ = (int)auVar224._4_4_;
                  auVar496._8_4_ = (int)auVar224._8_4_;
                  auVar496._12_4_ = (int)auVar224._12_4_;
                  auVar222 = vcvtdq2ps_avx(auVar496);
                  uVar183 = vcmpps_avx512vl(auVar224,auVar222,1);
                  auVar224 = vsubps_avx512vl(auVar222,auVar378);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar227._0_4_ =
                       (float)((uint)bVar16 * auVar224._0_4_ | (uint)!bVar16 * auVar222._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar227._4_4_ =
                       (float)((uint)bVar16 * auVar224._4_4_ | (uint)!bVar16 * auVar222._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar227._8_4_ =
                       (float)((uint)bVar16 * auVar224._8_4_ | (uint)!bVar16 * auVar222._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar227._12_4_ =
                       (float)((uint)bVar16 * auVar224._12_4_ | (uint)!bVar16 * auVar222._12_4_);
                  auVar222 = vfmsub231ps_fma(auVar223,auVar227,auVar384);
                  auVar222 = vfnmsub231ps_fma(auVar222,auVar227,auVar483);
                  auVar431._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                  auVar431._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                  auVar431._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                  auVar431._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                  auVar223 = vfmadd213ps_avx512vl(auVar191,auVar222,auVar453);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar459);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar465);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar471);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar366);
                  auVar222 = vfmadd213ps_avx512vl(auVar223,auVar431,auVar222);
                  auVar223 = vaddps_avx512vl(auVar222,auVar378);
                  auVar432._0_4_ = (int)auVar227._0_4_;
                  auVar432._4_4_ = (int)auVar227._4_4_;
                  auVar432._8_4_ = (int)auVar227._8_4_;
                  auVar432._12_4_ = (int)auVar227._12_4_;
                  auVar222 = vpslld_avx(auVar432,0x17);
                  auVar222 = vpaddd_avx(auVar222,auVar477);
                  auVar222 = vfmadd213ps_fma(auVar222,auVar223,auVar378);
                  uVar183 = vcmpps_avx512vl(auVar222,auVar220,2);
                  auVar30._8_4_ = 0x800000;
                  auVar30._0_8_ = 0x80000000800000;
                  auVar30._12_4_ = 0x800000;
                  auVar222 = vmaxps_avx512vl(auVar222,auVar30);
                  auVar224 = vpsrld_avx(auVar222,0x17);
                  auVar497._8_4_ = 0x807fffff;
                  auVar497._0_8_ = 0x807fffff807fffff;
                  auVar497._12_4_ = 0x807fffff;
                  auVar31._8_4_ = 0x3f000000;
                  auVar31._0_8_ = 0x3f0000003f000000;
                  auVar31._12_4_ = 0x3f000000;
                  auVar222 = vpternlogd_avx512vl(auVar222,auVar497,auVar31,0xea);
                  auVar32._8_4_ = 0x3f3504f3;
                  auVar32._0_8_ = 0x3f3504f33f3504f3;
                  auVar32._12_4_ = 0x3f3504f3;
                  uVar184 = vcmpps_avx512vl(auVar222,auVar32,1);
                  auVar33._8_4_ = 0xbf800000;
                  auVar33._0_8_ = 0xbf800000bf800000;
                  auVar33._12_4_ = 0xbf800000;
                  auVar223 = vaddps_avx512vl(auVar222,auVar33);
                  auVar222 = vaddps_avx512vl(auVar223,auVar222);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar228._0_4_ =
                       (float)((uint)bVar16 * auVar222._0_4_ | (uint)!bVar16 * auVar223._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar228._4_4_ =
                       (float)((uint)bVar16 * auVar222._4_4_ | (uint)!bVar16 * auVar223._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar228._8_4_ =
                       (float)((uint)bVar16 * auVar222._8_4_ | (uint)!bVar16 * auVar223._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar228._12_4_ =
                       (float)((uint)bVar16 * auVar222._12_4_ | (uint)!bVar16 * auVar223._12_4_);
                  auVar395._0_4_ = auVar228._0_4_ * auVar228._0_4_;
                  auVar395._4_4_ = auVar228._4_4_ * auVar228._4_4_;
                  auVar395._8_4_ = auVar228._8_4_ * auVar228._8_4_;
                  auVar395._12_4_ = auVar228._12_4_ * auVar228._12_4_;
                  auVar34._8_4_ = 0xbdebd1b8;
                  auVar34._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar34._12_4_ = 0xbdebd1b8;
                  auVar222 = vfmadd213ps_avx512vl(auVar192,auVar228,auVar34);
                  auVar222 = vfmadd213ps_avx512vl(auVar222,auVar228,auVar193);
                  auVar222 = vfmadd213ps_avx512vl(auVar222,auVar228,auVar214);
                  auVar222 = vfmadd213ps_avx512vl(auVar222,auVar228,auVar215);
                  auVar222 = vfmadd213ps_avx512vl(auVar222,auVar228,auVar216);
                  auVar222 = vfmadd213ps_avx512vl(auVar222,auVar228,auVar217);
                  auVar222 = vfmadd213ps_avx512vl(auVar222,auVar228,auVar218);
                  auVar222 = vfmadd213ps_avx512vl(auVar222,auVar228,auVar219);
                  auVar223 = vmulps_avx512vl(auVar395,auVar228);
                  auVar223 = vmulps_avx512vl(auVar223,auVar222);
                  auVar35._8_4_ = 0xffffff82;
                  auVar35._0_8_ = 0xffffff82ffffff82;
                  auVar35._12_4_ = 0xffffff82;
                  auVar222 = vpaddd_avx512vl(auVar224,auVar35);
                  auVar222 = vcvtdq2ps_avx(auVar222);
                  auVar224 = vsubps_avx512vl(auVar222,auVar378);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar229._0_4_ = (uint)bVar16 * auVar224._0_4_ | (uint)!bVar16 * auVar222._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar229._4_4_ = (uint)bVar16 * auVar224._4_4_ | (uint)!bVar16 * auVar222._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar229._8_4_ = (uint)bVar16 * auVar224._8_4_ | (uint)!bVar16 * auVar222._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar229._12_4_ = (uint)bVar16 * auVar224._12_4_ | (uint)!bVar16 * auVar222._12_4_
                  ;
                  auVar222 = vfmadd231ps_avx512vl(auVar223,auVar229,auVar483);
                  auVar222 = vfmsub231ps_avx512vl(auVar222,auVar366,auVar395);
                  auVar222 = vsubps_avx512vl(auVar222,auVar228);
                  auVar222 = vfnmadd231ps_fma(auVar222,auVar384,auVar229);
                  auVar223 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar230._0_4_ =
                       (uint)bVar16 * auVar223._0_4_ |
                       (uint)!bVar16 * (int)(auVar222._0_4_ + auVar222._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar230._4_4_ =
                       (uint)bVar16 * auVar223._4_4_ |
                       (uint)!bVar16 * (int)(auVar222._4_4_ + auVar222._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar230._8_4_ =
                       (uint)bVar16 * auVar223._8_4_ |
                       (uint)!bVar16 * (int)(auVar222._8_4_ + auVar222._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar230._12_4_ =
                       (uint)bVar16 * auVar223._12_4_ |
                       (uint)!bVar16 * (int)(auVar222._12_4_ + auVar222._12_4_);
                  auVar222 = vminps_avx(auVar230,auVar349);
                  auVar223 = vmaxps_avx(auVar222,auVar359);
                  auVar224 = vfmadd213ps_fma(auVar372,auVar223,auVar366);
                  auVar498._0_4_ = (int)auVar224._0_4_;
                  auVar498._4_4_ = (int)auVar224._4_4_;
                  auVar498._8_4_ = (int)auVar224._8_4_;
                  auVar498._12_4_ = (int)auVar224._12_4_;
                  auVar222 = vcvtdq2ps_avx(auVar498);
                  uVar183 = vcmpps_avx512vl(auVar224,auVar222,1);
                  auVar224 = vsubps_avx512vl(auVar222,auVar378);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar231._0_4_ =
                       (float)((uint)bVar16 * auVar224._0_4_ | (uint)!bVar16 * auVar222._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar231._4_4_ =
                       (float)((uint)bVar16 * auVar224._4_4_ | (uint)!bVar16 * auVar222._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar231._8_4_ =
                       (float)((uint)bVar16 * auVar224._8_4_ | (uint)!bVar16 * auVar222._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar231._12_4_ =
                       (float)((uint)bVar16 * auVar224._12_4_ | (uint)!bVar16 * auVar222._12_4_);
                  auVar222 = vfmsub231ps_fma(auVar223,auVar231,auVar384);
                  auVar222 = vfnmsub231ps_fma(auVar222,auVar231,auVar483);
                  auVar433._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                  auVar433._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                  auVar433._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                  auVar433._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                  auVar223 = vfmadd213ps_avx512vl(auVar191,auVar222,auVar453);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar459);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar465);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar471);
                  auVar223 = vfmadd213ps_avx512vl(auVar223,auVar222,auVar366);
                  auVar222 = vfmadd213ps_avx512vl(auVar223,auVar433,auVar222);
                  auVar223 = vaddps_avx512vl(auVar222,auVar378);
                  auVar396._0_4_ = (int)auVar231._0_4_;
                  auVar396._4_4_ = (int)auVar231._4_4_;
                  auVar396._8_4_ = (int)auVar231._8_4_;
                  auVar396._12_4_ = (int)auVar231._12_4_;
                  auVar222 = vpslld_avx(auVar396,0x17);
                  auVar222 = vpaddd_avx(auVar477,auVar222);
                  auVar223 = vfmadd213ps_fma(auVar222,auVar223,auVar378);
                  auVar222 = vrcpps_avx(auVar223);
                  auVar499._0_4_ = auVar222._0_4_ + auVar222._0_4_;
                  auVar499._4_4_ = auVar222._4_4_ + auVar222._4_4_;
                  auVar499._8_4_ = auVar222._8_4_ + auVar222._8_4_;
                  auVar499._12_4_ = auVar222._12_4_ + auVar222._12_4_;
                  auVar223 = vfmsub213ps_avx512vl(auVar223,auVar499,auVar221);
                  auVar222 = vfnmadd213ps_fma(auVar223,auVar222,auVar499);
                  auVar226 = vfmsub213ps_fma(auVar222,auVar225,auVar225);
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar399._4_4_ = uVar340;
                  auVar399._0_4_ = uVar340;
                  auVar399._8_4_ = uVar340;
                  auVar399._12_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar29._4_4_ = uVar340;
                  auVar29._0_4_ = uVar340;
                  auVar29._8_4_ = uVar340;
                  auVar29._12_4_ = uVar340;
                  auVar225 = vfmadd213ps_avx512vl(auVar399,auVar225,auVar29);
                  auVar225 = vmaxps_avx512vl(auVar225,auVar220);
                  auVar225 = vminps_avx(auVar225,auVar378);
                  auVar226._0_4_ = auVar225._0_4_ * auVar338._0_4_;
                  auVar226._4_4_ = auVar225._4_4_ * auVar338._4_4_;
                  auVar226._8_4_ = auVar225._8_4_ * auVar338._8_4_;
                  auVar226._12_4_ = auVar225._12_4_ * auVar338._12_4_;
                }
              }
              *(undefined1 (*) [16])local_268 = auVar226;
              local_268 = local_268 + 2;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      if ((iVar170 == 1) && (uVar159 == 8)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar174 = 0;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar174;
        }
        auVar357._8_4_ = 0x42b0c0a5;
        auVar357._0_8_ = 0x42b0c0a542b0c0a5;
        auVar357._12_4_ = 0x42b0c0a5;
        auVar357._16_4_ = 0x42b0c0a5;
        auVar357._20_4_ = 0x42b0c0a5;
        auVar357._24_4_ = 0x42b0c0a5;
        auVar357._28_4_ = 0x42b0c0a5;
        auVar364._8_4_ = 0xc2b0c0a5;
        auVar364._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar364._12_4_ = 0xc2b0c0a5;
        auVar364._16_4_ = 0xc2b0c0a5;
        auVar364._20_4_ = 0xc2b0c0a5;
        auVar364._24_4_ = 0xc2b0c0a5;
        auVar364._28_4_ = 0xc2b0c0a5;
        auVar371._8_4_ = 0x3f000000;
        auVar371._0_8_ = 0x3f0000003f000000;
        auVar371._12_4_ = 0x3f000000;
        auVar371._16_4_ = 0x3f000000;
        auVar371._20_4_ = 0x3f000000;
        auVar371._24_4_ = 0x3f000000;
        auVar371._28_4_ = 0x3f000000;
        auVar377._8_4_ = 0x3fb8aa3b;
        auVar377._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar377._12_4_ = 0x3fb8aa3b;
        auVar377._16_4_ = 0x3fb8aa3b;
        auVar377._20_4_ = 0x3fb8aa3b;
        auVar377._24_4_ = 0x3fb8aa3b;
        auVar377._28_4_ = 0x3fb8aa3b;
        auVar383._8_4_ = 0x3f800000;
        auVar383._0_8_ = 0x3f8000003f800000;
        auVar383._12_4_ = 0x3f800000;
        auVar383._16_4_ = 0x3f800000;
        auVar383._20_4_ = 0x3f800000;
        auVar383._24_4_ = 0x3f800000;
        auVar383._28_4_ = 0x3f800000;
        auVar389._8_4_ = 0x3f318000;
        auVar389._0_8_ = 0x3f3180003f318000;
        auVar389._12_4_ = 0x3f318000;
        auVar389._16_4_ = 0x3f318000;
        auVar389._20_4_ = 0x3f318000;
        auVar389._24_4_ = 0x3f318000;
        auVar389._28_4_ = 0x3f318000;
        auVar247 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar458._8_4_ = 0x3ab743ce;
        auVar458._0_8_ = 0x3ab743ce3ab743ce;
        auVar458._12_4_ = 0x3ab743ce;
        auVar458._16_4_ = 0x3ab743ce;
        auVar458._20_4_ = 0x3ab743ce;
        auVar458._24_4_ = 0x3ab743ce;
        auVar458._28_4_ = 0x3ab743ce;
        auVar464._8_4_ = 0x3c088908;
        auVar464._0_8_ = 0x3c0889083c088908;
        auVar464._12_4_ = 0x3c088908;
        auVar464._16_4_ = 0x3c088908;
        auVar464._20_4_ = 0x3c088908;
        auVar464._24_4_ = 0x3c088908;
        auVar464._28_4_ = 0x3c088908;
        auVar470._8_4_ = 0x3d2aa9c1;
        auVar470._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar470._12_4_ = 0x3d2aa9c1;
        auVar470._16_4_ = 0x3d2aa9c1;
        auVar470._20_4_ = 0x3d2aa9c1;
        auVar470._24_4_ = 0x3d2aa9c1;
        auVar470._28_4_ = 0x3d2aa9c1;
        auVar476._8_4_ = 0x3e2aaaaa;
        auVar476._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar476._12_4_ = 0x3e2aaaaa;
        auVar476._16_4_ = 0x3e2aaaaa;
        auVar476._20_4_ = 0x3e2aaaaa;
        auVar476._24_4_ = 0x3e2aaaaa;
        auVar476._28_4_ = 0x3e2aaaaa;
        auVar482._8_4_ = 0x3f800000;
        auVar482._0_8_ = 0x3f8000003f800000;
        auVar482._12_4_ = 0x3f800000;
        auVar482._16_4_ = 0x3f800000;
        auVar482._20_4_ = 0x3f800000;
        auVar482._24_4_ = 0x3f800000;
        auVar482._28_4_ = 0x3f800000;
        auVar488._8_4_ = 0xb95e8083;
        auVar488._0_8_ = 0xb95e8083b95e8083;
        auVar488._12_4_ = 0xb95e8083;
        auVar488._16_4_ = 0xb95e8083;
        auVar488._20_4_ = 0xb95e8083;
        auVar488._24_4_ = 0xb95e8083;
        auVar488._28_4_ = 0xb95e8083;
        auVar248 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar268 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar269 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar270 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar271 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar272 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar274 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar275 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar276 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar277 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar191 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        in_ZMM30 = ZEXT1664(auVar191);
        auVar278 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar174 != uVar188; uVar174 = uVar174 + 1) {
          local_2a8 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar174 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar338 = ZEXT3264(*(undefined1 (*) [32])(lVar157 + uVar174 * 0x20));
              }
              pvVar185 = (void *)((this->weight_data_tm).cstep * uVar174 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                pvVar178 = pvVar185;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    iVar147 = iVar146;
                    for (lVar162 = 0; uVar173 * 0x20 != lVar162; lVar162 = lVar162 + 0x20) {
                      if (((-1 < iVar147) && (iVar150 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar150 < iVar153)) {
                        uVar340 = *(undefined4 *)
                                   ((long)bottom_blob->data +
                                   (long)iVar150 * 4 +
                                   (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar183);
                        auVar422._4_4_ = uVar340;
                        auVar422._0_4_ = uVar340;
                        auVar422._8_4_ = uVar340;
                        auVar422._12_4_ = uVar340;
                        auVar422._16_4_ = uVar340;
                        auVar422._20_4_ = uVar340;
                        auVar422._24_4_ = uVar340;
                        auVar422._28_4_ = uVar340;
                        auVar192 = vfmadd231ps_fma(auVar338._0_32_,auVar422,
                                                   *(undefined1 (*) [32])((long)pvVar178 + lVar162))
                        ;
                        auVar338 = ZEXT1664(auVar192);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  pvVar178 = (void *)((long)pvVar178 + (long)(int)uVar161 * 0x20);
                }
                pvVar185 = (void *)((long)pvVar185 + (long)(int)(uVar161 * uVar165 * 8) * 4);
              }
              auVar279 = auVar338._0_32_;
              auVar294 = auVar279;
              if (iVar152 - 1U < 6) {
                auVar294 = vmaxps_avx512vl(auVar279,ZEXT1632(auVar191));
                switch(iVar152) {
                case 2:
                  auVar279 = vminps_avx512vl(auVar279,ZEXT1632(auVar191));
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar101._4_4_ = uVar340;
                  auVar101._0_4_ = uVar340;
                  auVar101._8_4_ = uVar340;
                  auVar101._12_4_ = uVar340;
                  auVar101._16_4_ = uVar340;
                  auVar101._20_4_ = uVar340;
                  auVar101._24_4_ = uVar340;
                  auVar101._28_4_ = uVar340;
                  auVar294 = vfmadd231ps_avx512vl(auVar294,auVar279,auVar101);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar99._4_4_ = uVar340;
                  auVar99._0_4_ = uVar340;
                  auVar99._8_4_ = uVar340;
                  auVar99._12_4_ = uVar340;
                  auVar99._16_4_ = uVar340;
                  auVar99._20_4_ = uVar340;
                  auVar99._24_4_ = uVar340;
                  auVar99._28_4_ = uVar340;
                  auVar279 = vmaxps_avx512vl(auVar279,auVar99);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar100._4_4_ = uVar340;
                  auVar100._0_4_ = uVar340;
                  auVar100._8_4_ = uVar340;
                  auVar100._12_4_ = uVar340;
                  auVar100._16_4_ = uVar340;
                  auVar100._20_4_ = uVar340;
                  auVar100._24_4_ = uVar340;
                  auVar100._28_4_ = uVar340;
                  auVar294 = vminps_avx512vl(auVar279,auVar100);
                  break;
                case 4:
                  auVar97._8_4_ = 0x80000000;
                  auVar97._0_8_ = 0x8000000080000000;
                  auVar97._12_4_ = 0x80000000;
                  auVar97._16_4_ = 0x80000000;
                  auVar97._20_4_ = 0x80000000;
                  auVar97._24_4_ = 0x80000000;
                  auVar97._28_4_ = 0x80000000;
                  auVar279 = vxorps_avx512vl(auVar279,auVar97);
                  auVar279 = vminps_avx(auVar279,auVar357);
                  auVar279 = vmaxps_avx(auVar279,auVar364);
                  auVar192 = vfmadd231ps_fma(auVar371,auVar279,auVar377);
                  auVar249 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar249,1);
                  auVar250 = vsubps_avx512vl(auVar249,auVar383);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar300._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar300._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar300._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar300._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar300._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar300._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar300._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar300._28_4_ =
                       (float)((uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar300,auVar389);
                  auVar98._8_4_ = 0x395e8083;
                  auVar98._0_8_ = 0x395e8083395e8083;
                  auVar98._12_4_ = 0x395e8083;
                  auVar98._16_4_ = 0x395e8083;
                  auVar98._20_4_ = 0x395e8083;
                  auVar98._24_4_ = 0x395e8083;
                  auVar98._28_4_ = 0x395e8083;
                  auVar279 = vfmsub231ps_avx512vl(ZEXT1632(auVar192),auVar300,auVar98);
                  auVar423._0_4_ = auVar279._0_4_ * auVar279._0_4_;
                  auVar423._4_4_ = auVar279._4_4_ * auVar279._4_4_;
                  auVar423._8_4_ = auVar279._8_4_ * auVar279._8_4_;
                  auVar423._12_4_ = auVar279._12_4_ * auVar279._12_4_;
                  auVar423._16_4_ = auVar279._16_4_ * auVar279._16_4_;
                  auVar423._20_4_ = auVar279._20_4_ * auVar279._20_4_;
                  auVar423._24_4_ = auVar279._24_4_ * auVar279._24_4_;
                  auVar423._28_4_ = 0;
                  auVar192 = vfmadd213ps_fma(auVar247,auVar279,auVar458);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar464);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar470);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar476);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar279,auVar371);
                  auVar192 = vfmadd213ps_fma(ZEXT1632(auVar192),auVar423,auVar279);
                  auVar348._0_4_ = auVar192._0_4_ + 1.0;
                  auVar348._4_4_ = auVar192._4_4_ + 1.0;
                  auVar348._8_4_ = auVar192._8_4_ + 1.0;
                  auVar348._12_4_ = auVar192._12_4_ + 1.0;
                  auVar348._16_4_ = 0x3f800000;
                  auVar348._20_4_ = 0x3f800000;
                  auVar348._24_4_ = 0x3f800000;
                  auVar348._28_4_ = 0x3f800000;
                  auVar424._0_4_ = (int)auVar300._0_4_;
                  auVar424._4_4_ = (int)auVar300._4_4_;
                  auVar424._8_4_ = (int)auVar300._8_4_;
                  auVar424._12_4_ = (int)auVar300._12_4_;
                  auVar424._16_4_ = (int)auVar300._16_4_;
                  auVar424._20_4_ = (int)auVar300._20_4_;
                  auVar424._24_4_ = (int)auVar300._24_4_;
                  auVar424._28_4_ = (int)auVar300._28_4_;
                  auVar279 = vpslld_avx2(auVar424,0x17);
                  auVar279 = vpaddd_avx2(auVar482,auVar279);
                  auVar192 = vfmadd213ps_fma(auVar279,auVar348,auVar383);
                  auVar279 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar279,auVar383);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar279,auVar279);
                  auVar294 = ZEXT1632(auVar192);
                  break;
                case 5:
                  auVar279 = vminps_avx(auVar279,auVar357);
                  auVar279 = vmaxps_avx(auVar279,auVar364);
                  auVar192 = vfmadd213ps_fma(auVar377,auVar279,auVar371);
                  auVar249 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar249,1);
                  auVar250 = vsubps_avx512vl(auVar249,auVar383);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar295._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar295._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar295._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar295._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar295._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar295._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar295._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar295._28_4_ =
                       (float)((uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar295,auVar389);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar295,auVar488);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar247,auVar249,auVar458);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar464);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar470);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar476);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar371);
                  auVar279 = vfmadd213ps_avx512vl
                                       (auVar279,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar249
                                       );
                  auVar249 = vaddps_avx512vl(auVar279,auVar383);
                  auVar451._0_4_ = (int)auVar295._0_4_;
                  auVar451._4_4_ = (int)auVar295._4_4_;
                  auVar451._8_4_ = (int)auVar295._8_4_;
                  auVar451._12_4_ = (int)auVar295._12_4_;
                  auVar451._16_4_ = (int)auVar295._16_4_;
                  auVar451._20_4_ = (int)auVar295._20_4_;
                  auVar451._24_4_ = (int)auVar295._24_4_;
                  auVar451._28_4_ = (int)auVar295._28_4_;
                  auVar279 = vpslld_avx2(auVar451,0x17);
                  auVar279 = vpaddd_avx2(auVar279,auVar482);
                  auVar192 = vfmadd213ps_fma(auVar279,auVar249,auVar383);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),ZEXT1632(auVar191),2);
                  auVar94._8_4_ = 0x800000;
                  auVar94._0_8_ = 0x80000000800000;
                  auVar94._12_4_ = 0x800000;
                  auVar94._16_4_ = 0x800000;
                  auVar94._20_4_ = 0x800000;
                  auVar94._24_4_ = 0x800000;
                  auVar94._28_4_ = 0x800000;
                  auVar279 = vmaxps_avx512vl(ZEXT1632(auVar192),auVar94);
                  auVar251 = vpsrld_avx2(auVar279,0x17);
                  auVar518._8_4_ = 0x807fffff;
                  auVar518._0_8_ = 0x807fffff807fffff;
                  auVar518._12_4_ = 0x807fffff;
                  auVar518._16_4_ = 0x807fffff;
                  auVar518._20_4_ = 0x807fffff;
                  auVar518._24_4_ = 0x807fffff;
                  auVar518._28_4_ = 0x807fffff;
                  auVar95._8_4_ = 0x3f000000;
                  auVar95._0_8_ = 0x3f0000003f000000;
                  auVar95._12_4_ = 0x3f000000;
                  auVar95._16_4_ = 0x3f000000;
                  auVar95._20_4_ = 0x3f000000;
                  auVar95._24_4_ = 0x3f000000;
                  auVar95._28_4_ = 0x3f000000;
                  auVar279 = vpternlogd_avx512vl(auVar279,auVar518,auVar95,0xea);
                  uVar184 = vcmpps_avx512vl(auVar279,auVar248,1);
                  auVar249 = vaddps_avx512vl(auVar279,auVar268);
                  auVar250 = vaddps_avx512vl(auVar249,auVar279);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar296._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar296._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar296._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar296._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar296._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar296._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar296._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar296._28_4_ = (uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_
                  ;
                  auVar116._4_4_ = auVar296._4_4_ * auVar296._4_4_;
                  auVar116._0_4_ = auVar296._0_4_ * auVar296._0_4_;
                  auVar116._8_4_ = auVar296._8_4_ * auVar296._8_4_;
                  auVar116._12_4_ = auVar296._12_4_ * auVar296._12_4_;
                  auVar116._16_4_ = auVar296._16_4_ * auVar296._16_4_;
                  auVar116._20_4_ = auVar296._20_4_ * auVar296._20_4_;
                  auVar116._24_4_ = auVar296._24_4_ * auVar296._24_4_;
                  auVar116._28_4_ = auVar279._28_4_;
                  auVar279 = vfmadd213ps_avx512vl(auVar269,auVar296,auVar270);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar296,auVar271);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar296,auVar272);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar296,auVar273);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar296,auVar274);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar296,auVar275);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar296,auVar276);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar296,auVar277);
                  auVar249 = vmulps_avx512vl(auVar116,auVar296);
                  auVar249 = vmulps_avx512vl(auVar249,auVar279);
                  auVar96._8_4_ = 0xffffff82;
                  auVar96._0_8_ = 0xffffff82ffffff82;
                  auVar96._12_4_ = 0xffffff82;
                  auVar96._16_4_ = 0xffffff82;
                  auVar96._20_4_ = 0xffffff82;
                  auVar96._24_4_ = 0xffffff82;
                  auVar96._28_4_ = 0xffffff82;
                  auVar279 = vpaddd_avx512vl(auVar251,auVar96);
                  auVar279 = vcvtdq2ps_avx(auVar279);
                  auVar250 = vsubps_avx512vl(auVar279,auVar383);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar297._0_4_ = (uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar279._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar297._4_4_ = (uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar279._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar297._8_4_ = (uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar279._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar297._12_4_ = (uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar279._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 4) & 1);
                  auVar297._16_4_ = (uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar279._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 5) & 1);
                  auVar297._20_4_ = (uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar279._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar184 >> 6) & 1);
                  auVar297._24_4_ = (uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar279._24_4_
                  ;
                  bVar16 = SUB81(uVar184 >> 7,0);
                  auVar297._28_4_ = (uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar279._28_4_
                  ;
                  auVar279 = vfmadd231ps_avx512vl(auVar249,auVar297,auVar488);
                  auVar279 = vfmsub231ps_avx512vl(auVar279,auVar371,auVar116);
                  auVar279 = vsubps_avx512vl(auVar279,auVar296);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar389,auVar297);
                  auVar279 = vmulps_avx512vl(ZEXT1632(auVar192),auVar278);
                  auVar249 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar298._0_4_ = (uint)bVar16 * auVar249._0_4_ | (uint)!bVar16 * auVar279._0_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar298._4_4_ = (uint)bVar16 * auVar249._4_4_ | (uint)!bVar16 * auVar279._4_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar298._8_4_ = (uint)bVar16 * auVar249._8_4_ | (uint)!bVar16 * auVar279._8_4_;
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar298._12_4_ = (uint)bVar16 * auVar249._12_4_ | (uint)!bVar16 * auVar279._12_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar298._16_4_ = (uint)bVar16 * auVar249._16_4_ | (uint)!bVar16 * auVar279._16_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar298._20_4_ = (uint)bVar16 * auVar249._20_4_ | (uint)!bVar16 * auVar279._20_4_
                  ;
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar298._24_4_ = (uint)bVar16 * auVar249._24_4_ | (uint)!bVar16 * auVar279._24_4_
                  ;
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar298._28_4_ = (uint)bVar16 * auVar249._28_4_ | (uint)!bVar16 * auVar279._28_4_
                  ;
                  auVar279 = vminps_avx(auVar298,auVar357);
                  auVar279 = vmaxps_avx(auVar279,auVar364);
                  auVar192 = vfmadd213ps_fma(auVar377,auVar279,auVar371);
                  auVar249 = vroundps_avx(ZEXT1632(auVar192),1);
                  uVar183 = vcmpps_avx512vl(ZEXT1632(auVar192),auVar249,1);
                  auVar250 = vsubps_avx512vl(auVar249,auVar383);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar299._0_4_ =
                       (float)((uint)bVar16 * auVar250._0_4_ | (uint)!bVar16 * auVar249._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar299._4_4_ =
                       (float)((uint)bVar16 * auVar250._4_4_ | (uint)!bVar16 * auVar249._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar299._8_4_ =
                       (float)((uint)bVar16 * auVar250._8_4_ | (uint)!bVar16 * auVar249._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar299._12_4_ =
                       (float)((uint)bVar16 * auVar250._12_4_ | (uint)!bVar16 * auVar249._12_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 4) & 1);
                  auVar299._16_4_ =
                       (float)((uint)bVar16 * auVar250._16_4_ | (uint)!bVar16 * auVar249._16_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 5) & 1);
                  auVar299._20_4_ =
                       (float)((uint)bVar16 * auVar250._20_4_ | (uint)!bVar16 * auVar249._20_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 6) & 1);
                  auVar299._24_4_ =
                       (float)((uint)bVar16 * auVar250._24_4_ | (uint)!bVar16 * auVar249._24_4_);
                  bVar16 = SUB81(uVar183 >> 7,0);
                  auVar299._28_4_ =
                       (float)((uint)bVar16 * auVar250._28_4_ | (uint)!bVar16 * auVar249._28_4_);
                  auVar192 = vfmsub231ps_fma(auVar279,auVar299,auVar389);
                  auVar192 = vfnmsub231ps_fma(ZEXT1632(auVar192),auVar299,auVar488);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar247,auVar249,auVar458);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar464);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar470);
                  auVar249 = ZEXT1632(auVar192);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar476);
                  auVar279 = vfmadd213ps_avx512vl(auVar279,auVar249,auVar371);
                  auVar279 = vfmadd213ps_avx512vl
                                       (auVar279,ZEXT1632(CONCAT412(auVar192._12_4_ *
                                                                    auVar192._12_4_,
                                                                    CONCAT48(auVar192._8_4_ *
                                                                             auVar192._8_4_,
                                                                             CONCAT44(auVar192._4_4_
                                                                                      * auVar192.
                                                  _4_4_,auVar192._0_4_ * auVar192._0_4_)))),auVar249
                                       );
                  auVar249 = vaddps_avx512vl(auVar279,auVar383);
                  auVar452._0_4_ = (int)auVar299._0_4_;
                  auVar452._4_4_ = (int)auVar299._4_4_;
                  auVar452._8_4_ = (int)auVar299._8_4_;
                  auVar452._12_4_ = (int)auVar299._12_4_;
                  auVar452._16_4_ = (int)auVar299._16_4_;
                  auVar452._20_4_ = (int)auVar299._20_4_;
                  auVar452._24_4_ = (int)auVar299._24_4_;
                  auVar452._28_4_ = (int)auVar299._28_4_;
                  auVar279 = vpslld_avx2(auVar452,0x17);
                  auVar279 = vpaddd_avx2(auVar279,auVar482);
                  auVar192 = vfmadd213ps_fma(auVar279,auVar249,auVar383);
                  auVar279 = vrcpps_avx(ZEXT1632(auVar192));
                  auVar192 = vfmsub213ps_fma(ZEXT1632(auVar192),auVar279,auVar383);
                  auVar192 = vfnmadd132ps_fma(ZEXT1632(auVar192),auVar279,auVar279);
                  auVar249 = vfnmadd213ps_avx512vl(ZEXT1632(auVar192),auVar278,auVar268);
                  auVar294._4_4_ = auVar249._4_4_ * auVar338._4_4_;
                  auVar294._0_4_ = auVar249._0_4_ * auVar338._0_4_;
                  auVar294._8_4_ = auVar249._8_4_ * auVar338._8_4_;
                  auVar294._12_4_ = auVar249._12_4_ * auVar338._12_4_;
                  auVar294._16_4_ = auVar249._16_4_ * auVar338._16_4_;
                  auVar294._20_4_ = auVar249._20_4_ * auVar338._20_4_;
                  auVar294._24_4_ = auVar249._24_4_ * auVar338._24_4_;
                  auVar294._28_4_ = auVar279._28_4_;
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar425._4_4_ = uVar340;
                  auVar425._0_4_ = uVar340;
                  auVar425._8_4_ = uVar340;
                  auVar425._12_4_ = uVar340;
                  auVar425._16_4_ = uVar340;
                  auVar425._20_4_ = uVar340;
                  auVar425._24_4_ = uVar340;
                  auVar425._28_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar93._4_4_ = uVar340;
                  auVar93._0_4_ = uVar340;
                  auVar93._8_4_ = uVar340;
                  auVar93._12_4_ = uVar340;
                  auVar93._16_4_ = uVar340;
                  auVar93._20_4_ = uVar340;
                  auVar93._24_4_ = uVar340;
                  auVar93._28_4_ = uVar340;
                  auVar279 = vfmadd213ps_avx512vl(auVar425,auVar279,auVar93);
                  auVar279 = vmaxps_avx512vl(auVar279,ZEXT1632(auVar191));
                  auVar279 = vminps_avx(auVar279,auVar383);
                  auVar294._4_4_ = auVar279._4_4_ * auVar338._4_4_;
                  auVar294._0_4_ = auVar279._0_4_ * auVar338._0_4_;
                  auVar294._8_4_ = auVar279._8_4_ * auVar338._8_4_;
                  auVar294._12_4_ = auVar279._12_4_ * auVar338._12_4_;
                  auVar294._16_4_ = auVar279._16_4_ * auVar338._16_4_;
                  auVar294._20_4_ = auVar279._20_4_ * auVar338._20_4_;
                  auVar294._24_4_ = auVar279._24_4_ * auVar338._24_4_;
                  auVar294._28_4_ = auVar279._28_4_;
                }
              }
              *(undefined1 (*) [32])local_2a8 = auVar294;
              local_2a8 = local_2a8 + 4;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      auVar191 = in_ZMM30._0_16_;
      if ((iVar170 == 8) && (uVar159 == 1)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0x114 + (long)p_Var164);
        local_170 = local_1e8.elemsize * local_1e8.cstep;
        uVar174 = 0;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar188 = uVar174;
        }
        uVar169 = local_1e8.w;
        if (local_1e8.w < 1) {
          uVar169 = 0;
        }
        uVar160 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar160 = 0;
        }
        local_158._0_4_ = uVar160;
        local_190 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          local_190 = uVar174;
        }
        iVar182 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        local_178 = (Allocator *)local_1e8.data;
        iVar153 = bottom_blob->w;
        iVar154 = bottom_blob->h;
        for (; auVar191 = in_ZMM30._0_16_, uVar174 != local_190; uVar174 = uVar174 + 1) {
          local_268 = (Allocator *)((long)&local_178->_vptr_Allocator + local_170 * uVar174);
          for (iVar146 = 0; iVar146 != local_158._0_4_; iVar146 = iVar146 + 1) {
            pfVar176 = *(float **)(&this->field_0x118 + (long)p_Var164);
            sVar11 = (this->weight_data_tm).cstep;
            sVar12 = (this->weight_data_tm).elemsize;
            pvVar185 = (this->weight_data_tm).data;
            iVar147 = (1 - uVar161) * iVar168;
            for (uVar160 = 0; uVar160 != uVar169; uVar160 = uVar160 + 1) {
              if (lVar157 == 0) {
                fVar339 = 0.0;
              }
              else {
                fVar339 = *(float *)(lVar157 + uVar174 * 4);
              }
              auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar178 = (void *)(sVar11 * uVar174 * sVar12 + (long)pvVar185);
              for (uVar186 = 0; uVar186 != uVar188; uVar186 = uVar186 + 1) {
                pvVar172 = pvVar178;
                for (uVar183 = 0; uVar183 != uVar158; uVar183 = uVar183 + 1) {
                  iVar149 = (((int)uVar183 - uVar165) + 1) * iVar182 + iVar146;
                  if (((-1 < iVar149) && (iVar150 = iVar149 / iVar152, iVar149 % iVar152 == 0)) &&
                     (iVar150 < iVar154)) {
                    iVar149 = iVar147;
                    for (lVar162 = 0; uVar173 * 0x20 != lVar162; lVar162 = lVar162 + 0x20) {
                      if (((-1 < iVar149) && (iVar151 = iVar149 / iVar163, iVar149 % iVar163 == 0))
                         && (iVar151 < iVar153)) {
                        auVar191 = vfmadd231ps_fma(auVar338._0_32_,
                                                   *(undefined1 (*) [32])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar151 << 3) * 4 +
                                                    (long)iVar150 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar186),
                                                   *(undefined1 (*) [32])((long)pvVar172 + lVar162))
                        ;
                        auVar338 = ZEXT1664(auVar191);
                      }
                      iVar149 = iVar149 + iVar168;
                    }
                  }
                  pvVar172 = (void *)((long)pvVar172 + (long)(int)uVar161 * 0x20);
                }
                pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar161 * uVar165 * 8) * 4);
              }
              auVar350._0_4_ = auVar338._16_4_ + auVar338._0_4_;
              auVar350._4_4_ = auVar338._20_4_ + auVar338._4_4_;
              auVar350._8_4_ = auVar338._24_4_ + auVar338._8_4_;
              auVar350._12_4_ = auVar338._28_4_ + auVar338._12_4_;
              auVar191 = vshufpd_avx(auVar350,auVar350,1);
              auVar351._0_4_ = auVar191._0_4_ + auVar350._0_4_;
              auVar351._4_4_ = auVar191._4_4_ + auVar350._4_4_;
              auVar351._8_4_ = auVar191._8_4_ + auVar350._8_4_;
              auVar351._12_4_ = auVar191._12_4_ + auVar350._12_4_;
              auVar191 = vmovshdup_avx(auVar351);
              fVar339 = auVar191._0_4_ + fVar339 + auVar351._0_4_;
              auVar191 = ZEXT416((uint)fVar339);
              fVar358 = fVar339;
              if (iVar166 - 1U < 6) {
                switch(iVar166) {
                case 1:
                  auVar191 = vmaxss_avx(ZEXT416((uint)fVar339),ZEXT416(0));
                  fVar358 = auVar191._0_4_;
                  break;
                case 2:
                  uVar18 = vcmpss_avx512f(ZEXT416((uint)fVar339),ZEXT416(0),0xe);
                  bVar16 = (bool)((byte)uVar18 & 1);
                  fVar358 = (float)((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * (int)*pfVar176) *
                            fVar339;
                  break;
                case 3:
                  auVar191 = vmaxss_avx(auVar191,ZEXT416((uint)*pfVar176));
                  fVar358 = auVar191._0_4_;
                  if (pfVar176[1] < auVar191._0_4_) {
                    fVar358 = pfVar176[1];
                  }
                  break;
                case 4:
                  auVar191 = vminss_avx(auVar191,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar42._8_4_ = 0x80000000;
                  auVar42._0_8_ = 0x8000000080000000;
                  auVar42._12_4_ = 0x80000000;
                  auVar192 = vxorps_avx512vl(auVar191,auVar42);
                  uVar18 = vcmpss_avx512f(auVar191,ZEXT416(0xc2b0c0a5),1);
                  bVar16 = (bool)((byte)uVar18 & 1);
                  fVar339 = expf((float)((uint)bVar16 * 0x42b0c0a5 + (uint)!bVar16 * auVar192._0_4_)
                                );
                  fVar358 = 1.0 / (fVar339 + 1.0);
                  break;
                case 5:
                  fVar358 = expf(fVar339);
                  fVar358 = logf(fVar358 + 1.0);
                  fVar358 = tanhf(fVar358);
                  fVar358 = fVar358 * fVar339;
                  break;
                case 6:
                  fVar4 = *pfVar176;
                  auVar41._8_4_ = 0x80000000;
                  auVar41._0_8_ = 0x8000000080000000;
                  auVar41._12_4_ = 0x80000000;
                  auVar192 = vxorps_avx512vl(ZEXT416((uint)pfVar176[1]),auVar41);
                  fVar365 = auVar192._0_4_ / fVar4;
                  fVar358 = 0.0;
                  if ((fVar365 <= fVar339) && (fVar358 = fVar339, fVar339 <= fVar365 + 1.0 / fVar4))
                  {
                    auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar191,
                                               ZEXT416((uint)pfVar176[1]));
                    fVar358 = auVar191._0_4_ * fVar339;
                  }
                }
              }
              *(float *)&local_268->_vptr_Allocator = fVar358;
              local_268 = (Allocator *)((long)&local_268->_vptr_Allocator + 4);
              iVar147 = iVar147 + 1;
            }
          }
        }
      }
      if ((iVar170 == 4) && (uVar159 == 4)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar173 = 0;
        uVar174 = 0;
        if (0 < (int)uVar161) {
          uVar174 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar173;
        }
        auVar352._8_4_ = 0x42b0c0a5;
        auVar352._0_8_ = 0x42b0c0a542b0c0a5;
        auVar352._12_4_ = 0x42b0c0a5;
        auVar360._8_4_ = 0xc2b0c0a5;
        auVar360._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar360._12_4_ = 0xc2b0c0a5;
        auVar367._8_4_ = 0x3f000000;
        auVar367._0_8_ = 0x3f0000003f000000;
        auVar367._12_4_ = 0x3f000000;
        auVar373._8_4_ = 0x3fb8aa3b;
        auVar373._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar373._12_4_ = 0x3fb8aa3b;
        auVar379._8_4_ = 0x3f800000;
        auVar379._0_8_ = 0x3f8000003f800000;
        auVar379._12_4_ = 0x3f800000;
        auVar385._8_4_ = 0x3f318000;
        auVar385._0_8_ = 0x3f3180003f318000;
        auVar385._12_4_ = 0x3f318000;
        auVar192 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar454._8_4_ = 0x3ab743ce;
        auVar454._0_8_ = 0x3ab743ce3ab743ce;
        auVar454._12_4_ = 0x3ab743ce;
        auVar460._8_4_ = 0x3c088908;
        auVar460._0_8_ = 0x3c0889083c088908;
        auVar460._12_4_ = 0x3c088908;
        auVar466._8_4_ = 0x3d2aa9c1;
        auVar466._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar466._12_4_ = 0x3d2aa9c1;
        auVar472._8_4_ = 0x3e2aaaaa;
        auVar472._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar472._12_4_ = 0x3e2aaaaa;
        auVar478._8_4_ = 0x3f800000;
        auVar478._0_8_ = 0x3f8000003f800000;
        auVar478._12_4_ = 0x3f800000;
        auVar484._8_4_ = 0xb95e8083;
        auVar484._0_8_ = 0xb95e8083b95e8083;
        auVar484._12_4_ = 0xb95e8083;
        auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar214 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar216 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar217 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar218 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar219 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar220 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar221 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar225 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar222 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar191 = vxorps_avx512vl(auVar191,auVar191);
        auVar223 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; uVar173 != uVar188; uVar173 = uVar173 + 1) {
          local_268 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar173 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar224 = ZEXT816(0) << 0x40;
              }
              else {
                auVar224 = *(undefined1 (*) [16])(lVar157 + uVar173 * 0x10);
              }
              auVar338 = ZEXT1664(auVar224);
              pvVar185 = bottom_blob->data;
              lVar162 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar173 * (this->weight_data_tm).elemsize +
                        0x30;
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                lVar180 = lVar162;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    lVar127 = (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar183;
                    iVar147 = iVar146;
                    for (lVar171 = 0; uVar174 * 0x40 != lVar171; lVar171 = lVar171 + 0x40) {
                      if (((-1 < iVar147) && (iVar149 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar149 < iVar153)) {
                        lVar155 = (long)(iVar149 << 2);
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127);
                        auVar400._4_4_ = uVar340;
                        auVar400._0_4_ = uVar340;
                        auVar400._8_4_ = uVar340;
                        auVar400._12_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 4);
                        auVar434._4_4_ = uVar340;
                        auVar434._0_4_ = uVar340;
                        auVar434._8_4_ = uVar340;
                        auVar434._12_4_ = uVar340;
                        uVar340 = *(undefined4 *)((long)pvVar185 + lVar155 * 4 + lVar127 + 8);
                        auVar501._4_4_ = uVar340;
                        auVar501._0_4_ = uVar340;
                        auVar501._8_4_ = uVar340;
                        auVar501._12_4_ = uVar340;
                        auVar207 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar185 +
                                                               lVar155 * 4 + lVar127 + 0xc)));
                        auVar224 = vfmadd231ps_fma(auVar338._0_16_,auVar400,
                                                   *(undefined1 (*) [16])(lVar180 + -0x30 + lVar171)
                                                  );
                        auVar224 = vfmadd231ps_fma(auVar224,auVar434,
                                                   *(undefined1 (*) [16])(lVar180 + -0x20 + lVar171)
                                                  );
                        auVar224 = vfmadd231ps_fma(auVar224,auVar501,
                                                   *(undefined1 (*) [16])(lVar180 + -0x10 + lVar171)
                                                  );
                        auVar224 = vfmadd231ps_avx512vl
                                             (auVar224,auVar207,
                                              *(undefined1 (*) [16])(lVar180 + lVar171));
                        auVar338 = ZEXT1664(auVar224);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  lVar180 = lVar180 + (long)(int)uVar161 * 0x40;
                }
                lVar162 = lVar162 + (long)(int)(uVar161 * uVar165 * 0x10) * 4;
              }
              auVar224 = auVar338._0_16_;
              auVar233 = auVar224;
              if (iVar152 - 1U < 6) {
                auVar233 = vmaxps_avx512vl(auVar224,auVar191);
                switch(iVar152) {
                case 2:
                  auVar224 = vminps_avx512vl(auVar224,auVar191);
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar51._4_4_ = uVar340;
                  auVar51._0_4_ = uVar340;
                  auVar51._8_4_ = uVar340;
                  auVar51._12_4_ = uVar340;
                  auVar233 = vfmadd231ps_avx512vl(auVar233,auVar224,auVar51);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar49._4_4_ = uVar340;
                  auVar49._0_4_ = uVar340;
                  auVar49._8_4_ = uVar340;
                  auVar49._12_4_ = uVar340;
                  auVar224 = vmaxps_avx512vl(auVar224,auVar49);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar50._4_4_ = uVar340;
                  auVar50._0_4_ = uVar340;
                  auVar50._8_4_ = uVar340;
                  auVar50._12_4_ = uVar340;
                  auVar233 = vminps_avx512vl(auVar224,auVar50);
                  break;
                case 4:
                  auVar47._8_4_ = 0x80000000;
                  auVar47._0_8_ = 0x8000000080000000;
                  auVar47._12_4_ = 0x80000000;
                  auVar224 = vxorps_avx512vl(auVar224,auVar47);
                  auVar224 = vminps_avx(auVar224,auVar352);
                  auVar207 = vmaxps_avx(auVar224,auVar360);
                  auVar194 = vfmadd231ps_fma(auVar367,auVar207,auVar373);
                  auVar506._0_4_ = (int)auVar194._0_4_;
                  auVar506._4_4_ = (int)auVar194._4_4_;
                  auVar506._8_4_ = (int)auVar194._8_4_;
                  auVar506._12_4_ = (int)auVar194._12_4_;
                  auVar224 = vcvtdq2ps_avx(auVar506);
                  uVar183 = vcmpps_avx512vl(auVar194,auVar224,1);
                  auVar194 = vsubps_avx512vl(auVar224,auVar379);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar239._0_4_ =
                       (float)((uint)bVar16 * auVar194._0_4_ | (uint)!bVar16 * auVar224._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar239._4_4_ =
                       (float)((uint)bVar16 * auVar194._4_4_ | (uint)!bVar16 * auVar224._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar239._8_4_ =
                       (float)((uint)bVar16 * auVar194._8_4_ | (uint)!bVar16 * auVar224._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar239._12_4_ =
                       (float)((uint)bVar16 * auVar194._12_4_ | (uint)!bVar16 * auVar224._12_4_);
                  auVar224 = vfmsub231ps_fma(auVar207,auVar239,auVar385);
                  auVar48._8_4_ = 0x395e8083;
                  auVar48._0_8_ = 0x395e8083395e8083;
                  auVar48._12_4_ = 0x395e8083;
                  auVar207 = vfmsub231ps_avx512vl(auVar224,auVar239,auVar48);
                  auVar403._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                  auVar403._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                  auVar403._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                  auVar403._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                  auVar224 = vfmadd213ps_fma(auVar192,auVar207,auVar454);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar460);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar466);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar472);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar367);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar403,auVar207);
                  auVar343._0_4_ = auVar224._0_4_ + 1.0;
                  auVar343._4_4_ = auVar224._4_4_ + 1.0;
                  auVar343._8_4_ = auVar224._8_4_ + 1.0;
                  auVar343._12_4_ = auVar224._12_4_ + 1.0;
                  auVar404._0_4_ = (int)auVar239._0_4_;
                  auVar404._4_4_ = (int)auVar239._4_4_;
                  auVar404._8_4_ = (int)auVar239._8_4_;
                  auVar404._12_4_ = (int)auVar239._12_4_;
                  auVar224 = vpslld_avx(auVar404,0x17);
                  auVar224 = vpaddd_avx(auVar478,auVar224);
                  auVar207 = vfmadd213ps_fma(auVar224,auVar343,auVar379);
                  auVar224 = vrcpps_avx(auVar207);
                  auVar207 = vfmsub213ps_fma(auVar207,auVar224,auVar379);
                  auVar233 = vfnmadd132ps_fma(auVar207,auVar224,auVar224);
                  break;
                case 5:
                  auVar207 = vminps_avx(auVar224,auVar352);
                  auVar194 = vmaxps_avx(auVar207,auVar360);
                  auVar195 = vfmadd213ps_fma(auVar373,auVar194,auVar367);
                  auVar502._0_4_ = (int)auVar195._0_4_;
                  auVar502._4_4_ = (int)auVar195._4_4_;
                  auVar502._8_4_ = (int)auVar195._8_4_;
                  auVar502._12_4_ = (int)auVar195._12_4_;
                  auVar207 = vcvtdq2ps_avx(auVar502);
                  uVar183 = vcmpps_avx512vl(auVar195,auVar207,1);
                  auVar195 = vsubps_avx512vl(auVar207,auVar379);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar234._0_4_ =
                       (float)((uint)bVar16 * auVar195._0_4_ | (uint)!bVar16 * auVar207._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar234._4_4_ =
                       (float)((uint)bVar16 * auVar195._4_4_ | (uint)!bVar16 * auVar207._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar234._8_4_ =
                       (float)((uint)bVar16 * auVar195._8_4_ | (uint)!bVar16 * auVar207._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar234._12_4_ =
                       (float)((uint)bVar16 * auVar195._12_4_ | (uint)!bVar16 * auVar207._12_4_);
                  auVar207 = vfmsub231ps_fma(auVar194,auVar234,auVar385);
                  auVar207 = vfnmsub231ps_fma(auVar207,auVar234,auVar484);
                  auVar435._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                  auVar435._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                  auVar435._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                  auVar435._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                  auVar194 = vfmadd213ps_avx512vl(auVar192,auVar207,auVar454);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar460);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar466);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar472);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar367);
                  auVar207 = vfmadd213ps_avx512vl(auVar194,auVar435,auVar207);
                  auVar194 = vaddps_avx512vl(auVar207,auVar379);
                  auVar436._0_4_ = (int)auVar234._0_4_;
                  auVar436._4_4_ = (int)auVar234._4_4_;
                  auVar436._8_4_ = (int)auVar234._8_4_;
                  auVar436._12_4_ = (int)auVar234._12_4_;
                  auVar207 = vpslld_avx(auVar436,0x17);
                  auVar207 = vpaddd_avx(auVar207,auVar478);
                  auVar207 = vfmadd213ps_fma(auVar207,auVar194,auVar379);
                  uVar183 = vcmpps_avx512vl(auVar207,auVar191,2);
                  auVar44._8_4_ = 0x800000;
                  auVar44._0_8_ = 0x80000000800000;
                  auVar44._12_4_ = 0x800000;
                  auVar207 = vmaxps_avx512vl(auVar207,auVar44);
                  auVar195 = vpsrld_avx(auVar207,0x17);
                  auVar503._8_4_ = 0x807fffff;
                  auVar503._0_8_ = 0x807fffff807fffff;
                  auVar503._12_4_ = 0x807fffff;
                  auVar45._8_4_ = 0x3f000000;
                  auVar45._0_8_ = 0x3f0000003f000000;
                  auVar45._12_4_ = 0x3f000000;
                  auVar207 = vpternlogd_avx512vl(auVar207,auVar503,auVar45,0xea);
                  uVar184 = vcmpps_avx512vl(auVar207,auVar193,1);
                  auVar194 = vaddps_avx512vl(auVar207,auVar214);
                  auVar207 = vaddps_avx512vl(auVar194,auVar207);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar235._0_4_ =
                       (float)((uint)bVar16 * auVar207._0_4_ | (uint)!bVar16 * auVar194._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar235._4_4_ =
                       (float)((uint)bVar16 * auVar207._4_4_ | (uint)!bVar16 * auVar194._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar235._8_4_ =
                       (float)((uint)bVar16 * auVar207._8_4_ | (uint)!bVar16 * auVar194._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar235._12_4_ =
                       (float)((uint)bVar16 * auVar207._12_4_ | (uint)!bVar16 * auVar194._12_4_);
                  auVar401._0_4_ = auVar235._0_4_ * auVar235._0_4_;
                  auVar401._4_4_ = auVar235._4_4_ * auVar235._4_4_;
                  auVar401._8_4_ = auVar235._8_4_ * auVar235._8_4_;
                  auVar401._12_4_ = auVar235._12_4_ * auVar235._12_4_;
                  auVar207 = vfmadd213ps_avx512vl(auVar215,auVar235,auVar216);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar235,auVar217);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar235,auVar218);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar235,auVar219);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar235,auVar220);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar235,auVar221);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar235,auVar225);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar235,auVar222);
                  auVar194 = vmulps_avx512vl(auVar401,auVar235);
                  auVar194 = vmulps_avx512vl(auVar194,auVar207);
                  auVar46._8_4_ = 0xffffff82;
                  auVar46._0_8_ = 0xffffff82ffffff82;
                  auVar46._12_4_ = 0xffffff82;
                  auVar207 = vpaddd_avx512vl(auVar195,auVar46);
                  auVar207 = vcvtdq2ps_avx(auVar207);
                  auVar195 = vsubps_avx512vl(auVar207,auVar379);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar236._0_4_ = (uint)bVar16 * auVar195._0_4_ | (uint)!bVar16 * auVar207._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar236._4_4_ = (uint)bVar16 * auVar195._4_4_ | (uint)!bVar16 * auVar207._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar236._8_4_ = (uint)bVar16 * auVar195._8_4_ | (uint)!bVar16 * auVar207._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar236._12_4_ = (uint)bVar16 * auVar195._12_4_ | (uint)!bVar16 * auVar207._12_4_
                  ;
                  auVar207 = vfmadd231ps_avx512vl(auVar194,auVar236,auVar484);
                  auVar207 = vfmsub231ps_avx512vl(auVar207,auVar367,auVar401);
                  auVar207 = vsubps_avx512vl(auVar207,auVar235);
                  auVar207 = vfnmadd231ps_fma(auVar207,auVar385,auVar236);
                  auVar194 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar237._0_4_ =
                       (uint)bVar16 * auVar194._0_4_ |
                       (uint)!bVar16 * (int)(auVar207._0_4_ + auVar207._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar237._4_4_ =
                       (uint)bVar16 * auVar194._4_4_ |
                       (uint)!bVar16 * (int)(auVar207._4_4_ + auVar207._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar237._8_4_ =
                       (uint)bVar16 * auVar194._8_4_ |
                       (uint)!bVar16 * (int)(auVar207._8_4_ + auVar207._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar237._12_4_ =
                       (uint)bVar16 * auVar194._12_4_ |
                       (uint)!bVar16 * (int)(auVar207._12_4_ + auVar207._12_4_);
                  auVar207 = vminps_avx(auVar237,auVar352);
                  auVar194 = vmaxps_avx(auVar207,auVar360);
                  auVar195 = vfmadd213ps_fma(auVar373,auVar194,auVar367);
                  auVar504._0_4_ = (int)auVar195._0_4_;
                  auVar504._4_4_ = (int)auVar195._4_4_;
                  auVar504._8_4_ = (int)auVar195._8_4_;
                  auVar504._12_4_ = (int)auVar195._12_4_;
                  auVar207 = vcvtdq2ps_avx(auVar504);
                  uVar183 = vcmpps_avx512vl(auVar195,auVar207,1);
                  auVar195 = vsubps_avx512vl(auVar207,auVar379);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar238._0_4_ =
                       (float)((uint)bVar16 * auVar195._0_4_ | (uint)!bVar16 * auVar207._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar238._4_4_ =
                       (float)((uint)bVar16 * auVar195._4_4_ | (uint)!bVar16 * auVar207._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar238._8_4_ =
                       (float)((uint)bVar16 * auVar195._8_4_ | (uint)!bVar16 * auVar207._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar238._12_4_ =
                       (float)((uint)bVar16 * auVar195._12_4_ | (uint)!bVar16 * auVar207._12_4_);
                  auVar207 = vfmsub231ps_fma(auVar194,auVar238,auVar385);
                  auVar207 = vfnmsub231ps_fma(auVar207,auVar238,auVar484);
                  auVar437._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                  auVar437._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                  auVar437._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                  auVar437._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                  auVar194 = vfmadd213ps_avx512vl(auVar192,auVar207,auVar454);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar460);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar466);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar472);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar367);
                  auVar207 = vfmadd213ps_avx512vl(auVar194,auVar437,auVar207);
                  auVar194 = vaddps_avx512vl(auVar207,auVar379);
                  auVar402._0_4_ = (int)auVar238._0_4_;
                  auVar402._4_4_ = (int)auVar238._4_4_;
                  auVar402._8_4_ = (int)auVar238._8_4_;
                  auVar402._12_4_ = (int)auVar238._12_4_;
                  auVar207 = vpslld_avx(auVar402,0x17);
                  auVar207 = vpaddd_avx(auVar478,auVar207);
                  auVar194 = vfmadd213ps_fma(auVar207,auVar194,auVar379);
                  auVar207 = vrcpps_avx(auVar194);
                  auVar505._0_4_ = auVar207._0_4_ + auVar207._0_4_;
                  auVar505._4_4_ = auVar207._4_4_ + auVar207._4_4_;
                  auVar505._8_4_ = auVar207._8_4_ + auVar207._8_4_;
                  auVar505._12_4_ = auVar207._12_4_ + auVar207._12_4_;
                  auVar194 = vfmsub213ps_avx512vl(auVar194,auVar505,auVar223);
                  auVar207 = vfnmadd213ps_fma(auVar194,auVar207,auVar505);
                  auVar233 = vfmsub213ps_fma(auVar207,auVar224,auVar224);
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar405._4_4_ = uVar340;
                  auVar405._0_4_ = uVar340;
                  auVar405._8_4_ = uVar340;
                  auVar405._12_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar43._4_4_ = uVar340;
                  auVar43._0_4_ = uVar340;
                  auVar43._8_4_ = uVar340;
                  auVar43._12_4_ = uVar340;
                  auVar224 = vfmadd213ps_avx512vl(auVar405,auVar224,auVar43);
                  auVar224 = vmaxps_avx512vl(auVar224,auVar191);
                  auVar224 = vminps_avx(auVar224,auVar379);
                  auVar233._0_4_ = auVar224._0_4_ * auVar338._0_4_;
                  auVar233._4_4_ = auVar224._4_4_ * auVar338._4_4_;
                  auVar233._8_4_ = auVar224._8_4_ * auVar338._8_4_;
                  auVar233._12_4_ = auVar224._12_4_ * auVar338._12_4_;
                }
              }
              *(undefined1 (*) [16])local_268 = auVar233;
              local_268 = local_268 + 2;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      if ((iVar170 == 1) && (uVar159 == 4)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0x114 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        uVar174 = 0;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar158 = 0;
        if (0 < (int)uVar165) {
          uVar158 = (ulong)uVar165;
        }
        uVar188 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar188 = uVar174;
        }
        auVar353._8_4_ = 0x42b0c0a5;
        auVar353._0_8_ = 0x42b0c0a542b0c0a5;
        auVar353._12_4_ = 0x42b0c0a5;
        auVar361._8_4_ = 0xc2b0c0a5;
        auVar361._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar361._12_4_ = 0xc2b0c0a5;
        auVar368._8_4_ = 0x3f000000;
        auVar368._0_8_ = 0x3f0000003f000000;
        auVar368._12_4_ = 0x3f000000;
        auVar374._8_4_ = 0x3fb8aa3b;
        auVar374._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar374._12_4_ = 0x3fb8aa3b;
        auVar380._8_4_ = 0x3f800000;
        auVar380._0_8_ = 0x3f8000003f800000;
        auVar380._12_4_ = 0x3f800000;
        auVar386._8_4_ = 0x3f318000;
        auVar386._0_8_ = 0x3f3180003f318000;
        auVar386._12_4_ = 0x3f318000;
        auVar192 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar455._8_4_ = 0x3ab743ce;
        auVar455._0_8_ = 0x3ab743ce3ab743ce;
        auVar455._12_4_ = 0x3ab743ce;
        auVar461._8_4_ = 0x3c088908;
        auVar461._0_8_ = 0x3c0889083c088908;
        auVar461._12_4_ = 0x3c088908;
        auVar467._8_4_ = 0x3d2aa9c1;
        auVar467._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar467._12_4_ = 0x3d2aa9c1;
        auVar473._8_4_ = 0x3e2aaaaa;
        auVar473._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar473._12_4_ = 0x3e2aaaaa;
        auVar479._8_4_ = 0x3f800000;
        auVar479._0_8_ = 0x3f8000003f800000;
        auVar479._12_4_ = 0x3f800000;
        auVar485._8_4_ = 0xb95e8083;
        auVar485._0_8_ = 0xb95e8083b95e8083;
        auVar485._12_4_ = 0xb95e8083;
        auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar214 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar216 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar217 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar218 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar219 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar220 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar221 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar225 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar222 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar191 = vxorps_avx512vl(auVar191,auVar191);
        auVar223 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; uVar174 != uVar188; uVar174 = uVar174 + 1) {
          local_2a8 = (Allocator *)
                      ((long)(_func_int ***)local_1e8.data +
                      local_1e8.cstep * uVar174 * local_1e8.elemsize);
          iVar153 = bottom_blob->w;
          iVar154 = bottom_blob->h;
          uVar183 = 0;
          uVar186 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar186 = uVar183;
          }
          uVar169 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar169 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          local_158._0_4_ = uVar160;
          while (uVar167 = (uint)uVar183, uVar167 != uVar160) {
            iVar146 = (1 - uVar161) * iVar168;
            for (uVar148 = 0; uVar148 != uVar169; uVar148 = uVar148 + 1) {
              if (lVar157 == 0) {
                auVar224 = ZEXT816(0) << 0x40;
              }
              else {
                auVar224 = *(undefined1 (*) [16])(lVar157 + uVar174 * 0x10);
              }
              auVar338 = ZEXT1664(auVar224);
              pvVar185 = (void *)((this->weight_data_tm).cstep * uVar174 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              for (uVar183 = 0; uVar183 != uVar186; uVar183 = uVar183 + 1) {
                pvVar178 = pvVar185;
                for (uVar184 = 0; uVar184 != uVar158; uVar184 = uVar184 + 1) {
                  iVar147 = (((int)uVar184 - uVar165) + 1) * iVar166 + uVar167;
                  if (((-1 < iVar147) && (iVar149 = iVar147 / iVar163, iVar147 % iVar163 == 0)) &&
                     (iVar149 < iVar154)) {
                    iVar147 = iVar146;
                    for (lVar162 = 0; uVar173 * 0x10 != lVar162; lVar162 = lVar162 + 0x10) {
                      if (((-1 < iVar147) && (iVar150 = iVar147 / iVar182, iVar147 % iVar182 == 0))
                         && (iVar150 < iVar153)) {
                        uVar340 = *(undefined4 *)
                                   ((long)bottom_blob->data +
                                   (long)iVar150 * 4 +
                                   (long)iVar149 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar183);
                        auVar406._4_4_ = uVar340;
                        auVar406._0_4_ = uVar340;
                        auVar406._8_4_ = uVar340;
                        auVar406._12_4_ = uVar340;
                        auVar224 = vfmadd231ps_fma(auVar338._0_16_,auVar406,
                                                   *(undefined1 (*) [16])((long)pvVar178 + lVar162))
                        ;
                        auVar338 = ZEXT1664(auVar224);
                      }
                      iVar147 = iVar147 + iVar168;
                    }
                  }
                  pvVar178 = (void *)((long)pvVar178 + (long)(int)uVar161 * 0x10);
                }
                pvVar185 = (void *)((long)pvVar185 + (long)(int)(uVar161 * uVar165 * 4) * 4);
              }
              auVar224 = auVar338._0_16_;
              auVar240 = auVar224;
              if (iVar152 - 1U < 6) {
                auVar240 = vmaxps_avx512vl(auVar224,auVar191);
                switch(iVar152) {
                case 2:
                  auVar224 = vminps_avx512vl(auVar224,auVar191);
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar60._4_4_ = uVar340;
                  auVar60._0_4_ = uVar340;
                  auVar60._8_4_ = uVar340;
                  auVar60._12_4_ = uVar340;
                  auVar240 = vfmadd231ps_avx512vl(auVar240,auVar224,auVar60);
                  break;
                case 3:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar58._4_4_ = uVar340;
                  auVar58._0_4_ = uVar340;
                  auVar58._8_4_ = uVar340;
                  auVar58._12_4_ = uVar340;
                  auVar224 = vmaxps_avx512vl(auVar224,auVar58);
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar59._4_4_ = uVar340;
                  auVar59._0_4_ = uVar340;
                  auVar59._8_4_ = uVar340;
                  auVar59._12_4_ = uVar340;
                  auVar240 = vminps_avx512vl(auVar224,auVar59);
                  break;
                case 4:
                  auVar56._8_4_ = 0x80000000;
                  auVar56._0_8_ = 0x8000000080000000;
                  auVar56._12_4_ = 0x80000000;
                  auVar224 = vxorps_avx512vl(auVar224,auVar56);
                  auVar224 = vminps_avx(auVar224,auVar353);
                  auVar207 = vmaxps_avx(auVar224,auVar361);
                  auVar194 = vfmadd231ps_fma(auVar368,auVar207,auVar374);
                  auVar511._0_4_ = (int)auVar194._0_4_;
                  auVar511._4_4_ = (int)auVar194._4_4_;
                  auVar511._8_4_ = (int)auVar194._8_4_;
                  auVar511._12_4_ = (int)auVar194._12_4_;
                  auVar224 = vcvtdq2ps_avx(auVar511);
                  uVar183 = vcmpps_avx512vl(auVar194,auVar224,1);
                  auVar194 = vsubps_avx512vl(auVar224,auVar380);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar246._0_4_ =
                       (float)((uint)bVar16 * auVar194._0_4_ | (uint)!bVar16 * auVar224._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar246._4_4_ =
                       (float)((uint)bVar16 * auVar194._4_4_ | (uint)!bVar16 * auVar224._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar246._8_4_ =
                       (float)((uint)bVar16 * auVar194._8_4_ | (uint)!bVar16 * auVar224._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar246._12_4_ =
                       (float)((uint)bVar16 * auVar194._12_4_ | (uint)!bVar16 * auVar224._12_4_);
                  auVar224 = vfmsub231ps_fma(auVar207,auVar246,auVar386);
                  auVar57._8_4_ = 0x395e8083;
                  auVar57._0_8_ = 0x395e8083395e8083;
                  auVar57._12_4_ = 0x395e8083;
                  auVar207 = vfmsub231ps_avx512vl(auVar224,auVar246,auVar57);
                  auVar409._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                  auVar409._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                  auVar409._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                  auVar409._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                  auVar224 = vfmadd213ps_fma(auVar192,auVar207,auVar455);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar461);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar467);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar473);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar207,auVar368);
                  auVar224 = vfmadd213ps_fma(auVar224,auVar409,auVar207);
                  auVar344._0_4_ = auVar224._0_4_ + 1.0;
                  auVar344._4_4_ = auVar224._4_4_ + 1.0;
                  auVar344._8_4_ = auVar224._8_4_ + 1.0;
                  auVar344._12_4_ = auVar224._12_4_ + 1.0;
                  auVar410._0_4_ = (int)auVar246._0_4_;
                  auVar410._4_4_ = (int)auVar246._4_4_;
                  auVar410._8_4_ = (int)auVar246._8_4_;
                  auVar410._12_4_ = (int)auVar246._12_4_;
                  auVar224 = vpslld_avx(auVar410,0x17);
                  auVar224 = vpaddd_avx(auVar479,auVar224);
                  auVar207 = vfmadd213ps_fma(auVar224,auVar344,auVar380);
                  auVar224 = vrcpps_avx(auVar207);
                  auVar207 = vfmsub213ps_fma(auVar207,auVar224,auVar380);
                  auVar240 = vfnmadd132ps_fma(auVar207,auVar224,auVar224);
                  break;
                case 5:
                  auVar207 = vminps_avx(auVar224,auVar353);
                  auVar194 = vmaxps_avx(auVar207,auVar361);
                  auVar195 = vfmadd213ps_fma(auVar374,auVar194,auVar368);
                  auVar507._0_4_ = (int)auVar195._0_4_;
                  auVar507._4_4_ = (int)auVar195._4_4_;
                  auVar507._8_4_ = (int)auVar195._8_4_;
                  auVar507._12_4_ = (int)auVar195._12_4_;
                  auVar207 = vcvtdq2ps_avx(auVar507);
                  uVar183 = vcmpps_avx512vl(auVar195,auVar207,1);
                  auVar195 = vsubps_avx512vl(auVar207,auVar380);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar241._0_4_ =
                       (float)((uint)bVar16 * auVar195._0_4_ | (uint)!bVar16 * auVar207._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar241._4_4_ =
                       (float)((uint)bVar16 * auVar195._4_4_ | (uint)!bVar16 * auVar207._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar241._8_4_ =
                       (float)((uint)bVar16 * auVar195._8_4_ | (uint)!bVar16 * auVar207._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar241._12_4_ =
                       (float)((uint)bVar16 * auVar195._12_4_ | (uint)!bVar16 * auVar207._12_4_);
                  auVar207 = vfmsub231ps_fma(auVar194,auVar241,auVar386);
                  auVar207 = vfnmsub231ps_fma(auVar207,auVar241,auVar485);
                  auVar438._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                  auVar438._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                  auVar438._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                  auVar438._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                  auVar194 = vfmadd213ps_avx512vl(auVar192,auVar207,auVar455);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar461);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar467);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar473);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar368);
                  auVar207 = vfmadd213ps_avx512vl(auVar194,auVar438,auVar207);
                  auVar194 = vaddps_avx512vl(auVar207,auVar380);
                  auVar439._0_4_ = (int)auVar241._0_4_;
                  auVar439._4_4_ = (int)auVar241._4_4_;
                  auVar439._8_4_ = (int)auVar241._8_4_;
                  auVar439._12_4_ = (int)auVar241._12_4_;
                  auVar207 = vpslld_avx(auVar439,0x17);
                  auVar207 = vpaddd_avx(auVar207,auVar479);
                  auVar207 = vfmadd213ps_fma(auVar207,auVar194,auVar380);
                  uVar183 = vcmpps_avx512vl(auVar207,auVar191,2);
                  auVar53._8_4_ = 0x800000;
                  auVar53._0_8_ = 0x80000000800000;
                  auVar53._12_4_ = 0x800000;
                  auVar207 = vmaxps_avx512vl(auVar207,auVar53);
                  auVar195 = vpsrld_avx(auVar207,0x17);
                  auVar508._8_4_ = 0x807fffff;
                  auVar508._0_8_ = 0x807fffff807fffff;
                  auVar508._12_4_ = 0x807fffff;
                  auVar54._8_4_ = 0x3f000000;
                  auVar54._0_8_ = 0x3f0000003f000000;
                  auVar54._12_4_ = 0x3f000000;
                  auVar207 = vpternlogd_avx512vl(auVar207,auVar508,auVar54,0xea);
                  uVar184 = vcmpps_avx512vl(auVar207,auVar193,1);
                  auVar194 = vaddps_avx512vl(auVar207,auVar214);
                  auVar207 = vaddps_avx512vl(auVar194,auVar207);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar242._0_4_ =
                       (float)((uint)bVar16 * auVar207._0_4_ | (uint)!bVar16 * auVar194._0_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar242._4_4_ =
                       (float)((uint)bVar16 * auVar207._4_4_ | (uint)!bVar16 * auVar194._4_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar242._8_4_ =
                       (float)((uint)bVar16 * auVar207._8_4_ | (uint)!bVar16 * auVar194._8_4_);
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar242._12_4_ =
                       (float)((uint)bVar16 * auVar207._12_4_ | (uint)!bVar16 * auVar194._12_4_);
                  auVar407._0_4_ = auVar242._0_4_ * auVar242._0_4_;
                  auVar407._4_4_ = auVar242._4_4_ * auVar242._4_4_;
                  auVar407._8_4_ = auVar242._8_4_ * auVar242._8_4_;
                  auVar407._12_4_ = auVar242._12_4_ * auVar242._12_4_;
                  auVar207 = vfmadd213ps_avx512vl(auVar215,auVar242,auVar216);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar242,auVar217);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar242,auVar218);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar242,auVar219);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar242,auVar220);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar242,auVar221);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar242,auVar225);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar242,auVar222);
                  auVar194 = vmulps_avx512vl(auVar407,auVar242);
                  auVar194 = vmulps_avx512vl(auVar194,auVar207);
                  auVar55._8_4_ = 0xffffff82;
                  auVar55._0_8_ = 0xffffff82ffffff82;
                  auVar55._12_4_ = 0xffffff82;
                  auVar207 = vpaddd_avx512vl(auVar195,auVar55);
                  auVar207 = vcvtdq2ps_avx(auVar207);
                  auVar195 = vsubps_avx512vl(auVar207,auVar380);
                  bVar16 = (bool)((byte)uVar184 & 1);
                  auVar243._0_4_ = (uint)bVar16 * auVar195._0_4_ | (uint)!bVar16 * auVar207._0_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 1) & 1);
                  auVar243._4_4_ = (uint)bVar16 * auVar195._4_4_ | (uint)!bVar16 * auVar207._4_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 2) & 1);
                  auVar243._8_4_ = (uint)bVar16 * auVar195._8_4_ | (uint)!bVar16 * auVar207._8_4_;
                  bVar16 = (bool)((byte)(uVar184 >> 3) & 1);
                  auVar243._12_4_ = (uint)bVar16 * auVar195._12_4_ | (uint)!bVar16 * auVar207._12_4_
                  ;
                  auVar207 = vfmadd231ps_avx512vl(auVar194,auVar243,auVar485);
                  auVar207 = vfmsub231ps_avx512vl(auVar207,auVar368,auVar407);
                  auVar207 = vsubps_avx512vl(auVar207,auVar242);
                  auVar207 = vfnmadd231ps_fma(auVar207,auVar386,auVar243);
                  auVar194 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar244._0_4_ =
                       (uint)bVar16 * auVar194._0_4_ |
                       (uint)!bVar16 * (int)(auVar207._0_4_ + auVar207._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar244._4_4_ =
                       (uint)bVar16 * auVar194._4_4_ |
                       (uint)!bVar16 * (int)(auVar207._4_4_ + auVar207._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar244._8_4_ =
                       (uint)bVar16 * auVar194._8_4_ |
                       (uint)!bVar16 * (int)(auVar207._8_4_ + auVar207._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar244._12_4_ =
                       (uint)bVar16 * auVar194._12_4_ |
                       (uint)!bVar16 * (int)(auVar207._12_4_ + auVar207._12_4_);
                  auVar207 = vminps_avx(auVar244,auVar353);
                  auVar194 = vmaxps_avx(auVar207,auVar361);
                  auVar195 = vfmadd213ps_fma(auVar374,auVar194,auVar368);
                  auVar509._0_4_ = (int)auVar195._0_4_;
                  auVar509._4_4_ = (int)auVar195._4_4_;
                  auVar509._8_4_ = (int)auVar195._8_4_;
                  auVar509._12_4_ = (int)auVar195._12_4_;
                  auVar207 = vcvtdq2ps_avx(auVar509);
                  uVar183 = vcmpps_avx512vl(auVar195,auVar207,1);
                  auVar195 = vsubps_avx512vl(auVar207,auVar380);
                  bVar16 = (bool)((byte)uVar183 & 1);
                  auVar245._0_4_ =
                       (float)((uint)bVar16 * auVar195._0_4_ | (uint)!bVar16 * auVar207._0_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 1) & 1);
                  auVar245._4_4_ =
                       (float)((uint)bVar16 * auVar195._4_4_ | (uint)!bVar16 * auVar207._4_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 2) & 1);
                  auVar245._8_4_ =
                       (float)((uint)bVar16 * auVar195._8_4_ | (uint)!bVar16 * auVar207._8_4_);
                  bVar16 = (bool)((byte)(uVar183 >> 3) & 1);
                  auVar245._12_4_ =
                       (float)((uint)bVar16 * auVar195._12_4_ | (uint)!bVar16 * auVar207._12_4_);
                  auVar207 = vfmsub231ps_fma(auVar194,auVar245,auVar386);
                  auVar207 = vfnmsub231ps_fma(auVar207,auVar245,auVar485);
                  auVar440._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                  auVar440._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                  auVar440._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                  auVar440._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                  auVar194 = vfmadd213ps_avx512vl(auVar192,auVar207,auVar455);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar461);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar467);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar473);
                  auVar194 = vfmadd213ps_avx512vl(auVar194,auVar207,auVar368);
                  auVar207 = vfmadd213ps_avx512vl(auVar194,auVar440,auVar207);
                  auVar194 = vaddps_avx512vl(auVar207,auVar380);
                  auVar408._0_4_ = (int)auVar245._0_4_;
                  auVar408._4_4_ = (int)auVar245._4_4_;
                  auVar408._8_4_ = (int)auVar245._8_4_;
                  auVar408._12_4_ = (int)auVar245._12_4_;
                  auVar207 = vpslld_avx(auVar408,0x17);
                  auVar207 = vpaddd_avx(auVar479,auVar207);
                  auVar194 = vfmadd213ps_fma(auVar207,auVar194,auVar380);
                  auVar207 = vrcpps_avx(auVar194);
                  auVar510._0_4_ = auVar207._0_4_ + auVar207._0_4_;
                  auVar510._4_4_ = auVar207._4_4_ + auVar207._4_4_;
                  auVar510._8_4_ = auVar207._8_4_ + auVar207._8_4_;
                  auVar510._12_4_ = auVar207._12_4_ + auVar207._12_4_;
                  auVar194 = vfmsub213ps_avx512vl(auVar194,auVar510,auVar223);
                  auVar207 = vfnmadd213ps_fma(auVar194,auVar207,auVar510);
                  auVar240 = vfmsub213ps_fma(auVar207,auVar224,auVar224);
                  break;
                case 6:
                  uVar340 = **(undefined4 **)(&this->field_0x118 + (long)p_Var164);
                  auVar411._4_4_ = uVar340;
                  auVar411._0_4_ = uVar340;
                  auVar411._8_4_ = uVar340;
                  auVar411._12_4_ = uVar340;
                  uVar340 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var164))[1];
                  auVar52._4_4_ = uVar340;
                  auVar52._0_4_ = uVar340;
                  auVar52._8_4_ = uVar340;
                  auVar52._12_4_ = uVar340;
                  auVar224 = vfmadd213ps_avx512vl(auVar411,auVar224,auVar52);
                  auVar224 = vmaxps_avx512vl(auVar224,auVar191);
                  auVar224 = vminps_avx(auVar224,auVar380);
                  auVar240._0_4_ = auVar224._0_4_ * auVar338._0_4_;
                  auVar240._4_4_ = auVar224._4_4_ * auVar338._4_4_;
                  auVar240._8_4_ = auVar224._8_4_ * auVar338._8_4_;
                  auVar240._12_4_ = auVar224._12_4_ * auVar338._12_4_;
                }
              }
              *(undefined1 (*) [16])local_2a8 = auVar240;
              local_2a8 = local_2a8 + 2;
              iVar146 = iVar146 + 1;
            }
            uVar183 = (ulong)(uVar167 + 1);
          }
        }
      }
      if ((iVar170 == 4) && (uVar159 == 1)) {
        p_Var164 = local_198[-3];
        uVar161 = *(uint *)(&this->field_0xd4 + (long)p_Var164);
        uVar165 = *(uint *)(&this->field_0xd8 + (long)p_Var164);
        iVar168 = *(int *)(&this->field_0xdc + (long)p_Var164);
        iVar166 = *(int *)(&this->field_0x114 + (long)p_Var164);
        local_170 = local_1e8.elemsize * local_1e8.cstep;
        uVar173 = 0;
        if (0 < (int)uVar161) {
          uVar173 = (ulong)uVar161;
        }
        uVar174 = 0;
        if (0 < (int)uVar165) {
          uVar174 = (ulong)uVar165;
        }
        uVar158 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar158 = 0;
        }
        uVar169 = local_1e8.w;
        if (local_1e8.w < 1) {
          uVar169 = 0;
        }
        uVar160 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar160 = 0;
        }
        local_158._0_4_ = uVar160;
        local_190 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          local_190 = 0;
        }
        iVar182 = *(int *)(&this->field_0xe0 + (long)p_Var164);
        iVar163 = *(int *)(&this->field_0xe4 + (long)p_Var164);
        iVar152 = *(int *)(&this->field_0xe8 + (long)p_Var164);
        lVar157 = *(long *)(&this->field_0x1a8 + (long)p_Var164);
        local_178 = (Allocator *)local_1e8.data;
        iVar153 = bottom_blob->w;
        iVar154 = bottom_blob->h;
        for (uVar188 = 0; uVar188 != local_190; uVar188 = uVar188 + 1) {
          local_268 = (Allocator *)((long)&local_178->_vptr_Allocator + local_170 * uVar188);
          for (iVar146 = 0; iVar146 != local_158._0_4_; iVar146 = iVar146 + 1) {
            pfVar176 = *(float **)(&this->field_0x118 + (long)p_Var164);
            sVar11 = (this->weight_data_tm).cstep;
            sVar12 = (this->weight_data_tm).elemsize;
            pvVar185 = (this->weight_data_tm).data;
            iVar147 = (1 - uVar161) * iVar168;
            for (uVar160 = 0; uVar160 != uVar169; uVar160 = uVar160 + 1) {
              if (lVar157 == 0) {
                fVar339 = 0.0;
              }
              else {
                fVar339 = *(float *)(lVar157 + uVar188 * 4);
              }
              auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar178 = (void *)(sVar11 * uVar188 * sVar12 + (long)pvVar185);
              for (uVar186 = 0; uVar186 != uVar158; uVar186 = uVar186 + 1) {
                pvVar172 = pvVar178;
                for (uVar183 = 0; uVar183 != uVar174; uVar183 = uVar183 + 1) {
                  iVar149 = (((int)uVar183 - uVar165) + 1) * iVar182 + iVar146;
                  if (((-1 < iVar149) && (iVar150 = iVar149 / iVar152, iVar149 % iVar152 == 0)) &&
                     (iVar150 < iVar154)) {
                    iVar149 = iVar147;
                    for (lVar162 = 0; uVar173 * 0x10 != lVar162; lVar162 = lVar162 + 0x10) {
                      if (((-1 < iVar149) && (iVar151 = iVar149 / iVar163, iVar149 % iVar163 == 0))
                         && (iVar151 < iVar153)) {
                        auVar191 = vfmadd231ps_fma(auVar338._0_16_,
                                                   *(undefined1 (*) [16])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar151 << 2) * 4 +
                                                    (long)iVar150 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar186),
                                                   *(undefined1 (*) [16])((long)pvVar172 + lVar162))
                        ;
                        auVar338 = ZEXT1664(auVar191);
                      }
                      iVar149 = iVar149 + iVar168;
                    }
                  }
                  pvVar172 = (void *)((long)pvVar172 + (long)(int)uVar161 * 0x10);
                }
                pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar161 * uVar165 * 4) * 4);
              }
              auVar191 = vshufpd_avx(auVar338._0_16_,auVar338._0_16_,1);
              auVar354._0_4_ = auVar191._0_4_ + auVar338._0_4_;
              auVar354._4_4_ = auVar191._4_4_ + auVar338._4_4_;
              auVar354._8_4_ = auVar191._8_4_ + auVar338._8_4_;
              auVar354._12_4_ = auVar191._12_4_ + auVar338._12_4_;
              auVar191 = vmovshdup_avx(auVar354);
              fVar339 = auVar191._0_4_ + fVar339 + auVar354._0_4_;
              auVar191 = ZEXT416((uint)fVar339);
              fVar358 = fVar339;
              if (iVar166 - 1U < 6) {
                switch(iVar166) {
                case 1:
                  auVar191 = vmaxss_avx(ZEXT416((uint)fVar339),ZEXT416(0));
                  fVar358 = auVar191._0_4_;
                  break;
                case 2:
                  uVar18 = vcmpss_avx512f(ZEXT416((uint)fVar339),ZEXT416(0),0xe);
                  bVar16 = (bool)((byte)uVar18 & 1);
                  fVar358 = (float)((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * (int)*pfVar176) *
                            fVar339;
                  break;
                case 3:
                  auVar191 = vmaxss_avx(auVar191,ZEXT416((uint)*pfVar176));
                  fVar358 = auVar191._0_4_;
                  if (pfVar176[1] < auVar191._0_4_) {
                    fVar358 = pfVar176[1];
                  }
                  break;
                case 4:
                  auVar191 = vminss_avx(auVar191,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar62._8_4_ = 0x80000000;
                  auVar62._0_8_ = 0x8000000080000000;
                  auVar62._12_4_ = 0x80000000;
                  auVar192 = vxorps_avx512vl(auVar191,auVar62);
                  uVar18 = vcmpss_avx512f(auVar191,ZEXT416(0xc2b0c0a5),1);
                  bVar16 = (bool)((byte)uVar18 & 1);
                  fVar339 = expf((float)((uint)bVar16 * 0x42b0c0a5 + (uint)!bVar16 * auVar192._0_4_)
                                );
                  fVar358 = 1.0 / (fVar339 + 1.0);
                  break;
                case 5:
                  fVar358 = expf(fVar339);
                  fVar358 = logf(fVar358 + 1.0);
                  fVar358 = tanhf(fVar358);
                  fVar358 = fVar358 * fVar339;
                  break;
                case 6:
                  fVar4 = *pfVar176;
                  auVar61._8_4_ = 0x80000000;
                  auVar61._0_8_ = 0x8000000080000000;
                  auVar61._12_4_ = 0x80000000;
                  auVar192 = vxorps_avx512vl(ZEXT416((uint)pfVar176[1]),auVar61);
                  fVar365 = auVar192._0_4_ / fVar4;
                  fVar358 = 0.0;
                  if ((fVar365 <= fVar339) && (fVar358 = fVar339, fVar339 <= fVar365 + 1.0 / fVar4))
                  {
                    auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar191,
                                               ZEXT416((uint)pfVar176[1]));
                    fVar358 = auVar191._0_4_ * fVar339;
                  }
                }
              }
              *(float *)&local_268->_vptr_Allocator = fVar358;
              local_268 = (Allocator *)((long)&local_268->_vptr_Allocator + 4);
              iVar147 = iVar147 + 1;
            }
          }
        }
      }
      pvVar185 = local_1e8.data;
      if ((iVar170 == 1) && (uVar159 == 1)) {
        pp_Var10 = this->_vptr_Deconvolution_x86_avx512;
        lVar157 = local_1e8.cstep * local_1e8.elemsize;
        iVar168 = bottom_blob->w;
        iVar166 = bottom_blob->h;
        lVar162 = (long)local_1e8.w;
        uVar174 = 0;
        uVar173 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar173 = uVar174;
        }
        uVar158 = 0;
        if (0 < local_1e8.w) {
          uVar158 = (ulong)(uint)local_1e8.w;
        }
        uVar161 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar161 = 0;
        }
        local_188 = local_188 << 2;
        for (; (long)uVar174 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var10[-3]);
            uVar174 = uVar174 + 1) {
          local_228 = (Allocator *)((long)(_func_int ***)pvVar185 + lVar157 * uVar174);
          for (uVar165 = 0; uVar165 != uVar161; uVar165 = uVar165 + 1) {
            pp_Var13 = this->_vptr_Deconvolution_x86_avx512;
            sVar11 = (this->weight_data_tm).cstep;
            sVar12 = (this->weight_data_tm).elemsize;
            iVar182 = uVar165 - local_168;
            pvVar178 = (this->weight_data_tm).data;
            for (uVar188 = 0; uVar188 != uVar158; uVar188 = uVar188 + 1) {
              p_Var164 = pp_Var13[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var164) == 0) {
                auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar338 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var164) +
                                            uVar174 * 4));
              }
              pvVar172 = (void *)(sVar11 * uVar174 * sVar12 + (long)pvVar178);
              for (uVar186 = 0; uVar186 != uVar173; uVar186 = uVar186 + 1) {
                p_Var14 = this->_vptr_Deconvolution_x86_avx512[-3];
                iVar170 = 0;
                iVar163 = *(int *)(&this->field_0xd8 + (long)p_Var14);
                if (*(int *)(&this->field_0xd8 + (long)p_Var14) < 1) {
                  iVar163 = iVar170;
                }
                for (; iVar170 != iVar163; iVar170 = iVar170 + 1) {
                  iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var14) * iVar170 + iVar182;
                  if (((-1 < iVar152) &&
                      (iVar153 = iVar152 / *(int *)(&this->field_0xe8 + (long)p_Var14),
                      iVar152 % *(int *)(&this->field_0xe8 + (long)p_Var14) == 0)) &&
                     (iVar153 < iVar166)) {
                    uVar169 = *(uint *)(&this->field_0xd4 + (long)p_Var14);
                    uVar183 = 0;
                    if (0 < (int)uVar169) {
                      uVar183 = (ulong)uVar169;
                    }
                    for (uVar184 = 0; uVar183 != uVar184; uVar184 = uVar184 + 1) {
                      iVar152 = *(int *)(&this->field_0xdc + (long)p_Var14) * (int)uVar184 +
                                ((int)uVar188 - local_164);
                      if (((-1 < iVar152) &&
                          (iVar154 = iVar152 / *(int *)(&this->field_0xe4 + (long)p_Var14),
                          iVar152 % *(int *)(&this->field_0xe4 + (long)p_Var14) == 0)) &&
                         (iVar154 < iVar168)) {
                        auVar191 = vfmadd231ss_fma(auVar338._0_16_,
                                                   ZEXT416(*(uint *)((long)pvVar172 +
                                                                    uVar184 * 4 +
                                                                    (long)(int)(uVar169 * iVar170) *
                                                                    4)),
                                                   ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                    (long)iVar154 * 4 +
                                                                    (long)iVar153 *
                                                                    (long)bottom_blob->w *
                                                                    bottom_blob->elemsize +
                                                                    bottom_blob->cstep *
                                                                    bottom_blob->elemsize * uVar186)
                                                          ));
                        auVar338 = ZEXT1664(auVar191);
                      }
                    }
                  }
                }
                pvVar172 = (void *)((long)pvVar172 + local_188);
              }
              auVar191 = auVar338._0_16_;
              fVar358 = auVar338._0_4_;
              fVar339 = fVar358;
              switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var164)) {
              case 1:
                auVar191 = vmaxss_avx(auVar191,ZEXT416(0));
                fVar339 = auVar191._0_4_;
                break;
              case 2:
                uVar18 = vcmpss_avx512f(auVar191,ZEXT416(0),0xe);
                bVar16 = (bool)((byte)uVar18 & 1);
                fVar339 = (float)((uint)bVar16 * 0x3f800000 +
                                 (uint)!bVar16 * **(int **)(&this->field_0x118 + (long)p_Var164)) *
                          fVar358;
                break;
              case 3:
                fVar358 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var164))[1];
                auVar191 = vmaxss_avx(auVar191,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                  (long)p_Var164)));
                fVar339 = auVar191._0_4_;
                if (fVar358 < auVar191._0_4_) {
                  fVar339 = fVar358;
                }
                break;
              case 4:
                auVar191 = vminss_avx(auVar191,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar64._8_4_ = 0x80000000;
                auVar64._0_8_ = 0x8000000080000000;
                auVar64._12_4_ = 0x80000000;
                auVar192 = vxorps_avx512vl(auVar191,auVar64);
                uVar18 = vcmpss_avx512f(auVar191,ZEXT416(0xc2b0c0a5),1);
                bVar16 = (bool)((byte)uVar18 & 1);
                fVar339 = expf((float)((uint)bVar16 * 0x42b0c0a5 + (uint)!bVar16 * auVar192._0_4_));
                fVar339 = 1.0 / (fVar339 + 1.0);
                break;
              case 5:
                fVar339 = expf(fVar358);
                fVar339 = logf(fVar339 + 1.0);
                fVar339 = tanhf(fVar339);
                fVar339 = fVar339 * fVar358;
                break;
              case 6:
                fVar4 = **(float **)(&this->field_0x118 + (long)p_Var164);
                auVar63._8_4_ = 0x80000000;
                auVar63._0_8_ = 0x8000000080000000;
                auVar63._12_4_ = 0x80000000;
                auVar193 = ZEXT416((uint)(*(float **)(&this->field_0x118 + (long)p_Var164))[1]);
                auVar192 = vxorps_avx512vl(auVar193,auVar63);
                fVar365 = auVar192._0_4_ / fVar4;
                fVar339 = 0.0;
                if ((fVar365 <= fVar358) && (fVar339 = fVar358, fVar358 <= fVar365 + 1.0 / fVar4)) {
                  auVar191 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar191,auVar193);
                  fVar339 = auVar191._0_4_ * fVar358;
                }
              }
              *(float *)((long)&local_228->_vptr_Allocator + uVar188 * 4) = fVar339;
            }
            local_228 = (Allocator *)((long)&local_228->_vptr_Allocator + lVar162 * 4);
          }
        }
      }
    }
    pMVar145 = local_160;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_avx512 +
               (long)this->_vptr_Deconvolution_x86_avx512[-3]),&local_1e8,local_160,local_180);
    if ((pMVar145->data != (void *)0x0) && (iVar168 = 0, (long)pMVar145->c * pMVar145->cstep != 0))
    goto LAB_0025c1f0;
  }
  iVar168 = -100;
LAB_0025c1f0:
  piVar9 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        free(local_1e8.data);
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar168;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}